

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

void embree::avx512::CurveNvIntersectorK<8,16>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,16>,embree::avx512::Intersect1KEpilog1<16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined4 uVar1;
  Primitive PVar2;
  Geometry *pGVar3;
  RTCRayQueryContext *pRVar4;
  RTCFilterFunctionN p_Var5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  int iVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  int iVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  int iVar72;
  int iVar73;
  int iVar74;
  int iVar75;
  int iVar76;
  int iVar77;
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  byte bVar82;
  byte bVar83;
  byte bVar84;
  ulong uVar85;
  ulong uVar86;
  byte bVar87;
  byte bVar88;
  Primitive *pPVar89;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  uint uVar90;
  int iVar91;
  byte bVar92;
  long lVar93;
  ulong uVar94;
  uint uVar95;
  uint uVar96;
  uint uVar162;
  uint uVar163;
  uint uVar165;
  uint uVar166;
  uint uVar167;
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  uint uVar164;
  uint uVar168;
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [64];
  float pp;
  float fVar169;
  float fVar170;
  undefined1 auVar171 [16];
  undefined1 auVar175 [32];
  float fVar187;
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar172 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar183 [32];
  float fVar185;
  float fVar186;
  float fVar188;
  float fVar189;
  float fVar190;
  undefined1 auVar184 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined4 uVar191;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [32];
  undefined1 auVar192 [16];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  float fVar211;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  float fVar227;
  float fVar228;
  float fVar229;
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  float fVar230;
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  float fVar244;
  float fVar245;
  float fVar246;
  undefined1 auVar243 [32];
  float fVar247;
  float fVar254;
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  float fVar252;
  float fVar253;
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  float fVar258;
  undefined1 auVar257 [64];
  undefined1 auVar259 [32];
  undefined1 auVar262 [32];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar263 [64];
  float fVar264;
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  float fVar271;
  undefined1 auVar267 [32];
  float fVar269;
  float fVar270;
  undefined1 auVar268 [64];
  undefined1 auVar272 [16];
  undefined1 auVar273 [64];
  float fVar275;
  undefined1 auVar274 [64];
  undefined1 auVar276 [64];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [32];
  undefined1 auVar280 [64];
  undefined1 auVar281 [64];
  undefined1 auVar282 [64];
  undefined1 auVar283 [64];
  undefined1 auVar284 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vint<16> mask;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  vfloatx_conflict vu0;
  StackEntry stack [3];
  RTCFilterFunctionNArguments local_b70;
  undefined1 local_b40 [32];
  undefined1 local_b20 [32];
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [8];
  float fStack_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float fStack_a88;
  undefined1 local_a80 [32];
  undefined1 local_a60 [16];
  undefined1 local_a50 [16];
  undefined1 local_a40 [16];
  undefined1 (*local_a28) [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [16];
  undefined1 local_9f0 [16];
  undefined1 local_9e0 [8];
  float fStack_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [16];
  undefined1 local_930 [16];
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  undefined1 local_910 [16];
  undefined1 local_900 [16];
  undefined1 local_8f0 [16];
  Primitive *local_8d8;
  Primitive *local_8d0;
  ulong local_8c8;
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  undefined1 auStack_850 [16];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [64];
  undefined1 local_780 [64];
  undefined1 local_740 [32];
  float local_720;
  float fStack_71c;
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_6f0 [16];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  RTCHitN local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  byte abStack_1a0 [32];
  undefined1 auStack_180 [32];
  ulong uStack_160;
  int aiStack_158 [74];
  
  PVar2 = prim[1];
  uVar86 = (ulong)(byte)PVar2;
  lVar93 = uVar86 * 0x19;
  fVar264 = *(float *)(prim + lVar93 + 0x12);
  auVar20 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar20 = vinsertps_avx(auVar20,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar21 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar101 = vinsertps_avx(auVar21,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar102 = vsubps_avx(auVar20,*(undefined1 (*) [16])(prim + lVar93 + 6));
  fVar230 = fVar264 * auVar102._0_4_;
  fVar169 = fVar264 * auVar101._0_4_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar86 * 4 + 6);
  auVar115 = vpmovsxbd_avx2(auVar20);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar86 * 5 + 6);
  auVar113 = vpmovsxbd_avx2(auVar21);
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar99._8_8_ = 0;
  auVar99._0_8_ = *(ulong *)(prim + uVar86 * 6 + 6);
  auVar116 = vpmovsxbd_avx2(auVar99);
  auVar116 = vcvtdq2ps_avx(auVar116);
  auVar104._8_8_ = 0;
  auVar104._0_8_ = *(ulong *)(prim + uVar86 * 0xb + 6);
  auVar117 = vpmovsxbd_avx2(auVar104);
  auVar97._8_8_ = 0;
  auVar97._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar2 * 0xc) + 6);
  auVar122 = vpmovsxbd_avx2(auVar97);
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar118 = vcvtdq2ps_avx(auVar122);
  auVar109._8_8_ = 0;
  auVar109._0_8_ = *(ulong *)(prim + (uint)(byte)PVar2 * 0xc + uVar86 + 6);
  auVar114 = vpmovsxbd_avx2(auVar109);
  auVar114 = vcvtdq2ps_avx(auVar114);
  uVar85 = (ulong)(uint)((int)(uVar86 * 9) * 2);
  auVar105._8_8_ = 0;
  auVar105._0_8_ = *(ulong *)(prim + uVar85 + 6);
  auVar119 = vpmovsxbd_avx2(auVar105);
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar98._8_8_ = 0;
  auVar98._0_8_ = *(ulong *)(prim + uVar85 + uVar86 + 6);
  auVar120 = vpmovsxbd_avx2(auVar98);
  auVar120 = vcvtdq2ps_avx(auVar120);
  uVar94 = (ulong)(uint)((int)(uVar86 * 5) << 2);
  auVar100._8_8_ = 0;
  auVar100._0_8_ = *(ulong *)(prim + uVar94 + 6);
  auVar112 = vpmovsxbd_avx2(auVar100);
  auVar121 = vcvtdq2ps_avx(auVar112);
  auVar132._4_4_ = fVar169;
  auVar132._0_4_ = fVar169;
  auVar132._8_4_ = fVar169;
  auVar132._12_4_ = fVar169;
  auVar132._16_4_ = fVar169;
  auVar132._20_4_ = fVar169;
  auVar132._24_4_ = fVar169;
  auVar132._28_4_ = fVar169;
  auVar134._8_4_ = 1;
  auVar134._0_8_ = 0x100000001;
  auVar134._12_4_ = 1;
  auVar134._16_4_ = 1;
  auVar134._20_4_ = 1;
  auVar134._24_4_ = 1;
  auVar134._28_4_ = 1;
  auVar110 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar124 = ZEXT1632(CONCAT412(fVar264 * auVar101._12_4_,
                                CONCAT48(fVar264 * auVar101._8_4_,
                                         CONCAT44(fVar264 * auVar101._4_4_,fVar169))));
  auVar123 = vpermps_avx2(auVar134,auVar124);
  auVar111 = vpermps_avx512vl(auVar110,auVar124);
  fVar169 = auVar111._0_4_;
  fVar269 = auVar111._4_4_;
  auVar124._4_4_ = fVar269 * auVar116._4_4_;
  auVar124._0_4_ = fVar169 * auVar116._0_4_;
  fVar270 = auVar111._8_4_;
  auVar124._8_4_ = fVar270 * auVar116._8_4_;
  fVar271 = auVar111._12_4_;
  auVar124._12_4_ = fVar271 * auVar116._12_4_;
  fVar244 = auVar111._16_4_;
  auVar124._16_4_ = fVar244 * auVar116._16_4_;
  fVar245 = auVar111._20_4_;
  auVar124._20_4_ = fVar245 * auVar116._20_4_;
  fVar246 = auVar111._24_4_;
  auVar124._24_4_ = fVar246 * auVar116._24_4_;
  auVar124._28_4_ = auVar122._28_4_;
  auVar122._4_4_ = auVar114._4_4_ * fVar269;
  auVar122._0_4_ = auVar114._0_4_ * fVar169;
  auVar122._8_4_ = auVar114._8_4_ * fVar270;
  auVar122._12_4_ = auVar114._12_4_ * fVar271;
  auVar122._16_4_ = auVar114._16_4_ * fVar244;
  auVar122._20_4_ = auVar114._20_4_ * fVar245;
  auVar122._24_4_ = auVar114._24_4_ * fVar246;
  auVar122._28_4_ = auVar112._28_4_;
  auVar112._4_4_ = auVar121._4_4_ * fVar269;
  auVar112._0_4_ = auVar121._0_4_ * fVar169;
  auVar112._8_4_ = auVar121._8_4_ * fVar270;
  auVar112._12_4_ = auVar121._12_4_ * fVar271;
  auVar112._16_4_ = auVar121._16_4_ * fVar244;
  auVar112._20_4_ = auVar121._20_4_ * fVar245;
  auVar112._24_4_ = auVar121._24_4_ * fVar246;
  auVar112._28_4_ = auVar111._28_4_;
  auVar20 = vfmadd231ps_fma(auVar124,auVar123,auVar113);
  auVar21 = vfmadd231ps_fma(auVar122,auVar123,auVar118);
  auVar99 = vfmadd231ps_fma(auVar112,auVar120,auVar123);
  auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar132,auVar115);
  auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar132,auVar117);
  auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar119,auVar132);
  auVar133._4_4_ = fVar230;
  auVar133._0_4_ = fVar230;
  auVar133._8_4_ = fVar230;
  auVar133._12_4_ = fVar230;
  auVar133._16_4_ = fVar230;
  auVar133._20_4_ = fVar230;
  auVar133._24_4_ = fVar230;
  auVar133._28_4_ = fVar230;
  auVar112 = ZEXT1632(CONCAT412(fVar264 * auVar102._12_4_,
                                CONCAT48(fVar264 * auVar102._8_4_,
                                         CONCAT44(fVar264 * auVar102._4_4_,fVar230))));
  auVar122 = vpermps_avx2(auVar134,auVar112);
  auVar112 = vpermps_avx512vl(auVar110,auVar112);
  fVar264 = auVar112._0_4_;
  fVar169 = auVar112._4_4_;
  auVar123._4_4_ = fVar169 * auVar116._4_4_;
  auVar123._0_4_ = fVar264 * auVar116._0_4_;
  fVar269 = auVar112._8_4_;
  auVar123._8_4_ = fVar269 * auVar116._8_4_;
  fVar270 = auVar112._12_4_;
  auVar123._12_4_ = fVar270 * auVar116._12_4_;
  fVar271 = auVar112._16_4_;
  auVar123._16_4_ = fVar271 * auVar116._16_4_;
  fVar244 = auVar112._20_4_;
  auVar123._20_4_ = fVar244 * auVar116._20_4_;
  fVar245 = auVar112._24_4_;
  auVar123._24_4_ = fVar245 * auVar116._24_4_;
  auVar123._28_4_ = 1;
  auVar110._4_4_ = auVar114._4_4_ * fVar169;
  auVar110._0_4_ = auVar114._0_4_ * fVar264;
  auVar110._8_4_ = auVar114._8_4_ * fVar269;
  auVar110._12_4_ = auVar114._12_4_ * fVar270;
  auVar110._16_4_ = auVar114._16_4_ * fVar271;
  auVar110._20_4_ = auVar114._20_4_ * fVar244;
  auVar110._24_4_ = auVar114._24_4_ * fVar245;
  auVar110._28_4_ = auVar116._28_4_;
  auVar114._4_4_ = auVar121._4_4_ * fVar169;
  auVar114._0_4_ = auVar121._0_4_ * fVar264;
  auVar114._8_4_ = auVar121._8_4_ * fVar269;
  auVar114._12_4_ = auVar121._12_4_ * fVar270;
  auVar114._16_4_ = auVar121._16_4_ * fVar271;
  auVar114._20_4_ = auVar121._20_4_ * fVar244;
  auVar114._24_4_ = auVar121._24_4_ * fVar245;
  auVar114._28_4_ = auVar112._28_4_;
  auVar104 = vfmadd231ps_fma(auVar123,auVar122,auVar113);
  auVar97 = vfmadd231ps_fma(auVar110,auVar122,auVar118);
  auVar109 = vfmadd231ps_fma(auVar114,auVar122,auVar120);
  auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar133,auVar115);
  auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),auVar133,auVar117);
  auVar129._8_4_ = 0x7fffffff;
  auVar129._0_8_ = 0x7fffffff7fffffff;
  auVar129._12_4_ = 0x7fffffff;
  auVar129._16_4_ = 0x7fffffff;
  auVar129._20_4_ = 0x7fffffff;
  auVar129._24_4_ = 0x7fffffff;
  auVar129._28_4_ = 0x7fffffff;
  auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar133,auVar119);
  auVar115 = vandps_avx(ZEXT1632(auVar20),auVar129);
  auVar131._8_4_ = 0x219392ef;
  auVar131._0_8_ = 0x219392ef219392ef;
  auVar131._12_4_ = 0x219392ef;
  auVar131._16_4_ = 0x219392ef;
  auVar131._20_4_ = 0x219392ef;
  auVar131._24_4_ = 0x219392ef;
  auVar131._28_4_ = 0x219392ef;
  uVar85 = vcmpps_avx512vl(auVar115,auVar131,1);
  bVar6 = (bool)((byte)uVar85 & 1);
  auVar111._0_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar20._0_4_;
  bVar6 = (bool)((byte)(uVar85 >> 1) & 1);
  auVar111._4_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar20._4_4_;
  bVar6 = (bool)((byte)(uVar85 >> 2) & 1);
  auVar111._8_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar20._8_4_;
  bVar6 = (bool)((byte)(uVar85 >> 3) & 1);
  auVar111._12_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar20._12_4_;
  auVar111._16_4_ = (uint)((byte)(uVar85 >> 4) & 1) * 0x219392ef;
  auVar111._20_4_ = (uint)((byte)(uVar85 >> 5) & 1) * 0x219392ef;
  auVar111._24_4_ = (uint)((byte)(uVar85 >> 6) & 1) * 0x219392ef;
  auVar111._28_4_ = (uint)(byte)(uVar85 >> 7) * 0x219392ef;
  auVar115 = vandps_avx(ZEXT1632(auVar21),auVar129);
  uVar85 = vcmpps_avx512vl(auVar115,auVar131,1);
  bVar6 = (bool)((byte)uVar85 & 1);
  auVar125._0_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar21._0_4_;
  bVar6 = (bool)((byte)(uVar85 >> 1) & 1);
  auVar125._4_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar21._4_4_;
  bVar6 = (bool)((byte)(uVar85 >> 2) & 1);
  auVar125._8_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar21._8_4_;
  bVar6 = (bool)((byte)(uVar85 >> 3) & 1);
  auVar125._12_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar21._12_4_;
  auVar125._16_4_ = (uint)((byte)(uVar85 >> 4) & 1) * 0x219392ef;
  auVar125._20_4_ = (uint)((byte)(uVar85 >> 5) & 1) * 0x219392ef;
  auVar125._24_4_ = (uint)((byte)(uVar85 >> 6) & 1) * 0x219392ef;
  auVar125._28_4_ = (uint)(byte)(uVar85 >> 7) * 0x219392ef;
  auVar115 = vandps_avx(ZEXT1632(auVar99),auVar129);
  uVar85 = vcmpps_avx512vl(auVar115,auVar131,1);
  bVar6 = (bool)((byte)uVar85 & 1);
  auVar115._0_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar99._0_4_;
  bVar6 = (bool)((byte)(uVar85 >> 1) & 1);
  auVar115._4_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar99._4_4_;
  bVar6 = (bool)((byte)(uVar85 >> 2) & 1);
  auVar115._8_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar99._8_4_;
  bVar6 = (bool)((byte)(uVar85 >> 3) & 1);
  auVar115._12_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar99._12_4_;
  auVar115._16_4_ = (uint)((byte)(uVar85 >> 4) & 1) * 0x219392ef;
  auVar115._20_4_ = (uint)((byte)(uVar85 >> 5) & 1) * 0x219392ef;
  auVar115._24_4_ = (uint)((byte)(uVar85 >> 6) & 1) * 0x219392ef;
  auVar115._28_4_ = (uint)(byte)(uVar85 >> 7) * 0x219392ef;
  auVar113 = vrcp14ps_avx512vl(auVar111);
  auVar130._8_4_ = 0x3f800000;
  auVar130._0_8_ = 0x3f8000003f800000;
  auVar130._12_4_ = 0x3f800000;
  auVar130._16_4_ = 0x3f800000;
  auVar130._20_4_ = 0x3f800000;
  auVar130._24_4_ = 0x3f800000;
  auVar130._28_4_ = 0x3f800000;
  auVar20 = vfnmadd213ps_fma(auVar111,auVar113,auVar130);
  auVar20 = vfmadd132ps_fma(ZEXT1632(auVar20),auVar113,auVar113);
  auVar113 = vrcp14ps_avx512vl(auVar125);
  auVar21 = vfnmadd213ps_fma(auVar125,auVar113,auVar130);
  auVar21 = vfmadd132ps_fma(ZEXT1632(auVar21),auVar113,auVar113);
  auVar113 = vrcp14ps_avx512vl(auVar115);
  auVar99 = vfnmadd213ps_fma(auVar115,auVar113,auVar130);
  auVar99 = vfmadd132ps_fma(ZEXT1632(auVar99),auVar113,auVar113);
  auVar115 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar86 * 7 + 6));
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar115 = vsubps_avx(auVar115,ZEXT1632(auVar104));
  auVar119._4_4_ = auVar20._4_4_ * auVar115._4_4_;
  auVar119._0_4_ = auVar20._0_4_ * auVar115._0_4_;
  auVar119._8_4_ = auVar20._8_4_ * auVar115._8_4_;
  auVar119._12_4_ = auVar20._12_4_ * auVar115._12_4_;
  auVar119._16_4_ = auVar115._16_4_ * 0.0;
  auVar119._20_4_ = auVar115._20_4_ * 0.0;
  auVar119._24_4_ = auVar115._24_4_ * 0.0;
  auVar119._28_4_ = auVar115._28_4_;
  auVar115 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar86 * 9 + 6));
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar115 = vsubps_avx(auVar115,ZEXT1632(auVar104));
  auVar114 = vpbroadcastd_avx512vl();
  auVar113 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar2 * 0x10 + 6));
  auVar128._0_4_ = auVar20._0_4_ * auVar115._0_4_;
  auVar128._4_4_ = auVar20._4_4_ * auVar115._4_4_;
  auVar128._8_4_ = auVar20._8_4_ * auVar115._8_4_;
  auVar128._12_4_ = auVar20._12_4_ * auVar115._12_4_;
  auVar128._16_4_ = auVar115._16_4_ * 0.0;
  auVar128._20_4_ = auVar115._20_4_ * 0.0;
  auVar128._24_4_ = auVar115._24_4_ * 0.0;
  auVar128._28_4_ = 0;
  auVar115 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar2 * 0x10 + uVar86 * -2 + 6));
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar115 = vsubps_avx(auVar115,ZEXT1632(auVar97));
  auVar120._4_4_ = auVar21._4_4_ * auVar115._4_4_;
  auVar120._0_4_ = auVar21._0_4_ * auVar115._0_4_;
  auVar120._8_4_ = auVar21._8_4_ * auVar115._8_4_;
  auVar120._12_4_ = auVar21._12_4_ * auVar115._12_4_;
  auVar120._16_4_ = auVar115._16_4_ * 0.0;
  auVar120._20_4_ = auVar115._20_4_ * 0.0;
  auVar120._24_4_ = auVar115._24_4_ * 0.0;
  auVar120._28_4_ = auVar115._28_4_;
  auVar115 = vcvtdq2ps_avx(auVar113);
  auVar115 = vsubps_avx(auVar115,ZEXT1632(auVar97));
  auVar127._0_4_ = auVar21._0_4_ * auVar115._0_4_;
  auVar127._4_4_ = auVar21._4_4_ * auVar115._4_4_;
  auVar127._8_4_ = auVar21._8_4_ * auVar115._8_4_;
  auVar127._12_4_ = auVar21._12_4_ * auVar115._12_4_;
  auVar127._16_4_ = auVar115._16_4_ * 0.0;
  auVar127._20_4_ = auVar115._20_4_ * 0.0;
  auVar127._24_4_ = auVar115._24_4_ * 0.0;
  auVar127._28_4_ = 0;
  auVar115 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar94 + uVar86 + 6));
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar115 = vsubps_avx(auVar115,ZEXT1632(auVar109));
  auVar121._4_4_ = auVar115._4_4_ * auVar99._4_4_;
  auVar121._0_4_ = auVar115._0_4_ * auVar99._0_4_;
  auVar121._8_4_ = auVar115._8_4_ * auVar99._8_4_;
  auVar121._12_4_ = auVar115._12_4_ * auVar99._12_4_;
  auVar121._16_4_ = auVar115._16_4_ * 0.0;
  auVar121._20_4_ = auVar115._20_4_ * 0.0;
  auVar121._24_4_ = auVar115._24_4_ * 0.0;
  auVar121._28_4_ = auVar115._28_4_;
  auVar115 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar86 * 0x17 + 6));
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar115 = vsubps_avx(auVar115,ZEXT1632(auVar109));
  auVar126._0_4_ = auVar99._0_4_ * auVar115._0_4_;
  auVar126._4_4_ = auVar99._4_4_ * auVar115._4_4_;
  auVar126._8_4_ = auVar99._8_4_ * auVar115._8_4_;
  auVar126._12_4_ = auVar99._12_4_ * auVar115._12_4_;
  auVar126._16_4_ = auVar115._16_4_ * 0.0;
  auVar126._20_4_ = auVar115._20_4_ * 0.0;
  auVar126._24_4_ = auVar115._24_4_ * 0.0;
  auVar126._28_4_ = 0;
  auVar115 = vpminsd_avx2(auVar119,auVar128);
  auVar113 = vpminsd_avx2(auVar120,auVar127);
  auVar115 = vmaxps_avx(auVar115,auVar113);
  auVar113 = vpminsd_avx2(auVar121,auVar126);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar116._4_4_ = uVar1;
  auVar116._0_4_ = uVar1;
  auVar116._8_4_ = uVar1;
  auVar116._12_4_ = uVar1;
  auVar116._16_4_ = uVar1;
  auVar116._20_4_ = uVar1;
  auVar116._24_4_ = uVar1;
  auVar116._28_4_ = uVar1;
  auVar113 = vmaxps_avx512vl(auVar113,auVar116);
  auVar115 = vmaxps_avx(auVar115,auVar113);
  auVar113._8_4_ = 0x3f7ffffa;
  auVar113._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar113._12_4_ = 0x3f7ffffa;
  auVar113._16_4_ = 0x3f7ffffa;
  auVar113._20_4_ = 0x3f7ffffa;
  auVar113._24_4_ = 0x3f7ffffa;
  auVar113._28_4_ = 0x3f7ffffa;
  local_640 = vmulps_avx512vl(auVar115,auVar113);
  auVar115 = vpmaxsd_avx2(auVar119,auVar128);
  auVar113 = vpmaxsd_avx2(auVar120,auVar127);
  auVar115 = vminps_avx(auVar115,auVar113);
  auVar113 = vpmaxsd_avx2(auVar121,auVar126);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar117._4_4_ = uVar1;
  auVar117._0_4_ = uVar1;
  auVar117._8_4_ = uVar1;
  auVar117._12_4_ = uVar1;
  auVar117._16_4_ = uVar1;
  auVar117._20_4_ = uVar1;
  auVar117._24_4_ = uVar1;
  auVar117._28_4_ = uVar1;
  auVar113 = vminps_avx512vl(auVar113,auVar117);
  auVar115 = vminps_avx(auVar115,auVar113);
  auVar118._8_4_ = 0x3f800003;
  auVar118._0_8_ = 0x3f8000033f800003;
  auVar118._12_4_ = 0x3f800003;
  auVar118._16_4_ = 0x3f800003;
  auVar118._20_4_ = 0x3f800003;
  auVar118._24_4_ = 0x3f800003;
  auVar118._28_4_ = 0x3f800003;
  auVar115 = vmulps_avx512vl(auVar115,auVar118);
  uVar23 = vpcmpgtd_avx512vl(auVar114,_DAT_01fe9900);
  uVar22 = vcmpps_avx512vl(local_640,auVar115,2);
  if ((byte)((byte)uVar22 & (byte)uVar23) == 0) {
    return;
  }
  local_8c8 = (ulong)(byte)((byte)uVar22 & (byte)uVar23);
  pPVar89 = prim + lVar93 + 0x16;
  local_a28 = (undefined1 (*) [32])local_240;
  auVar184 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_4c0 = vmovdqa64_avx512f(auVar184);
  local_8d8 = pPVar89;
  local_8d0 = prim;
LAB_01caf48d:
  lVar93 = 0;
  for (uVar85 = local_8c8; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x8000000000000000) {
    lVar93 = lVar93 + 1;
  }
  local_8c8 = local_8c8 - 1 & local_8c8;
  uVar1 = *(undefined4 *)(prim + lVar93 * 4 + 6);
  uVar85 = (ulong)(uint)((int)lVar93 << 6);
  auVar20 = *(undefined1 (*) [16])(pPVar89 + uVar85);
  if (local_8c8 != 0) {
    uVar86 = local_8c8 - 1 & local_8c8;
    for (uVar94 = local_8c8; (uVar94 & 1) == 0; uVar94 = uVar94 >> 1 | 0x8000000000000000) {
    }
    if (uVar86 != 0) {
      for (; (uVar86 & 1) == 0; uVar86 = uVar86 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar21 = *(undefined1 (*) [16])(pPVar89 + uVar85 + 0x10);
  auVar99 = *(undefined1 (*) [16])(pPVar89 + uVar85 + 0x20);
  auVar104 = *(undefined1 (*) [16])(pPVar89 + uVar85 + 0x30);
  auVar97 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar109 = vinsertps_avx(auVar97,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  uVar191 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar103._4_4_ = uVar191;
  auVar103._0_4_ = uVar191;
  auVar103._8_4_ = uVar191;
  auVar103._12_4_ = uVar191;
  local_7e0._16_4_ = uVar191;
  local_7e0._0_16_ = auVar103;
  local_7e0._20_4_ = uVar191;
  local_7e0._24_4_ = uVar191;
  local_7e0._28_4_ = uVar191;
  auVar280 = ZEXT3264(local_7e0);
  uVar191 = *(undefined4 *)(ray + k * 4 + 0x140);
  auVar108._4_4_ = uVar191;
  auVar108._0_4_ = uVar191;
  auVar108._8_4_ = uVar191;
  auVar108._12_4_ = uVar191;
  local_800._16_4_ = uVar191;
  local_800._0_16_ = auVar108;
  local_800._20_4_ = uVar191;
  local_800._24_4_ = uVar191;
  local_800._28_4_ = uVar191;
  auVar97 = vunpcklps_avx(auVar103,auVar108);
  fVar264 = *(float *)(ray + k * 4 + 0x180);
  auVar272._4_4_ = fVar264;
  auVar272._0_4_ = fVar264;
  auVar272._8_4_ = fVar264;
  auVar272._12_4_ = fVar264;
  local_820._16_4_ = fVar264;
  local_820._0_16_ = auVar272;
  local_820._20_4_ = fVar264;
  local_820._24_4_ = fVar264;
  local_820._28_4_ = fVar264;
  local_9f0 = vinsertps_avx(auVar97,auVar272,0x28);
  auVar273 = ZEXT1664(local_9f0);
  auVar102._0_4_ = auVar20._0_4_ + auVar21._0_4_ + auVar99._0_4_ + auVar104._0_4_;
  auVar102._4_4_ = auVar20._4_4_ + auVar21._4_4_ + auVar99._4_4_ + auVar104._4_4_;
  auVar102._8_4_ = auVar20._8_4_ + auVar21._8_4_ + auVar99._8_4_ + auVar104._8_4_;
  auVar102._12_4_ = auVar20._12_4_ + auVar21._12_4_ + auVar99._12_4_ + auVar104._12_4_;
  auVar101._8_4_ = 0x3e800000;
  auVar101._0_8_ = 0x3e8000003e800000;
  auVar101._12_4_ = 0x3e800000;
  auVar97 = vmulps_avx512vl(auVar102,auVar101);
  auVar97 = vsubps_avx(auVar97,auVar109);
  auVar97 = vdpps_avx(auVar97,local_9f0,0x7f);
  fVar169 = *(float *)(ray + k * 4 + 0xc0);
  auVar274 = ZEXT464((uint)fVar169);
  local_a00 = vdpps_avx(local_9f0,local_9f0,0x7f);
  auVar276 = ZEXT1664(local_a00);
  uVar90 = *(uint *)(prim + 2);
  auVar106._4_12_ = ZEXT812(0) << 0x20;
  auVar106._0_4_ = local_a00._0_4_;
  auVar98 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar106);
  auVar105 = vfnmadd213ss_fma(auVar98,local_a00,ZEXT416(0x40000000));
  local_620 = auVar97._0_4_ * auVar98._0_4_ * auVar105._0_4_;
  auVar257 = ZEXT464((uint)local_620);
  auVar107._4_4_ = local_620;
  auVar107._0_4_ = local_620;
  auVar107._8_4_ = local_620;
  auVar107._12_4_ = local_620;
  fStack_9d0 = local_620;
  _local_9e0 = auVar107;
  fStack_9cc = local_620;
  fStack_9c8 = local_620;
  fStack_9c4 = local_620;
  auVar97 = vfmadd231ps_fma(auVar109,local_9f0,auVar107);
  auVar97 = vblendps_avx(auVar97,ZEXT816(0) << 0x40,8);
  auVar20 = vsubps_avx(auVar20,auVar97);
  auVar99 = vsubps_avx(auVar99,auVar97);
  auVar263 = ZEXT1664(auVar99);
  auVar21 = vsubps_avx(auVar21,auVar97);
  auVar268 = ZEXT1664(auVar21);
  auVar104 = vsubps_avx(auVar104,auVar97);
  auVar115 = vbroadcastss_avx512vl(auVar20);
  auVar136._8_4_ = 1;
  auVar136._0_8_ = 0x100000001;
  auVar136._12_4_ = 1;
  auVar136._16_4_ = 1;
  auVar136._20_4_ = 1;
  auVar136._24_4_ = 1;
  auVar136._28_4_ = 1;
  local_960 = ZEXT1632(auVar20);
  auVar113 = vpermps_avx512vl(auVar136,local_960);
  auVar137._8_4_ = 2;
  auVar137._0_8_ = 0x200000002;
  auVar137._12_4_ = 2;
  auVar137._16_4_ = 2;
  auVar137._20_4_ = 2;
  auVar137._24_4_ = 2;
  auVar137._28_4_ = 2;
  auVar116 = vpermps_avx512vl(auVar137,local_960);
  auVar138._8_4_ = 3;
  auVar138._0_8_ = 0x300000003;
  auVar138._12_4_ = 3;
  auVar138._16_4_ = 3;
  auVar138._20_4_ = 3;
  auVar138._24_4_ = 3;
  auVar138._28_4_ = 3;
  auVar117 = vpermps_avx512vl(auVar138,local_960);
  local_ae0 = vbroadcastss_avx512vl(auVar21);
  auVar281 = ZEXT3264(local_ae0);
  local_9a0 = ZEXT1632(auVar21);
  auVar118 = vpermps_avx512vl(auVar136,local_9a0);
  local_b00 = vpermps_avx512vl(auVar137,local_9a0);
  auVar282 = ZEXT3264(local_b00);
  auVar114 = vpermps_avx512vl(auVar138,local_9a0);
  local_b20 = vbroadcastss_avx512vl(auVar99);
  auVar283 = ZEXT3264(local_b20);
  local_980 = ZEXT1632(auVar99);
  auVar119 = vpermps_avx512vl(auVar136,local_980);
  local_b40 = vpermps_avx512vl(auVar137,local_980);
  auVar284 = ZEXT3264(local_b40);
  auVar120 = vpermps_avx512vl(auVar138,local_980);
  local_5a0 = vbroadcastss_avx512vl(auVar104);
  _local_9c0 = ZEXT1632(auVar104);
  local_5c0 = vpermps_avx2(auVar136,_local_9c0);
  local_580 = vpermps_avx512vl(auVar137,_local_9c0);
  local_600 = vpermps_avx2(auVar138,_local_9c0);
  auVar20 = vfmadd231ps_fma(ZEXT432((uint)(fVar264 * fVar264)),local_800,local_800);
  auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),local_7e0,local_7e0);
  local_560._0_4_ = auVar20._0_4_;
  local_560._4_4_ = local_560._0_4_;
  local_560._8_4_ = local_560._0_4_;
  local_560._12_4_ = local_560._0_4_;
  local_560._16_4_ = local_560._0_4_;
  local_560._20_4_ = local_560._0_4_;
  local_560._24_4_ = local_560._0_4_;
  local_560._28_4_ = local_560._0_4_;
  auVar135._8_4_ = 0x7fffffff;
  auVar135._0_8_ = 0x7fffffff7fffffff;
  auVar135._12_4_ = 0x7fffffff;
  auVar135._16_4_ = 0x7fffffff;
  auVar135._20_4_ = 0x7fffffff;
  auVar135._24_4_ = 0x7fffffff;
  auVar135._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_560,auVar135);
  local_940 = ZEXT416((uint)local_620);
  local_620 = fVar169 - local_620;
  fStack_61c = local_620;
  fStack_618 = local_620;
  fStack_614 = local_620;
  fStack_610 = local_620;
  fStack_60c = local_620;
  fStack_608 = local_620;
  fStack_604 = local_620;
  auVar184 = vpbroadcastd_avx512f();
  local_440 = vmovdqa64_avx512f(auVar184);
  iVar91 = 1;
  uVar85 = 0;
  auVar184 = vpbroadcastd_avx512f();
  local_480 = vmovdqa64_avx512f(auVar184);
  auVar20 = vsqrtss_avx(local_a00,local_a00);
  auVar21 = vsqrtss_avx(local_a00,local_a00);
  local_6f0 = ZEXT816(0x3f80000000000000);
  auVar121 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar184 = ZEXT3264(auVar121);
  local_5e0 = local_580;
  do {
    auVar99 = vmovshdup_avx(local_6f0);
    auVar99 = vsubps_avx(auVar99,local_6f0);
    auVar175._0_4_ = auVar99._0_4_;
    fVar254 = auVar175._0_4_ * 0.04761905;
    uVar191 = local_6f0._0_4_;
    local_a80._4_4_ = uVar191;
    local_a80._0_4_ = uVar191;
    local_a80._8_4_ = uVar191;
    local_a80._12_4_ = uVar191;
    local_a80._16_4_ = uVar191;
    local_a80._20_4_ = uVar191;
    local_a80._24_4_ = uVar191;
    local_a80._28_4_ = uVar191;
    auVar175._4_4_ = auVar175._0_4_;
    auVar175._8_4_ = auVar175._0_4_;
    auVar175._12_4_ = auVar175._0_4_;
    auVar175._16_4_ = auVar175._0_4_;
    auVar175._20_4_ = auVar175._0_4_;
    auVar175._24_4_ = auVar175._0_4_;
    auVar175._28_4_ = auVar175._0_4_;
    auVar99 = vfmadd231ps_fma(local_a80,auVar175,_DAT_01faff20);
    auVar122 = vsubps_avx512vl(auVar184._0_32_,ZEXT1632(auVar99));
    fVar264 = auVar122._0_4_;
    fVar270 = auVar122._4_4_;
    fVar244 = auVar122._8_4_;
    fVar246 = auVar122._12_4_;
    fVar247 = auVar122._16_4_;
    fVar252 = auVar122._20_4_;
    fVar253 = auVar122._24_4_;
    fVar170 = fVar264 * fVar264 * fVar264;
    fVar185 = fVar270 * fVar270 * fVar270;
    auVar144._4_4_ = fVar185;
    auVar144._0_4_ = fVar170;
    fVar186 = fVar244 * fVar244 * fVar244;
    auVar144._8_4_ = fVar186;
    fVar187 = fVar246 * fVar246 * fVar246;
    auVar144._12_4_ = fVar187;
    fVar188 = fVar247 * fVar247 * fVar247;
    auVar144._16_4_ = fVar188;
    fVar189 = fVar252 * fVar252 * fVar252;
    auVar144._20_4_ = fVar189;
    fVar190 = fVar253 * fVar253 * fVar253;
    auVar144._24_4_ = fVar190;
    auVar144._28_4_ = auVar175._0_4_;
    auVar121 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar112 = vmulps_avx512vl(auVar144,auVar121);
    fVar269 = auVar99._0_4_;
    fVar271 = auVar99._4_4_;
    fVar245 = auVar99._8_4_;
    fVar230 = auVar99._12_4_;
    fVar211 = fVar269 * fVar269 * fVar269;
    fVar227 = fVar271 * fVar271 * fVar271;
    fVar228 = fVar245 * fVar245 * fVar245;
    fVar229 = fVar230 * fVar230 * fVar230;
    auVar81._28_4_ = DAT_01faff20._28_4_;
    auVar81._0_28_ = ZEXT1628(CONCAT412(fVar229,CONCAT48(fVar228,CONCAT44(fVar227,fVar211))));
    auVar161._0_4_ = fVar269 * fVar264;
    auVar161._4_4_ = fVar271 * fVar270;
    auVar161._8_4_ = fVar245 * fVar244;
    auVar161._12_4_ = fVar230 * fVar246;
    auVar161._16_4_ = fVar247 * 0.0;
    auVar161._20_4_ = fVar252 * 0.0;
    auVar161._28_36_ = auVar273._28_36_;
    auVar161._24_4_ = fVar253 * 0.0;
    auVar123 = vmulps_avx512vl(auVar81,auVar121);
    fVar275 = auVar123._28_4_ + auVar175._0_4_;
    fVar258 = fVar275 + auVar276._28_4_ + auVar257._28_4_;
    auVar145._4_4_ = fVar185 * 0.16666667;
    auVar145._0_4_ = fVar170 * 0.16666667;
    auVar145._8_4_ = fVar186 * 0.16666667;
    auVar145._12_4_ = fVar187 * 0.16666667;
    auVar145._16_4_ = fVar188 * 0.16666667;
    auVar145._20_4_ = fVar189 * 0.16666667;
    auVar145._24_4_ = fVar190 * 0.16666667;
    auVar145._28_4_ = fVar275;
    auVar148._4_4_ =
         (auVar161._4_4_ * fVar270 * 12.0 + auVar161._4_4_ * fVar271 * 6.0 +
         fVar227 + auVar112._4_4_) * 0.16666667;
    auVar148._0_4_ =
         (auVar161._0_4_ * fVar264 * 12.0 + auVar161._0_4_ * fVar269 * 6.0 +
         fVar211 + auVar112._0_4_) * 0.16666667;
    auVar148._8_4_ =
         (auVar161._8_4_ * fVar244 * 12.0 + auVar161._8_4_ * fVar245 * 6.0 +
         fVar228 + auVar112._8_4_) * 0.16666667;
    auVar148._12_4_ =
         (auVar161._12_4_ * fVar246 * 12.0 + auVar161._12_4_ * fVar230 * 6.0 +
         fVar229 + auVar112._12_4_) * 0.16666667;
    auVar148._16_4_ =
         (auVar161._16_4_ * fVar247 * 12.0 + auVar161._16_4_ * 0.0 * 6.0 + auVar112._16_4_ + 0.0) *
         0.16666667;
    auVar148._20_4_ =
         (auVar161._20_4_ * fVar252 * 12.0 + auVar161._20_4_ * 0.0 * 6.0 + auVar112._20_4_ + 0.0) *
         0.16666667;
    auVar148._24_4_ =
         (auVar161._24_4_ * fVar253 * 12.0 + auVar161._24_4_ * 0.0 * 6.0 + auVar112._24_4_ + 0.0) *
         0.16666667;
    auVar148._28_4_ = auVar276._28_4_;
    auVar149._4_4_ =
         (auVar123._4_4_ + fVar185 +
         auVar161._4_4_ * fVar271 * 12.0 + auVar161._4_4_ * fVar270 * 6.0) * 0.16666667;
    auVar149._0_4_ =
         (auVar123._0_4_ + fVar170 +
         auVar161._0_4_ * fVar269 * 12.0 + auVar161._0_4_ * fVar264 * 6.0) * 0.16666667;
    auVar149._8_4_ =
         (auVar123._8_4_ + fVar186 +
         auVar161._8_4_ * fVar245 * 12.0 + auVar161._8_4_ * fVar244 * 6.0) * 0.16666667;
    auVar149._12_4_ =
         (auVar123._12_4_ + fVar187 +
         auVar161._12_4_ * fVar230 * 12.0 + auVar161._12_4_ * fVar246 * 6.0) * 0.16666667;
    auVar149._16_4_ =
         (auVar123._16_4_ + fVar188 + auVar161._16_4_ * 0.0 * 12.0 + auVar161._16_4_ * fVar247 * 6.0
         ) * 0.16666667;
    auVar149._20_4_ =
         (auVar123._20_4_ + fVar189 + auVar161._20_4_ * 0.0 * 12.0 + auVar161._20_4_ * fVar252 * 6.0
         ) * 0.16666667;
    auVar149._24_4_ =
         (auVar123._24_4_ + fVar190 + auVar161._24_4_ * 0.0 * 12.0 + auVar161._24_4_ * fVar253 * 6.0
         ) * 0.16666667;
    auVar149._28_4_ = auVar280._28_4_;
    fVar211 = fVar211 * 0.16666667;
    fVar227 = fVar227 * 0.16666667;
    fVar228 = fVar228 * 0.16666667;
    fVar229 = fVar229 * 0.16666667;
    auVar243._28_4_ = fVar258;
    auVar243._0_28_ = ZEXT1628(CONCAT412(fVar229,CONCAT48(fVar228,CONCAT44(fVar227,fVar211))));
    auVar123 = vmulps_avx512vl(local_5a0,auVar243);
    auVar39._4_4_ = local_5c0._4_4_ * fVar227;
    auVar39._0_4_ = local_5c0._0_4_ * fVar211;
    auVar39._8_4_ = local_5c0._8_4_ * fVar228;
    auVar39._12_4_ = local_5c0._12_4_ * fVar229;
    auVar39._16_4_ = local_5c0._16_4_ * 0.0;
    auVar39._20_4_ = local_5c0._20_4_ * 0.0;
    auVar39._24_4_ = local_5c0._24_4_ * 0.0;
    auVar39._28_4_ = auVar274._28_4_ + auVar280._28_4_ + DAT_01faff20._28_4_ + auVar112._28_4_;
    auVar112 = vmulps_avx512vl(local_5e0,auVar243);
    auVar40._4_4_ = local_600._4_4_ * fVar227;
    auVar40._0_4_ = local_600._0_4_ * fVar211;
    auVar40._8_4_ = local_600._8_4_ * fVar228;
    auVar40._12_4_ = local_600._12_4_ * fVar229;
    auVar40._16_4_ = local_600._16_4_ * 0.0;
    auVar40._20_4_ = local_600._20_4_ * 0.0;
    auVar40._24_4_ = local_600._24_4_ * 0.0;
    auVar40._28_4_ = fVar258;
    auVar123 = vfmadd231ps_avx512vl(auVar123,auVar149,auVar283._0_32_);
    auVar124 = vfmadd231ps_avx512vl(auVar39,auVar149,auVar119);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar149,auVar284._0_32_);
    auVar110 = vfmadd231ps_avx512vl(auVar40,auVar120,auVar149);
    auVar123 = vfmadd231ps_avx512vl(auVar123,auVar148,auVar281._0_32_);
    auVar124 = vfmadd231ps_avx512vl(auVar124,auVar148,auVar118);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar148,auVar282._0_32_);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar114,auVar148);
    auVar111 = vfmadd231ps_avx512vl(auVar123,auVar145,auVar115);
    auVar125 = vfmadd231ps_avx512vl(auVar124,auVar145,auVar113);
    auVar126 = vfmadd231ps_avx512vl(auVar112,auVar145,auVar116);
    auVar112 = vfmadd231ps_avx512vl(auVar110,auVar117,auVar145);
    auVar110 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar123 = vxorps_avx512vl(auVar122,auVar110);
    auVar124 = vxorps_avx512vl(ZEXT1632(auVar99),auVar110);
    auVar250._0_4_ = auVar124._0_4_ * fVar269;
    auVar250._4_4_ = auVar124._4_4_ * fVar271;
    auVar250._8_4_ = auVar124._8_4_ * fVar245;
    auVar250._12_4_ = auVar124._12_4_ * fVar230;
    auVar250._16_4_ = auVar124._16_4_ * 0.0;
    auVar250._20_4_ = auVar124._20_4_ * 0.0;
    auVar250._24_4_ = auVar124._24_4_ * 0.0;
    auVar250._28_4_ = 0;
    auVar127 = vmulps_avx512vl(auVar161._0_32_,auVar121);
    auVar121 = vsubps_avx(auVar250,auVar127);
    auVar41._4_4_ = auVar123._4_4_ * fVar270 * 0.5;
    auVar41._0_4_ = auVar123._0_4_ * fVar264 * 0.5;
    auVar41._8_4_ = auVar123._8_4_ * fVar244 * 0.5;
    auVar41._12_4_ = auVar123._12_4_ * fVar246 * 0.5;
    auVar41._16_4_ = auVar123._16_4_ * fVar247 * 0.5;
    auVar41._20_4_ = auVar123._20_4_ * fVar252 * 0.5;
    auVar41._24_4_ = auVar123._24_4_ * fVar253 * 0.5;
    auVar41._28_4_ = auVar122._28_4_;
    auVar42._4_4_ = auVar121._4_4_ * 0.5;
    auVar42._0_4_ = auVar121._0_4_ * 0.5;
    auVar42._8_4_ = auVar121._8_4_ * 0.5;
    auVar42._12_4_ = auVar121._12_4_ * 0.5;
    auVar42._16_4_ = auVar121._16_4_ * 0.5;
    auVar42._20_4_ = auVar121._20_4_ * 0.5;
    auVar42._24_4_ = auVar121._24_4_ * 0.5;
    auVar42._28_4_ = auVar121._28_4_;
    auVar43._4_4_ = (auVar127._4_4_ + fVar270 * fVar270) * 0.5;
    auVar43._0_4_ = (auVar127._0_4_ + fVar264 * fVar264) * 0.5;
    auVar43._8_4_ = (auVar127._8_4_ + fVar244 * fVar244) * 0.5;
    auVar43._12_4_ = (auVar127._12_4_ + fVar246 * fVar246) * 0.5;
    auVar43._16_4_ = (auVar127._16_4_ + fVar247 * fVar247) * 0.5;
    auVar43._20_4_ = (auVar127._20_4_ + fVar252 * fVar252) * 0.5;
    auVar43._24_4_ = (auVar127._24_4_ + fVar253 * fVar253) * 0.5;
    auVar43._28_4_ = auVar127._28_4_ + auVar263._28_4_;
    fVar264 = fVar269 * fVar269 * 0.5;
    fVar269 = fVar271 * fVar271 * 0.5;
    fVar270 = fVar245 * fVar245 * 0.5;
    fVar271 = fVar230 * fVar230 * 0.5;
    auVar44._28_4_ = auVar268._28_4_;
    auVar44._0_28_ = ZEXT1628(CONCAT412(fVar271,CONCAT48(fVar270,CONCAT44(fVar269,fVar264))));
    auVar121 = vmulps_avx512vl(local_5a0,auVar44);
    auVar45._4_4_ = local_5c0._4_4_ * fVar269;
    auVar45._0_4_ = local_5c0._0_4_ * fVar264;
    auVar45._8_4_ = local_5c0._8_4_ * fVar270;
    auVar45._12_4_ = local_5c0._12_4_ * fVar271;
    auVar45._16_4_ = local_5c0._16_4_ * 0.0;
    auVar45._20_4_ = local_5c0._20_4_ * 0.0;
    auVar45._24_4_ = local_5c0._24_4_ * 0.0;
    auVar45._28_4_ = auVar124._28_4_;
    auVar122 = vmulps_avx512vl(local_5e0,auVar44);
    auVar46._4_4_ = fVar269 * local_600._4_4_;
    auVar46._0_4_ = fVar264 * local_600._0_4_;
    auVar46._8_4_ = fVar270 * local_600._8_4_;
    auVar46._12_4_ = fVar271 * local_600._12_4_;
    auVar46._16_4_ = local_600._16_4_ * 0.0;
    auVar46._20_4_ = local_600._20_4_ * 0.0;
    auVar46._24_4_ = local_600._24_4_ * 0.0;
    auVar46._28_4_ = auVar268._28_4_;
    auVar121 = vfmadd231ps_avx512vl(auVar121,auVar43,auVar283._0_32_);
    auVar123 = vfmadd231ps_avx512vl(auVar45,auVar43,auVar119);
    auVar122 = vfmadd231ps_avx512vl(auVar122,auVar43,auVar284._0_32_);
    auVar99 = vfmadd231ps_fma(auVar46,auVar120,auVar43);
    auVar121 = vfmadd231ps_avx512vl(auVar121,auVar42,auVar281._0_32_);
    auVar123 = vfmadd231ps_avx512vl(auVar123,auVar42,auVar118);
    auVar122 = vfmadd231ps_avx512vl(auVar122,auVar42,auVar282._0_32_);
    auVar124 = vfmadd231ps_avx512vl(ZEXT1632(auVar99),auVar114,auVar42);
    auVar121 = vfmadd231ps_avx512vl(auVar121,auVar41,auVar115);
    auVar123 = vfmadd231ps_avx512vl(auVar123,auVar41,auVar113);
    auVar122 = vfmadd231ps_avx512vl(auVar122,auVar41,auVar116);
    auVar124 = vfmadd231ps_avx512vl(auVar124,auVar117,auVar41);
    auVar47._4_4_ = auVar121._4_4_ * fVar254;
    auVar47._0_4_ = auVar121._0_4_ * fVar254;
    auVar47._8_4_ = auVar121._8_4_ * fVar254;
    auVar47._12_4_ = auVar121._12_4_ * fVar254;
    auVar47._16_4_ = auVar121._16_4_ * fVar254;
    auVar47._20_4_ = auVar121._20_4_ * fVar254;
    auVar47._24_4_ = auVar121._24_4_ * fVar254;
    auVar47._28_4_ = auVar120._28_4_;
    auVar280 = ZEXT3264(auVar47);
    auVar48._4_4_ = auVar123._4_4_ * fVar254;
    auVar48._0_4_ = auVar123._0_4_ * fVar254;
    auVar48._8_4_ = auVar123._8_4_ * fVar254;
    auVar48._12_4_ = auVar123._12_4_ * fVar254;
    auVar48._16_4_ = auVar123._16_4_ * fVar254;
    auVar48._20_4_ = auVar123._20_4_ * fVar254;
    auVar48._24_4_ = auVar123._24_4_ * fVar254;
    auVar48._28_4_ = 0x3e2aaaab;
    auVar49._4_4_ = auVar122._4_4_ * fVar254;
    auVar49._0_4_ = auVar122._0_4_ * fVar254;
    auVar49._8_4_ = auVar122._8_4_ * fVar254;
    auVar49._12_4_ = auVar122._12_4_ * fVar254;
    auVar49._16_4_ = auVar122._16_4_ * fVar254;
    auVar49._20_4_ = auVar122._20_4_ * fVar254;
    auVar49._24_4_ = auVar122._24_4_ * fVar254;
    auVar49._28_4_ = 0x40c00000;
    fVar264 = auVar124._0_4_ * fVar254;
    fVar269 = auVar124._4_4_ * fVar254;
    auVar50._4_4_ = fVar269;
    auVar50._0_4_ = fVar264;
    fVar270 = auVar124._8_4_ * fVar254;
    auVar50._8_4_ = fVar270;
    fVar271 = auVar124._12_4_ * fVar254;
    auVar50._12_4_ = fVar271;
    fVar244 = auVar124._16_4_ * fVar254;
    auVar50._16_4_ = fVar244;
    fVar245 = auVar124._20_4_ * fVar254;
    auVar50._20_4_ = fVar245;
    fVar246 = auVar124._24_4_ * fVar254;
    auVar50._24_4_ = fVar246;
    auVar50._28_4_ = fVar254;
    auVar99 = vxorps_avx512vl(auVar184._0_16_,auVar184._0_16_);
    auVar127 = vpermt2ps_avx512vl(auVar111,_DAT_01feed00,ZEXT1632(auVar99));
    auVar273 = ZEXT3264(auVar127);
    auVar128 = vpermt2ps_avx512vl(auVar125,_DAT_01feed00,ZEXT1632(auVar99));
    auVar274 = ZEXT3264(auVar128);
    auVar123 = ZEXT1632(auVar99);
    auVar129 = vpermt2ps_avx512vl(auVar126,_DAT_01feed00,auVar123);
    auVar276 = ZEXT3264(auVar129);
    auVar251._0_4_ = fVar264 + auVar112._0_4_;
    auVar251._4_4_ = fVar269 + auVar112._4_4_;
    auVar251._8_4_ = fVar270 + auVar112._8_4_;
    auVar251._12_4_ = fVar271 + auVar112._12_4_;
    auVar251._16_4_ = fVar244 + auVar112._16_4_;
    auVar251._20_4_ = fVar245 + auVar112._20_4_;
    auVar251._24_4_ = fVar246 + auVar112._24_4_;
    auVar251._28_4_ = fVar254 + auVar112._28_4_;
    auVar121 = vmaxps_avx(auVar112,auVar251);
    auVar122 = vminps_avx(auVar112,auVar251);
    auVar130 = vpermt2ps_avx512vl(auVar112,_DAT_01feed00,auVar123);
    auVar131 = vpermt2ps_avx512vl(auVar47,_DAT_01feed00,auVar123);
    auVar268 = ZEXT3264(auVar131);
    auVar132 = vpermt2ps_avx512vl(auVar48,_DAT_01feed00,auVar123);
    auVar145 = ZEXT1632(auVar99);
    auVar133 = vpermt2ps_avx512vl(auVar49,_DAT_01feed00,auVar145);
    auVar112 = vpermt2ps_avx512vl(auVar50,_DAT_01feed00,auVar145);
    auVar134 = vsubps_avx512vl(auVar130,auVar112);
    auVar112 = vsubps_avx(auVar127,auVar111);
    auVar263 = ZEXT3264(auVar112);
    auVar123 = vsubps_avx(auVar128,auVar125);
    auVar124 = vsubps_avx(auVar129,auVar126);
    auVar257 = ZEXT3264(auVar124);
    auVar135 = vmulps_avx512vl(auVar123,auVar49);
    auVar135 = vfmsub231ps_avx512vl(auVar135,auVar48,auVar124);
    auVar136 = vmulps_avx512vl(auVar124,auVar47);
    auVar136 = vfmsub231ps_avx512vl(auVar136,auVar49,auVar112);
    auVar137 = vmulps_avx512vl(auVar112,auVar48);
    auVar137 = vfmsub231ps_avx512vl(auVar137,auVar47,auVar123);
    auVar137 = vmulps_avx512vl(auVar137,auVar137);
    auVar136 = vfmadd231ps_avx512vl(auVar137,auVar136,auVar136);
    auVar135 = vfmadd231ps_avx512vl(auVar136,auVar135,auVar135);
    auVar136 = vmulps_avx512vl(auVar124,auVar124);
    auVar136 = vfmadd231ps_avx512vl(auVar136,auVar123,auVar123);
    auVar136 = vfmadd231ps_avx512vl(auVar136,auVar112,auVar112);
    auVar137 = vrcp14ps_avx512vl(auVar136);
    auVar138 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar139 = vfnmadd213ps_avx512vl(auVar137,auVar136,auVar138);
    auVar137 = vfmadd132ps_avx512vl(auVar139,auVar137,auVar137);
    auVar135 = vmulps_avx512vl(auVar135,auVar137);
    auVar139 = vmulps_avx512vl(auVar123,auVar133);
    auVar139 = vfmsub231ps_avx512vl(auVar139,auVar132,auVar124);
    auVar140 = vmulps_avx512vl(auVar124,auVar131);
    auVar140 = vfmsub231ps_avx512vl(auVar140,auVar133,auVar112);
    auVar141 = vmulps_avx512vl(auVar112,auVar132);
    auVar141 = vfmsub231ps_avx512vl(auVar141,auVar131,auVar123);
    auVar141 = vmulps_avx512vl(auVar141,auVar141);
    auVar140 = vfmadd231ps_avx512vl(auVar141,auVar140,auVar140);
    auVar139 = vfmadd231ps_avx512vl(auVar140,auVar139,auVar139);
    auVar137 = vmulps_avx512vl(auVar139,auVar137);
    auVar135 = vmaxps_avx512vl(auVar135,auVar137);
    auVar135 = vsqrtps_avx512vl(auVar135);
    auVar137 = vmaxps_avx512vl(auVar134,auVar130);
    auVar121 = vmaxps_avx512vl(auVar121,auVar137);
    auVar137 = vaddps_avx512vl(auVar135,auVar121);
    auVar121 = vminps_avx512vl(auVar134,auVar130);
    auVar121 = vminps_avx(auVar122,auVar121);
    auVar121 = vsubps_avx512vl(auVar121,auVar135);
    auVar139._8_4_ = 0x3f800002;
    auVar139._0_8_ = 0x3f8000023f800002;
    auVar139._12_4_ = 0x3f800002;
    auVar139._16_4_ = 0x3f800002;
    auVar139._20_4_ = 0x3f800002;
    auVar139._24_4_ = 0x3f800002;
    auVar139._28_4_ = 0x3f800002;
    auVar122 = vmulps_avx512vl(auVar137,auVar139);
    auVar140._8_4_ = 0x3f7ffffc;
    auVar140._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar140._12_4_ = 0x3f7ffffc;
    auVar140._16_4_ = 0x3f7ffffc;
    auVar140._20_4_ = 0x3f7ffffc;
    auVar140._24_4_ = 0x3f7ffffc;
    auVar140._28_4_ = 0x3f7ffffc;
    auVar121 = vmulps_avx512vl(auVar121,auVar140);
    auVar122 = vmulps_avx512vl(auVar122,auVar122);
    auVar130 = vrsqrt14ps_avx512vl(auVar136);
    auVar141._8_4_ = 0xbf000000;
    auVar141._0_8_ = 0xbf000000bf000000;
    auVar141._12_4_ = 0xbf000000;
    auVar141._16_4_ = 0xbf000000;
    auVar141._20_4_ = 0xbf000000;
    auVar141._24_4_ = 0xbf000000;
    auVar141._28_4_ = 0xbf000000;
    auVar134 = vmulps_avx512vl(auVar136,auVar141);
    fVar264 = auVar130._0_4_;
    fVar269 = auVar130._4_4_;
    fVar270 = auVar130._8_4_;
    fVar271 = auVar130._12_4_;
    fVar244 = auVar130._16_4_;
    fVar245 = auVar130._20_4_;
    fVar246 = auVar130._24_4_;
    auVar51._4_4_ = fVar269 * fVar269 * fVar269 * auVar134._4_4_;
    auVar51._0_4_ = fVar264 * fVar264 * fVar264 * auVar134._0_4_;
    auVar51._8_4_ = fVar270 * fVar270 * fVar270 * auVar134._8_4_;
    auVar51._12_4_ = fVar271 * fVar271 * fVar271 * auVar134._12_4_;
    auVar51._16_4_ = fVar244 * fVar244 * fVar244 * auVar134._16_4_;
    auVar51._20_4_ = fVar245 * fVar245 * fVar245 * auVar134._20_4_;
    auVar51._24_4_ = fVar246 * fVar246 * fVar246 * auVar134._24_4_;
    auVar51._28_4_ = auVar137._28_4_;
    auVar142._8_4_ = 0x3fc00000;
    auVar142._0_8_ = 0x3fc000003fc00000;
    auVar142._12_4_ = 0x3fc00000;
    auVar142._16_4_ = 0x3fc00000;
    auVar142._20_4_ = 0x3fc00000;
    auVar142._24_4_ = 0x3fc00000;
    auVar142._28_4_ = 0x3fc00000;
    auVar130 = vfmadd231ps_avx512vl(auVar51,auVar130,auVar142);
    auVar134 = vmulps_avx512vl(auVar112,auVar130);
    auVar135 = vmulps_avx512vl(auVar123,auVar130);
    auVar136 = vmulps_avx512vl(auVar124,auVar130);
    auVar137 = vsubps_avx512vl(auVar145,auVar111);
    auVar139 = vsubps_avx512vl(auVar145,auVar125);
    auVar140 = vsubps_avx512vl(auVar145,auVar126);
    auVar141 = vmulps_avx512vl(local_820,auVar140);
    auVar141 = vfmadd231ps_avx512vl(auVar141,local_800,auVar139);
    auVar141 = vfmadd231ps_avx512vl(auVar141,local_7e0,auVar137);
    auVar142 = vmulps_avx512vl(auVar140,auVar140);
    auVar142 = vfmadd231ps_avx512vl(auVar142,auVar139,auVar139);
    auVar142 = vfmadd231ps_avx512vl(auVar142,auVar137,auVar137);
    auVar143 = vmulps_avx512vl(local_820,auVar136);
    auVar143 = vfmadd231ps_avx512vl(auVar143,auVar135,local_800);
    auVar144 = vfmadd231ps_avx512vl(auVar143,auVar134,local_7e0);
    auVar136 = vmulps_avx512vl(auVar140,auVar136);
    auVar135 = vfmadd231ps_avx512vl(auVar136,auVar139,auVar135);
    auVar134 = vfmadd231ps_avx512vl(auVar135,auVar137,auVar134);
    auVar135 = vmulps_avx512vl(auVar144,auVar144);
    auVar136 = vsubps_avx512vl(local_560,auVar135);
    auVar143 = vmulps_avx512vl(auVar144,auVar134);
    auVar141 = vsubps_avx512vl(auVar141,auVar143);
    auVar141 = vaddps_avx512vl(auVar141,auVar141);
    auVar143 = vmulps_avx512vl(auVar134,auVar134);
    local_a20 = vsubps_avx512vl(auVar142,auVar143);
    auVar122 = vsubps_avx512vl(local_a20,auVar122);
    auVar142 = vmulps_avx512vl(auVar141,auVar141);
    auVar143._8_4_ = 0x40800000;
    auVar143._0_8_ = 0x4080000040800000;
    auVar143._12_4_ = 0x40800000;
    auVar143._16_4_ = 0x40800000;
    auVar143._20_4_ = 0x40800000;
    auVar143._24_4_ = 0x40800000;
    auVar143._28_4_ = 0x40800000;
    _local_aa0 = vmulps_avx512vl(auVar136,auVar143);
    auVar143 = vmulps_avx512vl(_local_aa0,auVar122);
    auVar143 = vsubps_avx512vl(auVar142,auVar143);
    uVar94 = vcmpps_avx512vl(auVar143,auVar145,5);
    bVar82 = (byte)uVar94;
    fVar264 = (float)local_9e0._0_4_;
    fVar269 = (float)local_9e0._4_4_;
    fVar270 = fStack_9d8;
    fVar271 = fStack_9d4;
    fVar244 = fStack_9d0;
    fVar245 = fStack_9cc;
    fVar246 = fStack_9c8;
    fVar230 = fStack_9c4;
    if (bVar82 == 0) {
      auVar184 = ZEXT3264(auVar138);
LAB_01cb0159:
      auVar281 = ZEXT3264(local_ae0);
      auVar282 = ZEXT3264(local_b00);
      auVar283 = ZEXT3264(local_b20);
      auVar284 = ZEXT3264(local_b40);
    }
    else {
      local_7c0._0_32_ = auVar142;
      auVar143 = vsqrtps_avx512vl(auVar143);
      auVar145 = vaddps_avx512vl(auVar136,auVar136);
      local_840 = vrcp14ps_avx512vl(auVar145);
      auVar138 = vfnmadd213ps_avx512vl(local_840,auVar145,auVar138);
      auVar138 = vfmadd132ps_avx512vl(auVar138,local_840,local_840);
      local_ac0 = vxorps_avx512vl(auVar141,auVar110);
      auVar110 = vsubps_avx512vl(local_ac0,auVar143);
      auVar110 = vmulps_avx512vl(auVar110,auVar138);
      auVar143 = vsubps_avx512vl(auVar143,auVar141);
      _local_860 = vmulps_avx512vl(auVar143,auVar138);
      auVar138 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar143 = vblendmps_avx512vl(auVar138,auVar110);
      auVar146._0_4_ =
           (uint)(bVar82 & 1) * auVar143._0_4_ | (uint)!(bool)(bVar82 & 1) * auVar138._0_4_;
      bVar6 = (bool)((byte)(uVar94 >> 1) & 1);
      auVar146._4_4_ = (uint)bVar6 * auVar143._4_4_ | (uint)!bVar6 * auVar138._4_4_;
      bVar6 = (bool)((byte)(uVar94 >> 2) & 1);
      auVar146._8_4_ = (uint)bVar6 * auVar143._8_4_ | (uint)!bVar6 * auVar138._8_4_;
      bVar6 = (bool)((byte)(uVar94 >> 3) & 1);
      auVar146._12_4_ = (uint)bVar6 * auVar143._12_4_ | (uint)!bVar6 * auVar138._12_4_;
      bVar6 = (bool)((byte)(uVar94 >> 4) & 1);
      auVar146._16_4_ = (uint)bVar6 * auVar143._16_4_ | (uint)!bVar6 * auVar138._16_4_;
      bVar6 = (bool)((byte)(uVar94 >> 5) & 1);
      auVar146._20_4_ = (uint)bVar6 * auVar143._20_4_ | (uint)!bVar6 * auVar138._20_4_;
      bVar6 = (bool)((byte)(uVar94 >> 6) & 1);
      auVar146._24_4_ = (uint)bVar6 * auVar143._24_4_ | (uint)!bVar6 * auVar138._24_4_;
      bVar6 = SUB81(uVar94 >> 7,0);
      auVar146._28_4_ = (uint)bVar6 * auVar143._28_4_ | (uint)!bVar6 * auVar138._28_4_;
      auVar138 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar143 = vblendmps_avx512vl(auVar138,_local_860);
      auVar147._0_4_ =
           (uint)(bVar82 & 1) * auVar143._0_4_ | (uint)!(bool)(bVar82 & 1) * auVar138._0_4_;
      bVar6 = (bool)((byte)(uVar94 >> 1) & 1);
      auVar147._4_4_ = (uint)bVar6 * auVar143._4_4_ | (uint)!bVar6 * auVar138._4_4_;
      bVar6 = (bool)((byte)(uVar94 >> 2) & 1);
      auVar147._8_4_ = (uint)bVar6 * auVar143._8_4_ | (uint)!bVar6 * auVar138._8_4_;
      bVar6 = (bool)((byte)(uVar94 >> 3) & 1);
      auVar147._12_4_ = (uint)bVar6 * auVar143._12_4_ | (uint)!bVar6 * auVar138._12_4_;
      bVar6 = (bool)((byte)(uVar94 >> 4) & 1);
      auVar147._16_4_ = (uint)bVar6 * auVar143._16_4_ | (uint)!bVar6 * auVar138._16_4_;
      bVar6 = (bool)((byte)(uVar94 >> 5) & 1);
      auVar147._20_4_ = (uint)bVar6 * auVar143._20_4_ | (uint)!bVar6 * auVar138._20_4_;
      bVar6 = (bool)((byte)(uVar94 >> 6) & 1);
      auVar147._24_4_ = (uint)bVar6 * auVar143._24_4_ | (uint)!bVar6 * auVar138._24_4_;
      bVar6 = SUB81(uVar94 >> 7,0);
      auVar147._28_4_ = (uint)bVar6 * auVar143._28_4_ | (uint)!bVar6 * auVar138._28_4_;
      auVar138 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar135,auVar138);
      local_880 = vmaxps_avx512vl(local_580,auVar138);
      auVar32._8_4_ = 0x36000000;
      auVar32._0_8_ = 0x3600000036000000;
      auVar32._12_4_ = 0x36000000;
      auVar32._16_4_ = 0x36000000;
      auVar32._20_4_ = 0x36000000;
      auVar32._24_4_ = 0x36000000;
      auVar32._28_4_ = 0x36000000;
      local_8a0 = vmulps_avx512vl(local_880,auVar32);
      vandps_avx512vl(auVar136,auVar138);
      uVar86 = vcmpps_avx512vl(local_8a0,local_8a0,1);
      uVar94 = uVar94 & uVar86;
      bVar87 = (byte)uVar94;
      if (bVar87 != 0) {
        uVar86 = vcmpps_avx512vl(auVar122,_DAT_01faff00,2);
        auVar122 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar135 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar136 = vblendmps_avx512vl(auVar122,auVar135);
        bVar88 = (byte)uVar86;
        uVar96 = (uint)(bVar88 & 1) * auVar136._0_4_ | (uint)!(bool)(bVar88 & 1) * local_8a0._0_4_;
        bVar6 = (bool)((byte)(uVar86 >> 1) & 1);
        uVar95 = (uint)bVar6 * auVar136._4_4_ | (uint)!bVar6 * local_8a0._4_4_;
        bVar6 = (bool)((byte)(uVar86 >> 2) & 1);
        uVar162 = (uint)bVar6 * auVar136._8_4_ | (uint)!bVar6 * local_8a0._8_4_;
        bVar6 = (bool)((byte)(uVar86 >> 3) & 1);
        uVar163 = (uint)bVar6 * auVar136._12_4_ | (uint)!bVar6 * local_8a0._12_4_;
        bVar6 = (bool)((byte)(uVar86 >> 4) & 1);
        uVar164 = (uint)bVar6 * auVar136._16_4_ | (uint)!bVar6 * local_8a0._16_4_;
        bVar6 = (bool)((byte)(uVar86 >> 5) & 1);
        uVar165 = (uint)bVar6 * auVar136._20_4_ | (uint)!bVar6 * local_8a0._20_4_;
        bVar6 = (bool)((byte)(uVar86 >> 6) & 1);
        uVar166 = (uint)bVar6 * auVar136._24_4_ | (uint)!bVar6 * local_8a0._24_4_;
        bVar6 = SUB81(uVar86 >> 7,0);
        uVar167 = (uint)bVar6 * auVar136._28_4_ | (uint)!bVar6 * local_8a0._28_4_;
        auVar146._0_4_ = (bVar87 & 1) * uVar96 | !(bool)(bVar87 & 1) * auVar146._0_4_;
        bVar6 = (bool)((byte)(uVar94 >> 1) & 1);
        auVar146._4_4_ = bVar6 * uVar95 | !bVar6 * auVar146._4_4_;
        bVar6 = (bool)((byte)(uVar94 >> 2) & 1);
        auVar146._8_4_ = bVar6 * uVar162 | !bVar6 * auVar146._8_4_;
        bVar6 = (bool)((byte)(uVar94 >> 3) & 1);
        auVar146._12_4_ = bVar6 * uVar163 | !bVar6 * auVar146._12_4_;
        bVar6 = (bool)((byte)(uVar94 >> 4) & 1);
        auVar146._16_4_ = bVar6 * uVar164 | !bVar6 * auVar146._16_4_;
        bVar6 = (bool)((byte)(uVar94 >> 5) & 1);
        auVar146._20_4_ = bVar6 * uVar165 | !bVar6 * auVar146._20_4_;
        bVar6 = (bool)((byte)(uVar94 >> 6) & 1);
        auVar146._24_4_ = bVar6 * uVar166 | !bVar6 * auVar146._24_4_;
        bVar6 = SUB81(uVar94 >> 7,0);
        auVar146._28_4_ = bVar6 * uVar167 | !bVar6 * auVar146._28_4_;
        auVar122 = vblendmps_avx512vl(auVar135,auVar122);
        bVar6 = (bool)((byte)(uVar86 >> 1) & 1);
        bVar8 = (bool)((byte)(uVar86 >> 2) & 1);
        bVar9 = (bool)((byte)(uVar86 >> 3) & 1);
        bVar10 = (bool)((byte)(uVar86 >> 4) & 1);
        bVar11 = (bool)((byte)(uVar86 >> 5) & 1);
        bVar12 = (bool)((byte)(uVar86 >> 6) & 1);
        bVar13 = SUB81(uVar86 >> 7,0);
        auVar147._0_4_ =
             (uint)(bVar87 & 1) *
             ((uint)(bVar88 & 1) * auVar122._0_4_ | !(bool)(bVar88 & 1) * uVar96) |
             !(bool)(bVar87 & 1) * auVar147._0_4_;
        bVar7 = (bool)((byte)(uVar94 >> 1) & 1);
        auVar147._4_4_ =
             (uint)bVar7 * ((uint)bVar6 * auVar122._4_4_ | !bVar6 * uVar95) |
             !bVar7 * auVar147._4_4_;
        bVar6 = (bool)((byte)(uVar94 >> 2) & 1);
        auVar147._8_4_ =
             (uint)bVar6 * ((uint)bVar8 * auVar122._8_4_ | !bVar8 * uVar162) |
             !bVar6 * auVar147._8_4_;
        bVar6 = (bool)((byte)(uVar94 >> 3) & 1);
        auVar147._12_4_ =
             (uint)bVar6 * ((uint)bVar9 * auVar122._12_4_ | !bVar9 * uVar163) |
             !bVar6 * auVar147._12_4_;
        bVar6 = (bool)((byte)(uVar94 >> 4) & 1);
        auVar147._16_4_ =
             (uint)bVar6 * ((uint)bVar10 * auVar122._16_4_ | !bVar10 * uVar164) |
             !bVar6 * auVar147._16_4_;
        bVar6 = (bool)((byte)(uVar94 >> 5) & 1);
        auVar147._20_4_ =
             (uint)bVar6 * ((uint)bVar11 * auVar122._20_4_ | !bVar11 * uVar165) |
             !bVar6 * auVar147._20_4_;
        bVar6 = (bool)((byte)(uVar94 >> 6) & 1);
        auVar147._24_4_ =
             (uint)bVar6 * ((uint)bVar12 * auVar122._24_4_ | !bVar12 * uVar166) |
             !bVar6 * auVar147._24_4_;
        bVar6 = SUB81(uVar94 >> 7,0);
        auVar147._28_4_ =
             (uint)bVar6 * ((uint)bVar13 * auVar122._28_4_ | !bVar13 * uVar167) |
             !bVar6 * auVar147._28_4_;
        bVar82 = (~bVar87 | bVar88) & bVar82;
      }
      if ((bVar82 & 0x7f) == 0) {
        auVar121 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar184 = ZEXT3264(auVar121);
        goto LAB_01cb0159;
      }
      auVar122 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar133 = vxorps_avx512vl(auVar133,auVar122);
      auVar131 = vxorps_avx512vl(auVar131,auVar122);
      uVar96 = *(uint *)(ray + k * 4 + 0x200);
      auVar132 = vxorps_avx512vl(auVar132,auVar122);
      local_a40 = ZEXT416(uVar96);
      auVar99 = vsubss_avx512f(local_a40,ZEXT416((uint)local_940._0_4_));
      auVar135 = vbroadcastss_avx512vl(auVar99);
      auVar135 = vminps_avx512vl(auVar135,auVar147);
      auVar80._4_4_ = fStack_61c;
      auVar80._0_4_ = local_620;
      auVar80._8_4_ = fStack_618;
      auVar80._12_4_ = fStack_614;
      auVar80._16_4_ = fStack_610;
      auVar80._20_4_ = fStack_60c;
      auVar80._24_4_ = fStack_608;
      auVar80._28_4_ = fStack_604;
      auVar136 = vmaxps_avx512vl(auVar80,auVar146);
      auVar138 = vmulps_avx512vl(auVar49,auVar140);
      auVar138 = vfmadd213ps_avx512vl(auVar139,auVar48,auVar138);
      auVar99 = vfmadd213ps_fma(auVar137,auVar47,auVar138);
      auVar137 = vmulps_avx512vl(local_820,auVar49);
      auVar137 = vfmadd231ps_avx512vl(auVar137,local_800,auVar48);
      auVar104 = vfmadd231ps_fma(auVar137,local_7e0,auVar47);
      auVar137 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(ZEXT1632(auVar104),auVar137);
      auVar138 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar22 = vcmpps_avx512vl(auVar137,auVar138,1);
      auVar139 = vxorps_avx512vl(ZEXT1632(auVar99),auVar122);
      auVar140 = vrcp14ps_avx512vl(ZEXT1632(auVar104));
      auVar243 = ZEXT1632(auVar104);
      auVar143 = vxorps_avx512vl(auVar243,auVar122);
      auVar148 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar149 = vfnmadd213ps_avx512vl(auVar140,auVar243,auVar148);
      auVar99 = vfmadd132ps_fma(auVar149,auVar140,auVar140);
      fVar247 = auVar99._0_4_ * auVar139._0_4_;
      fVar252 = auVar99._4_4_ * auVar139._4_4_;
      auVar52._4_4_ = fVar252;
      auVar52._0_4_ = fVar247;
      fVar253 = auVar99._8_4_ * auVar139._8_4_;
      auVar52._8_4_ = fVar253;
      fVar254 = auVar99._12_4_ * auVar139._12_4_;
      auVar52._12_4_ = fVar254;
      fVar170 = auVar139._16_4_ * 0.0;
      auVar52._16_4_ = fVar170;
      fVar185 = auVar139._20_4_ * 0.0;
      auVar52._20_4_ = fVar185;
      fVar186 = auVar139._24_4_ * 0.0;
      auVar52._24_4_ = fVar186;
      auVar52._28_4_ = auVar139._28_4_;
      uVar23 = vcmpps_avx512vl(auVar243,auVar143,1);
      bVar87 = (byte)uVar22 | (byte)uVar23;
      auVar279._8_4_ = 0xff800000;
      auVar279._0_8_ = 0xff800000ff800000;
      auVar279._12_4_ = 0xff800000;
      auVar279._16_4_ = 0xff800000;
      auVar279._20_4_ = 0xff800000;
      auVar279._24_4_ = 0xff800000;
      auVar279._28_4_ = 0xff800000;
      auVar140 = vblendmps_avx512vl(auVar52,auVar279);
      auVar150._0_4_ = (uint)(bVar87 & 1) * auVar140._0_4_ | (uint)!(bool)(bVar87 & 1) * -0x800000;
      bVar6 = (bool)(bVar87 >> 1 & 1);
      auVar150._4_4_ = (uint)bVar6 * auVar140._4_4_ | (uint)!bVar6 * -0x800000;
      bVar6 = (bool)(bVar87 >> 2 & 1);
      auVar150._8_4_ = (uint)bVar6 * auVar140._8_4_ | (uint)!bVar6 * -0x800000;
      bVar6 = (bool)(bVar87 >> 3 & 1);
      auVar150._12_4_ = (uint)bVar6 * auVar140._12_4_ | (uint)!bVar6 * -0x800000;
      bVar6 = (bool)(bVar87 >> 4 & 1);
      auVar150._16_4_ = (uint)bVar6 * auVar140._16_4_ | (uint)!bVar6 * -0x800000;
      bVar6 = (bool)(bVar87 >> 5 & 1);
      auVar150._20_4_ = (uint)bVar6 * auVar140._20_4_ | (uint)!bVar6 * -0x800000;
      bVar6 = (bool)(bVar87 >> 6 & 1);
      auVar150._24_4_ = (uint)bVar6 * auVar140._24_4_ | (uint)!bVar6 * -0x800000;
      auVar150._28_4_ =
           (uint)(bVar87 >> 7) * auVar140._28_4_ | (uint)!(bool)(bVar87 >> 7) * -0x800000;
      auVar140 = vmaxps_avx512vl(auVar136,auVar150);
      auVar280 = ZEXT3264(auVar140);
      uVar23 = vcmpps_avx512vl(auVar243,auVar143,6);
      bVar87 = (byte)uVar22 | (byte)uVar23;
      auVar151._0_4_ = (uint)(bVar87 & 1) * 0x7f800000 | (uint)!(bool)(bVar87 & 1) * (int)fVar247;
      bVar6 = (bool)(bVar87 >> 1 & 1);
      auVar151._4_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar252;
      bVar6 = (bool)(bVar87 >> 2 & 1);
      auVar151._8_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar253;
      bVar6 = (bool)(bVar87 >> 3 & 1);
      auVar151._12_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar254;
      bVar6 = (bool)(bVar87 >> 4 & 1);
      auVar151._16_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar170;
      bVar6 = (bool)(bVar87 >> 5 & 1);
      auVar151._20_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar185;
      bVar6 = (bool)(bVar87 >> 6 & 1);
      auVar151._24_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar186;
      auVar151._28_4_ =
           (uint)(bVar87 >> 7) * 0x7f800000 | (uint)!(bool)(bVar87 >> 7) * auVar139._28_4_;
      auVar135 = vminps_avx512vl(auVar135,auVar151);
      auVar99 = vxorps_avx512vl(auVar136._0_16_,auVar136._0_16_);
      auVar127 = vsubps_avx512vl(ZEXT1632(auVar99),auVar127);
      auVar128 = vsubps_avx512vl(ZEXT1632(auVar99),auVar128);
      auVar136 = ZEXT1632(auVar99);
      auVar129 = vsubps_avx512vl(auVar136,auVar129);
      auVar129 = vmulps_avx512vl(auVar129,auVar133);
      auVar128 = vfmadd231ps_avx512vl(auVar129,auVar132,auVar128);
      auVar127 = vfmadd231ps_avx512vl(auVar128,auVar131,auVar127);
      auVar128 = vmulps_avx512vl(local_820,auVar133);
      auVar128 = vfmadd231ps_avx512vl(auVar128,local_800,auVar132);
      auVar128 = vfmadd231ps_avx512vl(auVar128,local_7e0,auVar131);
      vandps_avx512vl(auVar128,auVar137);
      uVar22 = vcmpps_avx512vl(auVar128,auVar138,1);
      auVar127 = vxorps_avx512vl(auVar127,auVar122);
      auVar129 = vrcp14ps_avx512vl(auVar128);
      auVar122 = vxorps_avx512vl(auVar128,auVar122);
      auVar276 = ZEXT3264(auVar122);
      auVar131 = vfnmadd213ps_avx512vl(auVar129,auVar128,auVar148);
      auVar99 = vfmadd132ps_fma(auVar131,auVar129,auVar129);
      fVar247 = auVar99._0_4_ * auVar127._0_4_;
      fVar252 = auVar99._4_4_ * auVar127._4_4_;
      auVar53._4_4_ = fVar252;
      auVar53._0_4_ = fVar247;
      fVar253 = auVar99._8_4_ * auVar127._8_4_;
      auVar53._8_4_ = fVar253;
      fVar254 = auVar99._12_4_ * auVar127._12_4_;
      auVar53._12_4_ = fVar254;
      fVar170 = auVar127._16_4_ * 0.0;
      auVar53._16_4_ = fVar170;
      fVar185 = auVar127._20_4_ * 0.0;
      auVar53._20_4_ = fVar185;
      fVar186 = auVar127._24_4_ * 0.0;
      auVar53._24_4_ = fVar186;
      auVar53._28_4_ = auVar127._28_4_;
      uVar23 = vcmpps_avx512vl(auVar128,auVar122,1);
      bVar87 = (byte)uVar22 | (byte)uVar23;
      auVar33._8_4_ = 0xff800000;
      auVar33._0_8_ = 0xff800000ff800000;
      auVar33._12_4_ = 0xff800000;
      auVar33._16_4_ = 0xff800000;
      auVar33._20_4_ = 0xff800000;
      auVar33._24_4_ = 0xff800000;
      auVar33._28_4_ = 0xff800000;
      auVar131 = vblendmps_avx512vl(auVar53,auVar33);
      auVar152._0_4_ =
           (uint)(bVar87 & 1) * auVar131._0_4_ | (uint)!(bool)(bVar87 & 1) * auVar129._0_4_;
      bVar6 = (bool)(bVar87 >> 1 & 1);
      auVar152._4_4_ = (uint)bVar6 * auVar131._4_4_ | (uint)!bVar6 * auVar129._4_4_;
      bVar6 = (bool)(bVar87 >> 2 & 1);
      auVar152._8_4_ = (uint)bVar6 * auVar131._8_4_ | (uint)!bVar6 * auVar129._8_4_;
      bVar6 = (bool)(bVar87 >> 3 & 1);
      auVar152._12_4_ = (uint)bVar6 * auVar131._12_4_ | (uint)!bVar6 * auVar129._12_4_;
      bVar6 = (bool)(bVar87 >> 4 & 1);
      auVar152._16_4_ = (uint)bVar6 * auVar131._16_4_ | (uint)!bVar6 * auVar129._16_4_;
      bVar6 = (bool)(bVar87 >> 5 & 1);
      auVar152._20_4_ = (uint)bVar6 * auVar131._20_4_ | (uint)!bVar6 * auVar129._20_4_;
      bVar6 = (bool)(bVar87 >> 6 & 1);
      auVar152._24_4_ = (uint)bVar6 * auVar131._24_4_ | (uint)!bVar6 * auVar129._24_4_;
      auVar152._28_4_ =
           (uint)(bVar87 >> 7) * auVar131._28_4_ | (uint)!(bool)(bVar87 >> 7) * auVar129._28_4_;
      auVar274 = ZEXT3264(auVar152);
      _local_8c0 = vmaxps_avx(auVar140,auVar152);
      auVar268 = ZEXT3264(_local_8c0);
      uVar23 = vcmpps_avx512vl(auVar128,auVar122,6);
      bVar87 = (byte)uVar22 | (byte)uVar23;
      auVar153._0_4_ = (uint)(bVar87 & 1) * 0x7f800000 | (uint)!(bool)(bVar87 & 1) * (int)fVar247;
      bVar6 = (bool)(bVar87 >> 1 & 1);
      auVar153._4_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar252;
      bVar6 = (bool)(bVar87 >> 2 & 1);
      auVar153._8_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar253;
      bVar6 = (bool)(bVar87 >> 3 & 1);
      auVar153._12_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar254;
      bVar6 = (bool)(bVar87 >> 4 & 1);
      auVar153._16_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar170;
      bVar6 = (bool)(bVar87 >> 5 & 1);
      auVar153._20_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar185;
      bVar6 = (bool)(bVar87 >> 6 & 1);
      auVar153._24_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar186;
      auVar153._28_4_ =
           (uint)(bVar87 >> 7) * 0x7f800000 | (uint)!(bool)(bVar87 >> 7) * auVar127._28_4_;
      local_6a0 = vminps_avx(auVar135,auVar153);
      auVar273 = ZEXT3264(local_6a0);
      uVar22 = vcmpps_avx512vl(_local_8c0,local_6a0,2);
      bVar82 = bVar82 & 0x7f & (byte)uVar22;
      if (bVar82 == 0) {
        auVar184 = ZEXT3264(auVar148);
        goto LAB_01cb0159;
      }
      auVar122 = vmaxps_avx512vl(auVar136,auVar121);
      auVar121 = vfmadd213ps_avx512vl(auVar110,auVar144,auVar134);
      auVar121 = vmulps_avx512vl(auVar130,auVar121);
      auVar110 = vfmadd213ps_avx512vl(_local_860,auVar144,auVar134);
      auVar54._4_4_ = auVar130._4_4_ * auVar110._4_4_;
      auVar54._0_4_ = auVar130._0_4_ * auVar110._0_4_;
      auVar54._8_4_ = auVar130._8_4_ * auVar110._8_4_;
      auVar54._12_4_ = auVar130._12_4_ * auVar110._12_4_;
      auVar54._16_4_ = auVar130._16_4_ * auVar110._16_4_;
      auVar54._20_4_ = auVar130._20_4_ * auVar110._20_4_;
      auVar54._24_4_ = auVar130._24_4_ * auVar110._24_4_;
      auVar54._28_4_ = auVar152._28_4_;
      auVar121 = vminps_avx512vl(auVar121,auVar148);
      auVar110 = ZEXT832(0) << 0x20;
      auVar121 = vmaxps_avx(auVar121,ZEXT832(0) << 0x20);
      auVar127 = vminps_avx512vl(auVar54,auVar148);
      auVar55._4_4_ = (auVar121._4_4_ + 1.0) * 0.125;
      auVar55._0_4_ = (auVar121._0_4_ + 0.0) * 0.125;
      auVar55._8_4_ = (auVar121._8_4_ + 2.0) * 0.125;
      auVar55._12_4_ = (auVar121._12_4_ + 3.0) * 0.125;
      auVar55._16_4_ = (auVar121._16_4_ + 4.0) * 0.125;
      auVar55._20_4_ = (auVar121._20_4_ + 5.0) * 0.125;
      auVar55._24_4_ = (auVar121._24_4_ + 6.0) * 0.125;
      auVar55._28_4_ = auVar121._28_4_ + 7.0;
      auVar99 = vfmadd213ps_fma(auVar55,auVar175,local_a80);
      local_4e0 = ZEXT1632(auVar99);
      auVar121 = vmaxps_avx(auVar127,ZEXT832(0) << 0x20);
      auVar56._4_4_ = (auVar121._4_4_ + 1.0) * 0.125;
      auVar56._0_4_ = (auVar121._0_4_ + 0.0) * 0.125;
      auVar56._8_4_ = (auVar121._8_4_ + 2.0) * 0.125;
      auVar56._12_4_ = (auVar121._12_4_ + 3.0) * 0.125;
      auVar56._16_4_ = (auVar121._16_4_ + 4.0) * 0.125;
      auVar56._20_4_ = (auVar121._20_4_ + 5.0) * 0.125;
      auVar56._24_4_ = (auVar121._24_4_ + 6.0) * 0.125;
      auVar56._28_4_ = auVar121._28_4_ + 7.0;
      auVar99 = vfmadd213ps_fma(auVar56,auVar175,local_a80);
      local_500 = ZEXT1632(auVar99);
      auVar57._4_4_ = auVar122._4_4_ * auVar122._4_4_;
      auVar57._0_4_ = auVar122._0_4_ * auVar122._0_4_;
      auVar57._8_4_ = auVar122._8_4_ * auVar122._8_4_;
      auVar57._12_4_ = auVar122._12_4_ * auVar122._12_4_;
      auVar57._16_4_ = auVar122._16_4_ * auVar122._16_4_;
      auVar57._20_4_ = auVar122._20_4_ * auVar122._20_4_;
      auVar57._24_4_ = auVar122._24_4_ * auVar122._24_4_;
      auVar57._28_4_ = auVar122._28_4_;
      auVar121 = vsubps_avx(local_a20,auVar57);
      auVar58._4_4_ = auVar121._4_4_ * (float)local_aa0._4_4_;
      auVar58._0_4_ = auVar121._0_4_ * (float)local_aa0._0_4_;
      auVar58._8_4_ = auVar121._8_4_ * fStack_a98;
      auVar58._12_4_ = auVar121._12_4_ * fStack_a94;
      auVar58._16_4_ = auVar121._16_4_ * fStack_a90;
      auVar58._20_4_ = auVar121._20_4_ * fStack_a8c;
      auVar58._24_4_ = auVar121._24_4_ * fStack_a88;
      auVar58._28_4_ = auVar122._28_4_;
      auVar122 = vsubps_avx(auVar142,auVar58);
      uVar22 = vcmpps_avx512vl(auVar122,ZEXT832(0) << 0x20,5);
      bVar87 = (byte)uVar22;
      auVar283 = ZEXT3264(local_b20);
      auVar284 = ZEXT3264(local_b40);
      if (bVar87 == 0) {
        bVar87 = 0;
        auVar112 = ZEXT832(0) << 0x20;
        auVar184 = ZEXT864(0) << 0x20;
        auVar122 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar127 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar274 = ZEXT864(0) << 0x20;
        auVar154._8_4_ = 0x7f800000;
        auVar154._0_8_ = 0x7f8000007f800000;
        auVar154._12_4_ = 0x7f800000;
        auVar154._16_4_ = 0x7f800000;
        auVar154._20_4_ = 0x7f800000;
        auVar154._24_4_ = 0x7f800000;
        auVar154._28_4_ = 0x7f800000;
        auVar155._8_4_ = 0xff800000;
        auVar155._0_8_ = 0xff800000ff800000;
        auVar155._12_4_ = 0xff800000;
        auVar155._16_4_ = 0xff800000;
        auVar155._20_4_ = 0xff800000;
        auVar155._24_4_ = 0xff800000;
        auVar155._28_4_ = 0xff800000;
      }
      else {
        uVar94 = vcmpps_avx512vl(auVar122,auVar136,5);
        auVar122 = vsqrtps_avx(auVar122);
        auVar110 = vfnmadd213ps_avx512vl(auVar145,local_840,auVar148);
        auVar128 = vfmadd132ps_avx512vl(auVar110,local_840,local_840);
        auVar110 = vsubps_avx(local_ac0,auVar122);
        auVar129 = vmulps_avx512vl(auVar110,auVar128);
        auVar122 = vsubps_avx512vl(auVar122,auVar141);
        auVar128 = vmulps_avx512vl(auVar122,auVar128);
        auVar122 = vfmadd213ps_avx512vl(auVar144,auVar129,auVar134);
        auVar59._4_4_ = auVar130._4_4_ * auVar122._4_4_;
        auVar59._0_4_ = auVar130._0_4_ * auVar122._0_4_;
        auVar59._8_4_ = auVar130._8_4_ * auVar122._8_4_;
        auVar59._12_4_ = auVar130._12_4_ * auVar122._12_4_;
        auVar59._16_4_ = auVar130._16_4_ * auVar122._16_4_;
        auVar59._20_4_ = auVar130._20_4_ * auVar122._20_4_;
        auVar59._24_4_ = auVar130._24_4_ * auVar122._24_4_;
        auVar59._28_4_ = auVar127._28_4_;
        auVar122 = vmulps_avx512vl(local_7e0,auVar129);
        auVar110 = vmulps_avx512vl(local_800,auVar129);
        auVar131 = vmulps_avx512vl(local_820,auVar129);
        auVar127 = vfmadd213ps_avx512vl(auVar112,auVar59,auVar111);
        auVar122 = vsubps_avx512vl(auVar122,auVar127);
        auVar127 = vfmadd213ps_avx512vl(auVar123,auVar59,auVar125);
        auVar127 = vsubps_avx512vl(auVar110,auVar127);
        auVar99 = vfmadd213ps_fma(auVar59,auVar124,auVar126);
        auVar110 = vsubps_avx(auVar131,ZEXT1632(auVar99));
        auVar274 = ZEXT3264(auVar110);
        auVar110 = vfmadd213ps_avx512vl(auVar144,auVar128,auVar134);
        auVar130 = vmulps_avx512vl(auVar130,auVar110);
        auVar110 = vmulps_avx512vl(local_7e0,auVar128);
        auVar131 = vmulps_avx512vl(local_800,auVar128);
        auVar132 = vmulps_avx512vl(local_820,auVar128);
        auVar99 = vfmadd213ps_fma(auVar112,auVar130,auVar111);
        auVar110 = vsubps_avx(auVar110,ZEXT1632(auVar99));
        auVar99 = vfmadd213ps_fma(auVar123,auVar130,auVar125);
        auVar112 = vsubps_avx512vl(auVar131,ZEXT1632(auVar99));
        auVar99 = vfmadd213ps_fma(auVar124,auVar130,auVar126);
        auVar123 = vsubps_avx512vl(auVar132,ZEXT1632(auVar99));
        auVar184 = ZEXT3264(auVar123);
        auVar176._8_4_ = 0x7f800000;
        auVar176._0_8_ = 0x7f8000007f800000;
        auVar176._12_4_ = 0x7f800000;
        auVar176._16_4_ = 0x7f800000;
        auVar176._20_4_ = 0x7f800000;
        auVar176._24_4_ = 0x7f800000;
        auVar176._28_4_ = 0x7f800000;
        auVar123 = vblendmps_avx512vl(auVar176,auVar129);
        bVar6 = (bool)((byte)uVar94 & 1);
        auVar154._0_4_ = (uint)bVar6 * auVar123._0_4_ | (uint)!bVar6 * auVar111._0_4_;
        bVar6 = (bool)((byte)(uVar94 >> 1) & 1);
        auVar154._4_4_ = (uint)bVar6 * auVar123._4_4_ | (uint)!bVar6 * auVar111._4_4_;
        bVar6 = (bool)((byte)(uVar94 >> 2) & 1);
        auVar154._8_4_ = (uint)bVar6 * auVar123._8_4_ | (uint)!bVar6 * auVar111._8_4_;
        bVar6 = (bool)((byte)(uVar94 >> 3) & 1);
        auVar154._12_4_ = (uint)bVar6 * auVar123._12_4_ | (uint)!bVar6 * auVar111._12_4_;
        bVar6 = (bool)((byte)(uVar94 >> 4) & 1);
        auVar154._16_4_ = (uint)bVar6 * auVar123._16_4_ | (uint)!bVar6 * auVar111._16_4_;
        bVar6 = (bool)((byte)(uVar94 >> 5) & 1);
        auVar154._20_4_ = (uint)bVar6 * auVar123._20_4_ | (uint)!bVar6 * auVar111._20_4_;
        bVar6 = (bool)((byte)(uVar94 >> 6) & 1);
        auVar154._24_4_ = (uint)bVar6 * auVar123._24_4_ | (uint)!bVar6 * auVar111._24_4_;
        bVar6 = SUB81(uVar94 >> 7,0);
        auVar154._28_4_ = (uint)bVar6 * auVar123._28_4_ | (uint)!bVar6 * auVar111._28_4_;
        auVar177._8_4_ = 0xff800000;
        auVar177._0_8_ = 0xff800000ff800000;
        auVar177._12_4_ = 0xff800000;
        auVar177._16_4_ = 0xff800000;
        auVar177._20_4_ = 0xff800000;
        auVar177._24_4_ = 0xff800000;
        auVar177._28_4_ = 0xff800000;
        auVar123 = vblendmps_avx512vl(auVar177,auVar128);
        bVar6 = (bool)((byte)uVar94 & 1);
        auVar155._0_4_ = (uint)bVar6 * auVar123._0_4_ | (uint)!bVar6 * -0x800000;
        bVar6 = (bool)((byte)(uVar94 >> 1) & 1);
        auVar155._4_4_ = (uint)bVar6 * auVar123._4_4_ | (uint)!bVar6 * -0x800000;
        bVar6 = (bool)((byte)(uVar94 >> 2) & 1);
        auVar155._8_4_ = (uint)bVar6 * auVar123._8_4_ | (uint)!bVar6 * -0x800000;
        bVar6 = (bool)((byte)(uVar94 >> 3) & 1);
        auVar155._12_4_ = (uint)bVar6 * auVar123._12_4_ | (uint)!bVar6 * -0x800000;
        bVar6 = (bool)((byte)(uVar94 >> 4) & 1);
        auVar155._16_4_ = (uint)bVar6 * auVar123._16_4_ | (uint)!bVar6 * -0x800000;
        bVar6 = (bool)((byte)(uVar94 >> 5) & 1);
        auVar155._20_4_ = (uint)bVar6 * auVar123._20_4_ | (uint)!bVar6 * -0x800000;
        bVar6 = (bool)((byte)(uVar94 >> 6) & 1);
        auVar155._24_4_ = (uint)bVar6 * auVar123._24_4_ | (uint)!bVar6 * -0x800000;
        bVar6 = SUB81(uVar94 >> 7,0);
        auVar155._28_4_ = (uint)bVar6 * auVar123._28_4_ | (uint)!bVar6 * -0x800000;
        auVar34._8_4_ = 0x36000000;
        auVar34._0_8_ = 0x3600000036000000;
        auVar34._12_4_ = 0x36000000;
        auVar34._16_4_ = 0x36000000;
        auVar34._20_4_ = 0x36000000;
        auVar34._24_4_ = 0x36000000;
        auVar34._28_4_ = 0x36000000;
        auVar123 = vmulps_avx512vl(local_880,auVar34);
        uVar86 = vcmpps_avx512vl(auVar123,local_8a0,0xe);
        uVar94 = uVar94 & uVar86;
        bVar88 = (byte)uVar94;
        if (bVar88 != 0) {
          uVar86 = vcmpps_avx512vl(auVar121,ZEXT1632(ZEXT816(0) << 0x40),2);
          auVar262._8_4_ = 0x7f800000;
          auVar262._0_8_ = 0x7f8000007f800000;
          auVar262._12_4_ = 0x7f800000;
          auVar262._16_4_ = 0x7f800000;
          auVar262._20_4_ = 0x7f800000;
          auVar262._24_4_ = 0x7f800000;
          auVar262._28_4_ = 0x7f800000;
          auVar267._8_4_ = 0xff800000;
          auVar267._0_8_ = 0xff800000ff800000;
          auVar267._12_4_ = 0xff800000;
          auVar267._16_4_ = 0xff800000;
          auVar267._20_4_ = 0xff800000;
          auVar267._24_4_ = 0xff800000;
          auVar267._28_4_ = 0xff800000;
          auVar121 = vblendmps_avx512vl(auVar262,auVar267);
          bVar92 = (byte)uVar86;
          uVar95 = (uint)(bVar92 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar92 & 1) * auVar123._0_4_;
          bVar6 = (bool)((byte)(uVar86 >> 1) & 1);
          uVar162 = (uint)bVar6 * auVar121._4_4_ | (uint)!bVar6 * auVar123._4_4_;
          bVar6 = (bool)((byte)(uVar86 >> 2) & 1);
          uVar163 = (uint)bVar6 * auVar121._8_4_ | (uint)!bVar6 * auVar123._8_4_;
          bVar6 = (bool)((byte)(uVar86 >> 3) & 1);
          uVar164 = (uint)bVar6 * auVar121._12_4_ | (uint)!bVar6 * auVar123._12_4_;
          bVar6 = (bool)((byte)(uVar86 >> 4) & 1);
          uVar165 = (uint)bVar6 * auVar121._16_4_ | (uint)!bVar6 * auVar123._16_4_;
          bVar6 = (bool)((byte)(uVar86 >> 5) & 1);
          uVar166 = (uint)bVar6 * auVar121._20_4_ | (uint)!bVar6 * auVar123._20_4_;
          bVar6 = (bool)((byte)(uVar86 >> 6) & 1);
          uVar167 = (uint)bVar6 * auVar121._24_4_ | (uint)!bVar6 * auVar123._24_4_;
          bVar6 = SUB81(uVar86 >> 7,0);
          uVar168 = (uint)bVar6 * auVar121._28_4_ | (uint)!bVar6 * auVar123._28_4_;
          auVar154._0_4_ = (bVar88 & 1) * uVar95 | !(bool)(bVar88 & 1) * auVar154._0_4_;
          bVar6 = (bool)((byte)(uVar94 >> 1) & 1);
          auVar154._4_4_ = bVar6 * uVar162 | !bVar6 * auVar154._4_4_;
          bVar6 = (bool)((byte)(uVar94 >> 2) & 1);
          auVar154._8_4_ = bVar6 * uVar163 | !bVar6 * auVar154._8_4_;
          bVar6 = (bool)((byte)(uVar94 >> 3) & 1);
          auVar154._12_4_ = bVar6 * uVar164 | !bVar6 * auVar154._12_4_;
          bVar6 = (bool)((byte)(uVar94 >> 4) & 1);
          auVar154._16_4_ = bVar6 * uVar165 | !bVar6 * auVar154._16_4_;
          bVar6 = (bool)((byte)(uVar94 >> 5) & 1);
          auVar154._20_4_ = bVar6 * uVar166 | !bVar6 * auVar154._20_4_;
          bVar6 = (bool)((byte)(uVar94 >> 6) & 1);
          auVar154._24_4_ = bVar6 * uVar167 | !bVar6 * auVar154._24_4_;
          bVar6 = SUB81(uVar94 >> 7,0);
          auVar154._28_4_ = bVar6 * uVar168 | !bVar6 * auVar154._28_4_;
          auVar121 = vblendmps_avx512vl(auVar267,auVar262);
          bVar6 = (bool)((byte)(uVar86 >> 1) & 1);
          bVar8 = (bool)((byte)(uVar86 >> 2) & 1);
          bVar9 = (bool)((byte)(uVar86 >> 3) & 1);
          bVar10 = (bool)((byte)(uVar86 >> 4) & 1);
          bVar11 = (bool)((byte)(uVar86 >> 5) & 1);
          bVar12 = (bool)((byte)(uVar86 >> 6) & 1);
          bVar13 = SUB81(uVar86 >> 7,0);
          auVar155._0_4_ =
               (uint)(bVar88 & 1) *
               ((uint)(bVar92 & 1) * auVar121._0_4_ | !(bool)(bVar92 & 1) * uVar95) |
               !(bool)(bVar88 & 1) * auVar155._0_4_;
          bVar7 = (bool)((byte)(uVar94 >> 1) & 1);
          auVar155._4_4_ =
               (uint)bVar7 * ((uint)bVar6 * auVar121._4_4_ | !bVar6 * uVar162) |
               !bVar7 * auVar155._4_4_;
          bVar6 = (bool)((byte)(uVar94 >> 2) & 1);
          auVar155._8_4_ =
               (uint)bVar6 * ((uint)bVar8 * auVar121._8_4_ | !bVar8 * uVar163) |
               !bVar6 * auVar155._8_4_;
          bVar6 = (bool)((byte)(uVar94 >> 3) & 1);
          auVar155._12_4_ =
               (uint)bVar6 * ((uint)bVar9 * auVar121._12_4_ | !bVar9 * uVar164) |
               !bVar6 * auVar155._12_4_;
          bVar6 = (bool)((byte)(uVar94 >> 4) & 1);
          auVar155._16_4_ =
               (uint)bVar6 * ((uint)bVar10 * auVar121._16_4_ | !bVar10 * uVar165) |
               !bVar6 * auVar155._16_4_;
          bVar6 = (bool)((byte)(uVar94 >> 5) & 1);
          auVar155._20_4_ =
               (uint)bVar6 * ((uint)bVar11 * auVar121._20_4_ | !bVar11 * uVar166) |
               !bVar6 * auVar155._20_4_;
          bVar6 = (bool)((byte)(uVar94 >> 6) & 1);
          auVar155._24_4_ =
               (uint)bVar6 * ((uint)bVar12 * auVar121._24_4_ | !bVar12 * uVar167) |
               !bVar6 * auVar155._24_4_;
          bVar6 = SUB81(uVar94 >> 7,0);
          auVar155._28_4_ =
               (uint)bVar6 * ((uint)bVar13 * auVar121._28_4_ | !bVar13 * uVar168) |
               !bVar6 * auVar155._28_4_;
          bVar87 = (~bVar88 | bVar92) & bVar87;
        }
      }
      auVar280 = ZEXT3264(local_820);
      auVar257._0_4_ = local_820._0_4_ * auVar184._0_4_;
      auVar257._4_4_ = local_820._4_4_ * auVar184._4_4_;
      auVar257._8_4_ = local_820._8_4_ * auVar184._8_4_;
      auVar257._12_4_ = local_820._12_4_ * auVar184._12_4_;
      auVar257._16_4_ = local_820._16_4_ * auVar184._16_4_;
      auVar257._20_4_ = local_820._20_4_ * auVar184._20_4_;
      auVar257._28_36_ = auVar184._28_36_;
      auVar257._24_4_ = local_820._24_4_ * auVar184._24_4_;
      auVar268 = ZEXT3264(local_800);
      auVar99 = vfmadd231ps_fma(auVar257._0_32_,local_800,auVar112);
      auVar263 = ZEXT3264(local_7e0);
      auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),local_7e0,auVar110);
      auVar276 = ZEXT3264(_local_8c0);
      _local_540 = _local_8c0;
      local_520 = vminps_avx(local_6a0,auVar154);
      auVar259._8_4_ = 0x7fffffff;
      auVar259._0_8_ = 0x7fffffff7fffffff;
      auVar259._12_4_ = 0x7fffffff;
      auVar259._16_4_ = 0x7fffffff;
      auVar259._20_4_ = 0x7fffffff;
      auVar259._24_4_ = 0x7fffffff;
      auVar259._28_4_ = 0x7fffffff;
      auVar121 = vandps_avx(ZEXT1632(auVar99),auVar259);
      local_6c0 = vmaxps_avx(_local_8c0,auVar155);
      auVar257 = ZEXT3264(local_6c0);
      auVar179._8_4_ = 0x3e99999a;
      auVar179._0_8_ = 0x3e99999a3e99999a;
      auVar179._12_4_ = 0x3e99999a;
      auVar179._16_4_ = 0x3e99999a;
      auVar179._20_4_ = 0x3e99999a;
      auVar179._24_4_ = 0x3e99999a;
      auVar179._28_4_ = 0x3e99999a;
      uVar22 = vcmpps_avx512vl(auVar121,auVar179,1);
      local_740._0_2_ = (short)uVar22;
      uVar22 = vcmpps_avx512vl(_local_8c0,local_520,2);
      bVar88 = (byte)uVar22 & bVar82;
      uVar23 = vcmpps_avx512vl(local_6c0,local_6a0,2);
      auVar281 = ZEXT3264(local_ae0);
      auVar282 = ZEXT3264(local_b00);
      if ((bVar82 & ((byte)uVar23 | (byte)uVar22)) == 0) {
        auVar121 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar184 = ZEXT3264(auVar121);
      }
      else {
        auVar60._4_4_ = local_820._4_4_ * auVar274._4_4_;
        auVar60._0_4_ = local_820._0_4_ * auVar274._0_4_;
        auVar60._8_4_ = local_820._8_4_ * auVar274._8_4_;
        auVar60._12_4_ = local_820._12_4_ * auVar274._12_4_;
        auVar60._16_4_ = local_820._16_4_ * auVar274._16_4_;
        auVar60._20_4_ = local_820._20_4_ * auVar274._20_4_;
        auVar60._24_4_ = local_820._24_4_ * auVar274._24_4_;
        auVar60._28_4_ = 0x3e99999a;
        auVar99 = vfmadd213ps_fma(auVar127,local_800,auVar60);
        auVar99 = vfmadd213ps_fma(auVar122,local_7e0,ZEXT1632(auVar99));
        auVar121 = vandps_avx(ZEXT1632(auVar99),auVar259);
        uVar22 = vcmpps_avx512vl(auVar121,auVar179,1);
        bVar92 = (byte)uVar22 | ~bVar87;
        auVar180._8_4_ = 2;
        auVar180._0_8_ = 0x200000002;
        auVar180._12_4_ = 2;
        auVar180._16_4_ = 2;
        auVar180._20_4_ = 2;
        auVar180._24_4_ = 2;
        auVar180._28_4_ = 2;
        auVar35._8_4_ = 3;
        auVar35._0_8_ = 0x300000003;
        auVar35._12_4_ = 3;
        auVar35._16_4_ = 3;
        auVar35._20_4_ = 3;
        auVar35._24_4_ = 3;
        auVar35._28_4_ = 3;
        auVar121 = vpblendmd_avx512vl(auVar180,auVar35);
        local_660._0_4_ = (uint)(bVar92 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar92 & 1) * 2;
        bVar6 = (bool)(bVar92 >> 1 & 1);
        local_660._4_4_ = (uint)bVar6 * auVar121._4_4_ | (uint)!bVar6 * 2;
        bVar6 = (bool)(bVar92 >> 2 & 1);
        local_660._8_4_ = (uint)bVar6 * auVar121._8_4_ | (uint)!bVar6 * 2;
        bVar6 = (bool)(bVar92 >> 3 & 1);
        local_660._12_4_ = (uint)bVar6 * auVar121._12_4_ | (uint)!bVar6 * 2;
        bVar6 = (bool)(bVar92 >> 4 & 1);
        local_660._16_4_ = (uint)bVar6 * auVar121._16_4_ | (uint)!bVar6 * 2;
        bVar6 = (bool)(bVar92 >> 5 & 1);
        local_660._20_4_ = (uint)bVar6 * auVar121._20_4_ | (uint)!bVar6 * 2;
        bVar6 = (bool)(bVar92 >> 6 & 1);
        local_660._24_4_ = (uint)bVar6 * auVar121._24_4_ | (uint)!bVar6 * 2;
        local_660._28_4_ = (uint)(bVar92 >> 7) * auVar121._28_4_ | (uint)!(bool)(bVar92 >> 7) * 2;
        local_6e0 = vpbroadcastd_avx512vl();
        uVar22 = vpcmpd_avx512vl(local_6e0,local_660,5);
        bVar92 = (byte)uVar22 & bVar88;
        if (bVar92 == 0) {
          auVar182._4_4_ = uVar96;
          auVar182._0_4_ = uVar96;
          auVar182._8_4_ = uVar96;
          auVar182._12_4_ = uVar96;
          auVar182._16_4_ = uVar96;
          auVar182._20_4_ = uVar96;
          auVar182._24_4_ = uVar96;
          auVar182._28_4_ = uVar96;
        }
        else {
          local_680 = local_6c0;
          auVar104 = vminps_avx(local_960._0_16_,local_9a0._0_16_);
          auVar99 = vmaxps_avx(local_960._0_16_,local_9a0._0_16_);
          auVar97 = vminps_avx(local_980._0_16_,local_9c0._0_16_);
          auVar109 = vminps_avx(auVar104,auVar97);
          auVar104 = vmaxps_avx(local_980._0_16_,local_9c0._0_16_);
          auVar97 = vmaxps_avx(auVar99,auVar104);
          auVar212._8_4_ = 0x7fffffff;
          auVar212._0_8_ = 0x7fffffff7fffffff;
          auVar212._12_4_ = 0x7fffffff;
          auVar99 = vandps_avx(auVar109,auVar212);
          auVar104 = vandps_avx(auVar97,auVar212);
          auVar99 = vmaxps_avx(auVar99,auVar104);
          auVar104 = vmovshdup_avx(auVar99);
          auVar104 = vmaxss_avx(auVar104,auVar99);
          auVar99 = vshufpd_avx(auVar99,auVar99,1);
          auVar99 = vmaxss_avx(auVar99,auVar104);
          local_a60._0_4_ = auVar99._0_4_ * 1.9073486e-06;
          local_930 = vshufps_avx(auVar97,auVar97,0xff);
          local_720 = (float)local_8c0._0_4_ + (float)local_9e0._0_4_;
          fStack_71c = (float)local_8c0._4_4_ + (float)local_9e0._4_4_;
          fStack_718 = fStack_8b8 + fStack_9d8;
          fStack_714 = fStack_8b4 + fStack_9d4;
          fStack_710 = fStack_8b0 + fStack_9d0;
          fStack_70c = fStack_8ac + fStack_9cc;
          fStack_708 = fStack_8a8 + fStack_9c8;
          fStack_704 = fStack_8a4 + fStack_9c4;
          do {
            auVar181._8_4_ = 0x7f800000;
            auVar181._0_8_ = 0x7f8000007f800000;
            auVar181._12_4_ = 0x7f800000;
            auVar181._16_4_ = 0x7f800000;
            auVar181._20_4_ = 0x7f800000;
            auVar181._24_4_ = 0x7f800000;
            auVar181._28_4_ = 0x7f800000;
            auVar121 = vblendmps_avx512vl(auVar181,_local_8c0);
            auVar157._0_4_ =
                 (uint)(bVar92 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar92 & 1) * 0x7f800000;
            bVar6 = (bool)(bVar92 >> 1 & 1);
            auVar157._4_4_ = (uint)bVar6 * auVar121._4_4_ | (uint)!bVar6 * 0x7f800000;
            bVar6 = (bool)(bVar92 >> 2 & 1);
            auVar157._8_4_ = (uint)bVar6 * auVar121._8_4_ | (uint)!bVar6 * 0x7f800000;
            bVar6 = (bool)(bVar92 >> 3 & 1);
            auVar157._12_4_ = (uint)bVar6 * auVar121._12_4_ | (uint)!bVar6 * 0x7f800000;
            bVar6 = (bool)(bVar92 >> 4 & 1);
            auVar157._16_4_ = (uint)bVar6 * auVar121._16_4_ | (uint)!bVar6 * 0x7f800000;
            bVar6 = (bool)(bVar92 >> 5 & 1);
            auVar157._20_4_ = (uint)bVar6 * auVar121._20_4_ | (uint)!bVar6 * 0x7f800000;
            auVar157._24_4_ =
                 (uint)(bVar92 >> 6) * auVar121._24_4_ | (uint)!(bool)(bVar92 >> 6) * 0x7f800000;
            auVar157._28_4_ = 0x7f800000;
            auVar121 = vshufps_avx(auVar157,auVar157,0xb1);
            auVar121 = vminps_avx(auVar157,auVar121);
            auVar122 = vshufpd_avx(auVar121,auVar121,5);
            auVar121 = vminps_avx(auVar121,auVar122);
            auVar122 = vpermpd_avx2(auVar121,0x4e);
            auVar121 = vminps_avx(auVar121,auVar122);
            uVar22 = vcmpps_avx512vl(auVar157,auVar121,0);
            bVar83 = (byte)uVar22 & bVar92;
            bVar84 = bVar92;
            if (bVar83 != 0) {
              bVar84 = bVar83;
            }
            iVar25 = 0;
            for (uVar96 = (uint)bVar84; (uVar96 & 1) == 0; uVar96 = uVar96 >> 1 | 0x80000000) {
              iVar25 = iVar25 + 1;
            }
            uVar96 = *(uint *)(local_540 + (uint)(iVar25 << 2));
            fVar264 = auVar21._0_4_;
            auVar99 = ZEXT416(*(uint *)(local_4e0 + (uint)(iVar25 << 2)));
            if ((float)local_a00._0_4_ < 0.0) {
              local_a80._0_16_ = ZEXT416(*(uint *)(local_4e0 + (uint)(iVar25 << 2)));
              fVar264 = sqrtf((float)local_a00._0_4_);
              auVar99 = local_a80._0_16_;
            }
            auVar99 = vinsertps_avx(ZEXT416(uVar96),auVar99,0x10);
            auVar273 = ZEXT1664(auVar99);
            lVar93 = 5;
            do {
              uVar191 = auVar273._0_4_;
              auVar171._4_4_ = uVar191;
              auVar171._0_4_ = uVar191;
              auVar171._8_4_ = uVar191;
              auVar171._12_4_ = uVar191;
              auVar99 = vfmadd132ps_fma(auVar171,ZEXT816(0) << 0x40,local_9f0);
              auVar104 = vmovshdup_avx(auVar273._0_16_);
              fVar245 = auVar104._0_4_;
              fVar244 = 1.0 - fVar245;
              fVar271 = fVar244 * fVar244 * fVar244;
              fVar269 = fVar245 * fVar245;
              fVar246 = fVar269 * fVar245;
              auVar97 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar271),
                                        ZEXT416((uint)fVar246));
              fVar270 = fVar245 * fVar244;
              local_a80._0_16_ = ZEXT416((uint)fVar244);
              auVar105 = vfmadd231ss_fma(ZEXT416((uint)(fVar270 * fVar245 * 6.0)),
                                         ZEXT416((uint)(fVar270 * fVar244)),
                                         SUB6416(ZEXT464(0x41400000),0));
              auVar109 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar246),
                                         ZEXT416((uint)fVar271));
              auVar98 = vfmadd231ss_fma(ZEXT416((uint)(fVar270 * fVar244 * 6.0)),
                                        SUB6416(ZEXT464(0x41400000),0),
                                        ZEXT416((uint)(fVar270 * fVar245)));
              fVar271 = fVar271 * 0.16666667;
              fVar244 = (auVar97._0_4_ + auVar105._0_4_) * 0.16666667;
              fVar245 = (auVar109._0_4_ + auVar98._0_4_) * 0.16666667;
              fVar246 = fVar246 * 0.16666667;
              auVar213._0_4_ = fVar246 * (float)local_9c0._0_4_;
              auVar213._4_4_ = fVar246 * (float)local_9c0._4_4_;
              auVar213._8_4_ = fVar246 * fStack_9b8;
              auVar213._12_4_ = fVar246 * fStack_9b4;
              auVar248._4_4_ = fVar245;
              auVar248._0_4_ = fVar245;
              auVar248._8_4_ = fVar245;
              auVar248._12_4_ = fVar245;
              auVar97 = vfmadd132ps_fma(auVar248,auVar213,local_980._0_16_);
              auVar214._4_4_ = fVar244;
              auVar214._0_4_ = fVar244;
              auVar214._8_4_ = fVar244;
              auVar214._12_4_ = fVar244;
              auVar97 = vfmadd132ps_fma(auVar214,auVar97,local_9a0._0_16_);
              auVar193._4_4_ = fVar271;
              auVar193._0_4_ = fVar271;
              auVar193._8_4_ = fVar271;
              auVar193._12_4_ = fVar271;
              auVar97 = vfmadd132ps_fma(auVar193,auVar97,local_960._0_16_);
              local_840._0_16_ = auVar97;
              auVar97 = vsubps_avx(auVar99,auVar97);
              auVar99 = vdpps_avx(auVar97,auVar97,0x7f);
              local_a20._0_16_ = auVar99;
              local_7c0 = auVar273;
              if (auVar99._0_4_ < 0.0) {
                local_aa0._0_4_ = fVar269;
                local_ac0._0_4_ = fVar270;
                auVar184._0_4_ = sqrtf(auVar99._0_4_);
                auVar184._4_60_ = extraout_var;
                auVar99 = auVar184._0_16_;
                fVar270 = (float)local_ac0._0_4_;
              }
              else {
                auVar99 = vsqrtss_avx(auVar99,auVar99);
                local_aa0._0_4_ = fVar269;
              }
              local_860._4_4_ = local_a80._0_4_;
              local_860._0_4_ = local_860._4_4_;
              fStack_858 = (float)local_860._4_4_;
              fStack_854 = (float)local_860._4_4_;
              auVar105 = vfnmsub213ss_fma(auVar104,auVar104,ZEXT416((uint)(fVar270 * 4.0)));
              auVar109 = vfmadd231ss_fma(ZEXT416((uint)(fVar270 * 4.0)),local_a80._0_16_,
                                         local_a80._0_16_);
              fVar269 = (float)local_860._4_4_ * -(float)local_860._4_4_ * 0.5;
              fVar270 = auVar105._0_4_ * 0.5;
              fVar271 = auVar109._0_4_ * 0.5;
              local_aa0._0_4_ = (float)local_aa0._0_4_ * 0.5;
              auVar231._0_4_ = (float)local_aa0._0_4_ * (float)local_9c0._0_4_;
              auVar231._4_4_ = (float)local_aa0._0_4_ * (float)local_9c0._4_4_;
              auVar231._8_4_ = (float)local_aa0._0_4_ * fStack_9b8;
              auVar231._12_4_ = (float)local_aa0._0_4_ * fStack_9b4;
              auVar194._4_4_ = fVar271;
              auVar194._0_4_ = fVar271;
              auVar194._8_4_ = fVar271;
              auVar194._12_4_ = fVar271;
              auVar109 = vfmadd132ps_fma(auVar194,auVar231,local_980._0_16_);
              auVar215._4_4_ = fVar270;
              auVar215._0_4_ = fVar270;
              auVar215._8_4_ = fVar270;
              auVar215._12_4_ = fVar270;
              auVar109 = vfmadd132ps_fma(auVar215,auVar109,local_9a0._0_16_);
              auVar277._4_4_ = fVar269;
              auVar277._0_4_ = fVar269;
              auVar277._8_4_ = fVar269;
              auVar277._12_4_ = fVar269;
              _local_aa0 = vfmadd132ps_fma(auVar277,auVar109,local_960._0_16_);
              local_880._0_16_ = vdpps_avx(_local_aa0,_local_aa0,0x7f);
              auVar61._12_4_ = 0;
              auVar61._0_12_ = ZEXT812(0);
              fVar269 = local_880._0_4_;
              local_a50 = vrsqrt14ss_avx512f(auVar61 << 0x20,ZEXT416((uint)fVar269));
              fVar270 = local_a50._0_4_;
              local_8a0._0_16_ = vrcp14ss_avx512f(auVar61 << 0x20,ZEXT416((uint)fVar269));
              auVar109 = vfnmadd213ss_fma(local_8a0._0_16_,local_880._0_16_,ZEXT416(0x40000000));
              local_a40._0_4_ = auVar109._0_4_;
              local_ac0._0_4_ = auVar99._0_4_;
              if (fVar269 < -fVar269) {
                fVar271 = sqrtf(fVar269);
                auVar99 = ZEXT416((uint)local_ac0._0_4_);
                auVar109 = _local_aa0;
              }
              else {
                auVar109 = vsqrtss_avx(local_880._0_16_,local_880._0_16_);
                fVar271 = auVar109._0_4_;
                auVar109 = _local_aa0;
              }
              fVar244 = local_a50._0_4_;
              fVar269 = fVar270 * 1.5 + fVar269 * -0.5 * fVar244 * fVar244 * fVar244;
              local_a50._0_4_ = auVar109._0_4_ * fVar269;
              local_a50._4_4_ = auVar109._4_4_ * fVar269;
              local_a50._8_4_ = auVar109._8_4_ * fVar269;
              local_a50._12_4_ = auVar109._12_4_ * fVar269;
              auVar105 = vdpps_avx(auVar97,local_a50,0x7f);
              fVar245 = auVar99._0_4_;
              fVar270 = auVar105._0_4_;
              auVar172._0_4_ = fVar270 * fVar270;
              auVar172._4_4_ = auVar105._4_4_ * auVar105._4_4_;
              auVar172._8_4_ = auVar105._8_4_ * auVar105._8_4_;
              auVar172._12_4_ = auVar105._12_4_ * auVar105._12_4_;
              auVar98 = vsubps_avx(local_a20._0_16_,auVar172);
              fVar244 = auVar98._0_4_;
              auVar195._4_12_ = ZEXT812(0) << 0x20;
              auVar195._0_4_ = fVar244;
              auVar100 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar195);
              auVar101 = vmulss_avx512f(auVar100,ZEXT416(0x3fc00000));
              auVar102 = vmulss_avx512f(auVar98,ZEXT416(0xbf000000));
              if (fVar244 < 0.0) {
                local_8f0._0_4_ = fVar271;
                local_910._0_4_ = auVar101._0_4_;
                local_920._4_4_ = fVar269;
                local_920._0_4_ = fVar269;
                fStack_918 = fVar269;
                fStack_914 = fVar269;
                local_900 = auVar100;
                fVar244 = sqrtf(fVar244);
                auVar102 = ZEXT416(auVar102._0_4_);
                auVar101 = ZEXT416((uint)local_910._0_4_);
                auVar99 = ZEXT416((uint)local_ac0._0_4_);
                auVar100 = local_900;
                auVar109 = _local_aa0;
                fVar269 = (float)local_920._0_4_;
                fVar246 = (float)local_920._4_4_;
                fVar230 = fStack_918;
                fVar247 = fStack_914;
                fVar271 = (float)local_8f0._0_4_;
              }
              else {
                auVar98 = vsqrtss_avx(auVar98,auVar98);
                fVar244 = auVar98._0_4_;
                fVar246 = fVar269;
                fVar230 = fVar269;
                fVar247 = fVar269;
              }
              auVar280 = ZEXT1664(auVar109);
              auVar276 = ZEXT1664(local_a20._0_16_);
              auVar274 = ZEXT1664(auVar97);
              auVar281 = ZEXT3264(local_ae0);
              auVar282 = ZEXT3264(local_b00);
              auVar283 = ZEXT3264(local_b20);
              auVar284 = ZEXT3264(local_b40);
              auVar98 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_a80._0_16_,auVar104);
              auVar106 = vfmadd213ss_fma(auVar104,SUB6416(ZEXT464(0xc0000000),0),local_a80._0_16_);
              auVar108 = local_7c0._0_16_;
              auVar104 = vshufps_avx(auVar108,auVar108,0x55);
              auVar216._0_4_ = auVar104._0_4_ * (float)local_9c0._0_4_;
              auVar216._4_4_ = auVar104._4_4_ * (float)local_9c0._4_4_;
              auVar216._8_4_ = auVar104._8_4_ * fStack_9b8;
              auVar216._12_4_ = auVar104._12_4_ * fStack_9b4;
              auVar232._0_4_ = auVar106._0_4_;
              auVar232._4_4_ = auVar232._0_4_;
              auVar232._8_4_ = auVar232._0_4_;
              auVar232._12_4_ = auVar232._0_4_;
              auVar104 = vfmadd132ps_fma(auVar232,auVar216,local_980._0_16_);
              auVar196._0_4_ = auVar98._0_4_;
              auVar196._4_4_ = auVar196._0_4_;
              auVar196._8_4_ = auVar196._0_4_;
              auVar196._12_4_ = auVar196._0_4_;
              auVar104 = vfmadd132ps_fma(auVar196,auVar104,local_9a0._0_16_);
              auVar104 = vfmadd132ps_fma(_local_860,auVar104,local_960._0_16_);
              auVar197._0_4_ = auVar104._0_4_ * (float)local_880._0_4_;
              auVar197._4_4_ = auVar104._4_4_ * (float)local_880._0_4_;
              auVar197._8_4_ = auVar104._8_4_ * (float)local_880._0_4_;
              auVar197._12_4_ = auVar104._12_4_ * (float)local_880._0_4_;
              auVar104 = vdpps_avx(auVar109,auVar104,0x7f);
              fVar252 = auVar104._0_4_;
              auVar217._0_4_ = auVar109._0_4_ * fVar252;
              auVar217._4_4_ = auVar109._4_4_ * fVar252;
              auVar217._8_4_ = auVar109._8_4_ * fVar252;
              auVar217._12_4_ = auVar109._12_4_ * fVar252;
              auVar104 = vsubps_avx(auVar197,auVar217);
              fVar252 = (float)local_a40._0_4_ * (float)local_8a0._0_4_;
              auVar106 = vmaxss_avx(ZEXT416((uint)local_a60._0_4_),
                                    ZEXT416((uint)(local_7c0._0_4_ * fVar264 * 1.9073486e-06)));
              auVar26._8_4_ = 0x80000000;
              auVar26._0_8_ = 0x8000000080000000;
              auVar26._12_4_ = 0x80000000;
              auVar103 = vxorps_avx512vl(auVar109,auVar26);
              auVar198._0_4_ = fVar269 * auVar104._0_4_ * fVar252;
              auVar198._4_4_ = fVar246 * auVar104._4_4_ * fVar252;
              auVar198._8_4_ = fVar230 * auVar104._8_4_ * fVar252;
              auVar198._12_4_ = fVar247 * auVar104._12_4_ * fVar252;
              auVar104 = vdpps_avx(auVar103,local_a50,0x7f);
              auVar98 = vfmadd213ss_fma(auVar99,ZEXT416((uint)local_a60._0_4_),auVar106);
              auVar99 = vdpps_avx(auVar97,auVar198,0x7f);
              auVar107 = vfmadd213ss_fma(ZEXT416((uint)(fVar245 + 1.0)),
                                         ZEXT416((uint)((float)local_a60._0_4_ / fVar271)),auVar98);
              fVar269 = auVar104._0_4_ + auVar99._0_4_;
              auVar99 = vdpps_avx(local_9f0,local_a50,0x7f);
              auVar104 = vdpps_avx(auVar97,auVar103,0x7f);
              auVar98 = vmulss_avx512f(auVar102,auVar100);
              auVar102 = vaddss_avx512f(auVar101,ZEXT416((uint)(auVar98._0_4_ *
                                                               auVar100._0_4_ * auVar100._0_4_)));
              auVar98 = vdpps_avx(auVar97,local_9f0,0x7f);
              auVar101 = vfnmadd231ss_fma(auVar104,auVar105,ZEXT416((uint)fVar269));
              auVar98 = vfnmadd231ss_fma(auVar98,auVar105,auVar99);
              auVar104 = vpermilps_avx(local_840._0_16_,0xff);
              fVar244 = fVar244 - auVar104._0_4_;
              auVar100 = vshufps_avx(auVar109,auVar109,0xff);
              auVar104 = vfmsub213ss_fma(auVar101,auVar102,auVar100);
              auVar265._8_4_ = 0x80000000;
              auVar265._0_8_ = 0x8000000080000000;
              auVar265._12_4_ = 0x80000000;
              auVar268 = ZEXT1664(auVar265);
              auVar260._0_8_ = auVar104._0_8_ ^ 0x8000000080000000;
              auVar260._8_4_ = auVar104._8_4_ ^ 0x80000000;
              auVar260._12_4_ = auVar104._12_4_ ^ 0x80000000;
              auVar263 = ZEXT1664(auVar260);
              auVar98 = ZEXT416((uint)(auVar98._0_4_ * auVar102._0_4_));
              auVar101 = vfmsub231ss_fma(ZEXT416((uint)(auVar99._0_4_ * auVar104._0_4_)),
                                         ZEXT416((uint)fVar269),auVar98);
              auVar104 = vinsertps_avx(auVar260,auVar98,0x1c);
              auVar255._0_8_ = auVar99._0_8_ ^ 0x8000000080000000;
              auVar255._8_4_ = auVar99._8_4_ ^ 0x80000000;
              auVar255._12_4_ = auVar99._12_4_ ^ 0x80000000;
              auVar98 = vinsertps_avx(ZEXT416((uint)fVar269),auVar255,0x10);
              auVar233._0_4_ = auVar101._0_4_;
              auVar233._4_4_ = auVar233._0_4_;
              auVar233._8_4_ = auVar233._0_4_;
              auVar233._12_4_ = auVar233._0_4_;
              auVar99 = vdivps_avx(auVar104,auVar233);
              auVar104 = vdivps_avx(auVar98,auVar233);
              auVar234._0_4_ = fVar270 * auVar99._0_4_ + fVar244 * auVar104._0_4_;
              auVar234._4_4_ = fVar270 * auVar99._4_4_ + fVar244 * auVar104._4_4_;
              auVar234._8_4_ = fVar270 * auVar99._8_4_ + fVar244 * auVar104._8_4_;
              auVar234._12_4_ = fVar270 * auVar99._12_4_ + fVar244 * auVar104._12_4_;
              auVar99 = vsubps_avx(auVar108,auVar234);
              auVar273 = ZEXT1664(auVar99);
              auVar27._8_4_ = 0x7fffffff;
              auVar27._0_8_ = 0x7fffffff7fffffff;
              auVar27._12_4_ = 0x7fffffff;
              auVar104 = vandps_avx512vl(auVar105,auVar27);
              if (auVar104._0_4_ < auVar107._0_4_) {
                auVar104 = vfmadd231ss_fma(ZEXT416((uint)(auVar107._0_4_ + auVar106._0_4_)),
                                           local_930,ZEXT416(0x36000000));
                auVar28._8_4_ = 0x7fffffff;
                auVar28._0_8_ = 0x7fffffff7fffffff;
                auVar28._12_4_ = 0x7fffffff;
                auVar105 = vandps_avx512vl(ZEXT416((uint)fVar244),auVar28);
                if (auVar105._0_4_ < auVar104._0_4_) {
                  fVar264 = auVar99._0_4_ + (float)local_940._0_4_;
                  if ((fVar264 < fVar169) ||
                     (fVar269 = *(float *)(ray + k * 4 + 0x200), fVar269 < fVar264)) break;
                  auVar104 = vmovshdup_avx(auVar99);
                  fVar270 = auVar104._0_4_;
                  if ((fVar270 < 0.0) || (1.0 < fVar270)) break;
                  auVar104 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_a20._0_4_));
                  fVar271 = auVar104._0_4_;
                  pGVar3 = (context->scene->geometries).items[uVar90].ptr;
                  if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) break;
                  fVar271 = fVar271 * 1.5 + local_a20._0_4_ * -0.5 * fVar271 * fVar271 * fVar271;
                  auVar235._0_4_ = auVar97._0_4_ * fVar271;
                  auVar235._4_4_ = auVar97._4_4_ * fVar271;
                  auVar235._8_4_ = auVar97._8_4_ * fVar271;
                  auVar235._12_4_ = auVar97._12_4_ * fVar271;
                  auVar100 = vfmadd213ps_fma(auVar100,auVar235,auVar109);
                  auVar104 = vshufps_avx(auVar235,auVar235,0xc9);
                  auVar105 = vshufps_avx(auVar109,auVar109,0xc9);
                  auVar236._0_4_ = auVar235._0_4_ * auVar105._0_4_;
                  auVar236._4_4_ = auVar235._4_4_ * auVar105._4_4_;
                  auVar236._8_4_ = auVar235._8_4_ * auVar105._8_4_;
                  auVar236._12_4_ = auVar235._12_4_ * auVar105._12_4_;
                  auVar98 = vfmsub231ps_fma(auVar236,auVar109,auVar104);
                  auVar104 = vshufps_avx(auVar98,auVar98,0xc9);
                  auVar105 = vshufps_avx(auVar100,auVar100,0xc9);
                  auVar98 = vshufps_avx(auVar98,auVar98,0xd2);
                  auVar199._0_4_ = auVar100._0_4_ * auVar98._0_4_;
                  auVar199._4_4_ = auVar100._4_4_ * auVar98._4_4_;
                  auVar199._8_4_ = auVar100._8_4_ * auVar98._8_4_;
                  auVar199._12_4_ = auVar100._12_4_ * auVar98._12_4_;
                  auVar104 = vfmsub231ps_fma(auVar199,auVar104,auVar105);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x200) = fVar264;
                    uVar191 = vextractps_avx(auVar104,1);
                    *(undefined4 *)(ray + k * 4 + 0x300) = uVar191;
                    uVar191 = vextractps_avx(auVar104,2);
                    *(undefined4 *)(ray + k * 4 + 0x340) = uVar191;
                    *(int *)(ray + k * 4 + 0x380) = auVar104._0_4_;
                    *(float *)(ray + k * 4 + 0x3c0) = fVar270;
                    *(undefined4 *)(ray + k * 4 + 0x400) = 0;
                    *(undefined4 *)(ray + k * 4 + 0x440) = uVar1;
                    *(uint *)(ray + k * 4 + 0x480) = uVar90;
                    *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                    break;
                  }
                  pRVar4 = context->user;
                  auVar184 = vbroadcastss_avx512f(ZEXT416(1));
                  local_340 = vpermps_avx512f(auVar184,auVar273);
                  auVar184 = vpermps_avx512f(auVar184,ZEXT1664(auVar104));
                  auVar257 = vbroadcastss_avx512f(ZEXT416(2));
                  local_3c0 = vpermps_avx512f(auVar257,ZEXT1664(auVar104));
                  local_380 = vbroadcastss_avx512f(auVar104);
                  local_400[0] = (RTCHitN)auVar184[0];
                  local_400[1] = (RTCHitN)auVar184[1];
                  local_400[2] = (RTCHitN)auVar184[2];
                  local_400[3] = (RTCHitN)auVar184[3];
                  local_400[4] = (RTCHitN)auVar184[4];
                  local_400[5] = (RTCHitN)auVar184[5];
                  local_400[6] = (RTCHitN)auVar184[6];
                  local_400[7] = (RTCHitN)auVar184[7];
                  local_400[8] = (RTCHitN)auVar184[8];
                  local_400[9] = (RTCHitN)auVar184[9];
                  local_400[10] = (RTCHitN)auVar184[10];
                  local_400[0xb] = (RTCHitN)auVar184[0xb];
                  local_400[0xc] = (RTCHitN)auVar184[0xc];
                  local_400[0xd] = (RTCHitN)auVar184[0xd];
                  local_400[0xe] = (RTCHitN)auVar184[0xe];
                  local_400[0xf] = (RTCHitN)auVar184[0xf];
                  local_400[0x10] = (RTCHitN)auVar184[0x10];
                  local_400[0x11] = (RTCHitN)auVar184[0x11];
                  local_400[0x12] = (RTCHitN)auVar184[0x12];
                  local_400[0x13] = (RTCHitN)auVar184[0x13];
                  local_400[0x14] = (RTCHitN)auVar184[0x14];
                  local_400[0x15] = (RTCHitN)auVar184[0x15];
                  local_400[0x16] = (RTCHitN)auVar184[0x16];
                  local_400[0x17] = (RTCHitN)auVar184[0x17];
                  local_400[0x18] = (RTCHitN)auVar184[0x18];
                  local_400[0x19] = (RTCHitN)auVar184[0x19];
                  local_400[0x1a] = (RTCHitN)auVar184[0x1a];
                  local_400[0x1b] = (RTCHitN)auVar184[0x1b];
                  local_400[0x1c] = (RTCHitN)auVar184[0x1c];
                  local_400[0x1d] = (RTCHitN)auVar184[0x1d];
                  local_400[0x1e] = (RTCHitN)auVar184[0x1e];
                  local_400[0x1f] = (RTCHitN)auVar184[0x1f];
                  local_400[0x20] = (RTCHitN)auVar184[0x20];
                  local_400[0x21] = (RTCHitN)auVar184[0x21];
                  local_400[0x22] = (RTCHitN)auVar184[0x22];
                  local_400[0x23] = (RTCHitN)auVar184[0x23];
                  local_400[0x24] = (RTCHitN)auVar184[0x24];
                  local_400[0x25] = (RTCHitN)auVar184[0x25];
                  local_400[0x26] = (RTCHitN)auVar184[0x26];
                  local_400[0x27] = (RTCHitN)auVar184[0x27];
                  local_400[0x28] = (RTCHitN)auVar184[0x28];
                  local_400[0x29] = (RTCHitN)auVar184[0x29];
                  local_400[0x2a] = (RTCHitN)auVar184[0x2a];
                  local_400[0x2b] = (RTCHitN)auVar184[0x2b];
                  local_400[0x2c] = (RTCHitN)auVar184[0x2c];
                  local_400[0x2d] = (RTCHitN)auVar184[0x2d];
                  local_400[0x2e] = (RTCHitN)auVar184[0x2e];
                  local_400[0x2f] = (RTCHitN)auVar184[0x2f];
                  local_400[0x30] = (RTCHitN)auVar184[0x30];
                  local_400[0x31] = (RTCHitN)auVar184[0x31];
                  local_400[0x32] = (RTCHitN)auVar184[0x32];
                  local_400[0x33] = (RTCHitN)auVar184[0x33];
                  local_400[0x34] = (RTCHitN)auVar184[0x34];
                  local_400[0x35] = (RTCHitN)auVar184[0x35];
                  local_400[0x36] = (RTCHitN)auVar184[0x36];
                  local_400[0x37] = (RTCHitN)auVar184[0x37];
                  local_400[0x38] = (RTCHitN)auVar184[0x38];
                  local_400[0x39] = (RTCHitN)auVar184[0x39];
                  local_400[0x3a] = (RTCHitN)auVar184[0x3a];
                  local_400[0x3b] = (RTCHitN)auVar184[0x3b];
                  local_400[0x3c] = (RTCHitN)auVar184[0x3c];
                  local_400[0x3d] = (RTCHitN)auVar184[0x3d];
                  local_400[0x3e] = (RTCHitN)auVar184[0x3e];
                  local_400[0x3f] = (RTCHitN)auVar184[0x3f];
                  local_300 = 0;
                  uStack_2f8 = 0;
                  uStack_2f0 = 0;
                  uStack_2e8 = 0;
                  uStack_2e0 = 0;
                  uStack_2d8 = 0;
                  uStack_2d0 = 0;
                  uStack_2c8 = 0;
                  local_2c0 = local_480._0_8_;
                  uStack_2b8 = local_480._8_8_;
                  uStack_2b0 = local_480._16_8_;
                  uStack_2a8 = local_480._24_8_;
                  uStack_2a0 = local_480._32_8_;
                  uStack_298 = local_480._40_8_;
                  uStack_290 = local_480._48_8_;
                  uStack_288 = local_480._56_8_;
                  auVar184 = vmovdqa64_avx512f(local_440);
                  local_280 = vmovdqa64_avx512f(auVar184);
                  auVar121 = vpcmpeqd_avx2(auVar184._0_32_,auVar184._0_32_);
                  local_a28[3] = auVar121;
                  local_a28[2] = auVar121;
                  local_a28[1] = auVar121;
                  *local_a28 = auVar121;
                  local_240 = vbroadcastss_avx512f(ZEXT416(pRVar4->instID[0]));
                  local_200 = vbroadcastss_avx512f(ZEXT416(pRVar4->instPrimID[0]));
                  *(float *)(ray + k * 4 + 0x200) = fVar264;
                  auVar184 = vmovdqa64_avx512f(local_4c0);
                  local_780 = vmovdqa64_avx512f(auVar184);
                  local_b70.valid = (int *)local_780;
                  local_b70.geometryUserPtr = pGVar3->userPtr;
                  local_b70.context = context->user;
                  local_b70.hit = local_400;
                  local_b70.N = 0x10;
                  local_b70.ray = (RTCRayN *)ray;
                  if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar263 = ZEXT1664(auVar260);
                    auVar268 = ZEXT1664(auVar265);
                    auVar273 = ZEXT1664(auVar99);
                    auVar274 = ZEXT1664(auVar97);
                    auVar276 = ZEXT1664(local_a20._0_16_);
                    auVar280 = ZEXT1664(auVar109);
                    (*pGVar3->intersectionFilterN)(&local_b70);
                    auVar284 = ZEXT3264(local_b40);
                    auVar283 = ZEXT3264(local_b20);
                    auVar282 = ZEXT3264(local_b00);
                    auVar281 = ZEXT3264(local_ae0);
                    auVar184 = vmovdqa64_avx512f(local_780);
                  }
                  uVar22 = vptestmd_avx512f(auVar184,auVar184);
                  if ((short)uVar22 != 0) {
                    p_Var5 = context->args->filter;
                    if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar263 = ZEXT1664(auVar263._0_16_);
                      auVar268 = ZEXT1664(auVar268._0_16_);
                      auVar273 = ZEXT1664(auVar273._0_16_);
                      auVar274 = ZEXT1664(auVar274._0_16_);
                      auVar276 = ZEXT1664(auVar276._0_16_);
                      auVar280 = ZEXT1664(auVar280._0_16_);
                      (*p_Var5)(&local_b70);
                      auVar284 = ZEXT3264(local_b40);
                      auVar283 = ZEXT3264(local_b20);
                      auVar282 = ZEXT3264(local_b00);
                      auVar281 = ZEXT3264(local_ae0);
                      auVar184 = vmovdqa64_avx512f(local_780);
                    }
                    uVar94 = vptestmd_avx512f(auVar184,auVar184);
                    if ((short)uVar94 != 0) {
                      iVar63 = *(int *)(local_b70.hit + 4);
                      iVar64 = *(int *)(local_b70.hit + 8);
                      iVar65 = *(int *)(local_b70.hit + 0xc);
                      iVar66 = *(int *)(local_b70.hit + 0x10);
                      iVar67 = *(int *)(local_b70.hit + 0x14);
                      iVar68 = *(int *)(local_b70.hit + 0x18);
                      iVar69 = *(int *)(local_b70.hit + 0x1c);
                      iVar70 = *(int *)(local_b70.hit + 0x20);
                      iVar71 = *(int *)(local_b70.hit + 0x24);
                      iVar72 = *(int *)(local_b70.hit + 0x28);
                      iVar73 = *(int *)(local_b70.hit + 0x2c);
                      iVar74 = *(int *)(local_b70.hit + 0x30);
                      iVar75 = *(int *)(local_b70.hit + 0x34);
                      iVar76 = *(int *)(local_b70.hit + 0x38);
                      iVar77 = *(int *)(local_b70.hit + 0x3c);
                      bVar84 = (byte)uVar94;
                      bVar6 = (bool)((byte)(uVar94 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar94 >> 2) & 1);
                      bVar8 = (bool)((byte)(uVar94 >> 3) & 1);
                      bVar9 = (bool)((byte)(uVar94 >> 4) & 1);
                      bVar10 = (bool)((byte)(uVar94 >> 5) & 1);
                      bVar11 = (bool)((byte)(uVar94 >> 6) & 1);
                      bVar12 = (bool)((byte)(uVar94 >> 7) & 1);
                      bVar83 = (byte)(uVar94 >> 8);
                      bVar13 = (bool)((byte)(uVar94 >> 9) & 1);
                      bVar14 = (bool)((byte)(uVar94 >> 10) & 1);
                      bVar15 = (bool)((byte)(uVar94 >> 0xb) & 1);
                      bVar16 = (bool)((byte)(uVar94 >> 0xc) & 1);
                      bVar17 = (bool)((byte)(uVar94 >> 0xd) & 1);
                      bVar18 = (bool)((byte)(uVar94 >> 0xe) & 1);
                      bVar19 = SUB81(uVar94 >> 0xf,0);
                      *(uint *)(local_b70.ray + 0x300) =
                           (uint)(bVar84 & 1) * *(int *)local_b70.hit |
                           (uint)!(bool)(bVar84 & 1) * *(int *)(local_b70.ray + 0x300);
                      *(uint *)(local_b70.ray + 0x304) =
                           (uint)bVar6 * iVar63 | (uint)!bVar6 * *(int *)(local_b70.ray + 0x304);
                      *(uint *)(local_b70.ray + 0x308) =
                           (uint)bVar7 * iVar64 | (uint)!bVar7 * *(int *)(local_b70.ray + 0x308);
                      *(uint *)(local_b70.ray + 0x30c) =
                           (uint)bVar8 * iVar65 | (uint)!bVar8 * *(int *)(local_b70.ray + 0x30c);
                      *(uint *)(local_b70.ray + 0x310) =
                           (uint)bVar9 * iVar66 | (uint)!bVar9 * *(int *)(local_b70.ray + 0x310);
                      *(uint *)(local_b70.ray + 0x314) =
                           (uint)bVar10 * iVar67 | (uint)!bVar10 * *(int *)(local_b70.ray + 0x314);
                      *(uint *)(local_b70.ray + 0x318) =
                           (uint)bVar11 * iVar68 | (uint)!bVar11 * *(int *)(local_b70.ray + 0x318);
                      *(uint *)(local_b70.ray + 0x31c) =
                           (uint)bVar12 * iVar69 | (uint)!bVar12 * *(int *)(local_b70.ray + 0x31c);
                      *(uint *)(local_b70.ray + 800) =
                           (uint)(bVar83 & 1) * iVar70 |
                           (uint)!(bool)(bVar83 & 1) * *(int *)(local_b70.ray + 800);
                      *(uint *)(local_b70.ray + 0x324) =
                           (uint)bVar13 * iVar71 | (uint)!bVar13 * *(int *)(local_b70.ray + 0x324);
                      *(uint *)(local_b70.ray + 0x328) =
                           (uint)bVar14 * iVar72 | (uint)!bVar14 * *(int *)(local_b70.ray + 0x328);
                      *(uint *)(local_b70.ray + 0x32c) =
                           (uint)bVar15 * iVar73 | (uint)!bVar15 * *(int *)(local_b70.ray + 0x32c);
                      *(uint *)(local_b70.ray + 0x330) =
                           (uint)bVar16 * iVar74 | (uint)!bVar16 * *(int *)(local_b70.ray + 0x330);
                      *(uint *)(local_b70.ray + 0x334) =
                           (uint)bVar17 * iVar75 | (uint)!bVar17 * *(int *)(local_b70.ray + 0x334);
                      *(uint *)(local_b70.ray + 0x338) =
                           (uint)bVar18 * iVar76 | (uint)!bVar18 * *(int *)(local_b70.ray + 0x338);
                      *(uint *)(local_b70.ray + 0x33c) =
                           (uint)bVar19 * iVar77 | (uint)!bVar19 * *(int *)(local_b70.ray + 0x33c);
                      iVar63 = *(int *)(local_b70.hit + 0x44);
                      iVar64 = *(int *)(local_b70.hit + 0x48);
                      iVar65 = *(int *)(local_b70.hit + 0x4c);
                      iVar66 = *(int *)(local_b70.hit + 0x50);
                      iVar67 = *(int *)(local_b70.hit + 0x54);
                      iVar68 = *(int *)(local_b70.hit + 0x58);
                      iVar69 = *(int *)(local_b70.hit + 0x5c);
                      iVar70 = *(int *)(local_b70.hit + 0x60);
                      iVar71 = *(int *)(local_b70.hit + 100);
                      iVar72 = *(int *)(local_b70.hit + 0x68);
                      iVar73 = *(int *)(local_b70.hit + 0x6c);
                      iVar74 = *(int *)(local_b70.hit + 0x70);
                      iVar75 = *(int *)(local_b70.hit + 0x74);
                      iVar76 = *(int *)(local_b70.hit + 0x78);
                      iVar77 = *(int *)(local_b70.hit + 0x7c);
                      bVar6 = (bool)((byte)(uVar94 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar94 >> 2) & 1);
                      bVar8 = (bool)((byte)(uVar94 >> 3) & 1);
                      bVar9 = (bool)((byte)(uVar94 >> 4) & 1);
                      bVar10 = (bool)((byte)(uVar94 >> 5) & 1);
                      bVar11 = (bool)((byte)(uVar94 >> 6) & 1);
                      bVar12 = (bool)((byte)(uVar94 >> 7) & 1);
                      bVar13 = (bool)((byte)(uVar94 >> 9) & 1);
                      bVar14 = (bool)((byte)(uVar94 >> 10) & 1);
                      bVar15 = (bool)((byte)(uVar94 >> 0xb) & 1);
                      bVar16 = (bool)((byte)(uVar94 >> 0xc) & 1);
                      bVar17 = (bool)((byte)(uVar94 >> 0xd) & 1);
                      bVar18 = (bool)((byte)(uVar94 >> 0xe) & 1);
                      bVar19 = SUB81(uVar94 >> 0xf,0);
                      *(uint *)(local_b70.ray + 0x340) =
                           (uint)(bVar84 & 1) * *(int *)(local_b70.hit + 0x40) |
                           (uint)!(bool)(bVar84 & 1) * *(int *)(local_b70.ray + 0x340);
                      *(uint *)(local_b70.ray + 0x344) =
                           (uint)bVar6 * iVar63 | (uint)!bVar6 * *(int *)(local_b70.ray + 0x344);
                      *(uint *)(local_b70.ray + 0x348) =
                           (uint)bVar7 * iVar64 | (uint)!bVar7 * *(int *)(local_b70.ray + 0x348);
                      *(uint *)(local_b70.ray + 0x34c) =
                           (uint)bVar8 * iVar65 | (uint)!bVar8 * *(int *)(local_b70.ray + 0x34c);
                      *(uint *)(local_b70.ray + 0x350) =
                           (uint)bVar9 * iVar66 | (uint)!bVar9 * *(int *)(local_b70.ray + 0x350);
                      *(uint *)(local_b70.ray + 0x354) =
                           (uint)bVar10 * iVar67 | (uint)!bVar10 * *(int *)(local_b70.ray + 0x354);
                      *(uint *)(local_b70.ray + 0x358) =
                           (uint)bVar11 * iVar68 | (uint)!bVar11 * *(int *)(local_b70.ray + 0x358);
                      *(uint *)(local_b70.ray + 0x35c) =
                           (uint)bVar12 * iVar69 | (uint)!bVar12 * *(int *)(local_b70.ray + 0x35c);
                      *(uint *)(local_b70.ray + 0x360) =
                           (uint)(bVar83 & 1) * iVar70 |
                           (uint)!(bool)(bVar83 & 1) * *(int *)(local_b70.ray + 0x360);
                      *(uint *)(local_b70.ray + 0x364) =
                           (uint)bVar13 * iVar71 | (uint)!bVar13 * *(int *)(local_b70.ray + 0x364);
                      *(uint *)(local_b70.ray + 0x368) =
                           (uint)bVar14 * iVar72 | (uint)!bVar14 * *(int *)(local_b70.ray + 0x368);
                      *(uint *)(local_b70.ray + 0x36c) =
                           (uint)bVar15 * iVar73 | (uint)!bVar15 * *(int *)(local_b70.ray + 0x36c);
                      *(uint *)(local_b70.ray + 0x370) =
                           (uint)bVar16 * iVar74 | (uint)!bVar16 * *(int *)(local_b70.ray + 0x370);
                      *(uint *)(local_b70.ray + 0x374) =
                           (uint)bVar17 * iVar75 | (uint)!bVar17 * *(int *)(local_b70.ray + 0x374);
                      *(uint *)(local_b70.ray + 0x378) =
                           (uint)bVar18 * iVar76 | (uint)!bVar18 * *(int *)(local_b70.ray + 0x378);
                      *(uint *)(local_b70.ray + 0x37c) =
                           (uint)bVar19 * iVar77 | (uint)!bVar19 * *(int *)(local_b70.ray + 0x37c);
                      iVar63 = *(int *)(local_b70.hit + 0x84);
                      iVar64 = *(int *)(local_b70.hit + 0x88);
                      iVar65 = *(int *)(local_b70.hit + 0x8c);
                      iVar66 = *(int *)(local_b70.hit + 0x90);
                      iVar67 = *(int *)(local_b70.hit + 0x94);
                      iVar68 = *(int *)(local_b70.hit + 0x98);
                      iVar69 = *(int *)(local_b70.hit + 0x9c);
                      iVar70 = *(int *)(local_b70.hit + 0xa0);
                      iVar71 = *(int *)(local_b70.hit + 0xa4);
                      iVar72 = *(int *)(local_b70.hit + 0xa8);
                      iVar73 = *(int *)(local_b70.hit + 0xac);
                      iVar74 = *(int *)(local_b70.hit + 0xb0);
                      iVar75 = *(int *)(local_b70.hit + 0xb4);
                      iVar76 = *(int *)(local_b70.hit + 0xb8);
                      iVar77 = *(int *)(local_b70.hit + 0xbc);
                      bVar6 = (bool)((byte)(uVar94 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar94 >> 2) & 1);
                      bVar8 = (bool)((byte)(uVar94 >> 3) & 1);
                      bVar9 = (bool)((byte)(uVar94 >> 4) & 1);
                      bVar10 = (bool)((byte)(uVar94 >> 5) & 1);
                      bVar11 = (bool)((byte)(uVar94 >> 6) & 1);
                      bVar12 = (bool)((byte)(uVar94 >> 7) & 1);
                      bVar13 = (bool)((byte)(uVar94 >> 9) & 1);
                      bVar14 = (bool)((byte)(uVar94 >> 10) & 1);
                      bVar15 = (bool)((byte)(uVar94 >> 0xb) & 1);
                      bVar16 = (bool)((byte)(uVar94 >> 0xc) & 1);
                      bVar17 = (bool)((byte)(uVar94 >> 0xd) & 1);
                      bVar18 = (bool)((byte)(uVar94 >> 0xe) & 1);
                      bVar19 = SUB81(uVar94 >> 0xf,0);
                      *(uint *)(local_b70.ray + 0x380) =
                           (uint)(bVar84 & 1) * *(int *)(local_b70.hit + 0x80) |
                           (uint)!(bool)(bVar84 & 1) * *(int *)(local_b70.ray + 0x380);
                      *(uint *)(local_b70.ray + 900) =
                           (uint)bVar6 * iVar63 | (uint)!bVar6 * *(int *)(local_b70.ray + 900);
                      *(uint *)(local_b70.ray + 0x388) =
                           (uint)bVar7 * iVar64 | (uint)!bVar7 * *(int *)(local_b70.ray + 0x388);
                      *(uint *)(local_b70.ray + 0x38c) =
                           (uint)bVar8 * iVar65 | (uint)!bVar8 * *(int *)(local_b70.ray + 0x38c);
                      *(uint *)(local_b70.ray + 0x390) =
                           (uint)bVar9 * iVar66 | (uint)!bVar9 * *(int *)(local_b70.ray + 0x390);
                      *(uint *)(local_b70.ray + 0x394) =
                           (uint)bVar10 * iVar67 | (uint)!bVar10 * *(int *)(local_b70.ray + 0x394);
                      *(uint *)(local_b70.ray + 0x398) =
                           (uint)bVar11 * iVar68 | (uint)!bVar11 * *(int *)(local_b70.ray + 0x398);
                      *(uint *)(local_b70.ray + 0x39c) =
                           (uint)bVar12 * iVar69 | (uint)!bVar12 * *(int *)(local_b70.ray + 0x39c);
                      *(uint *)(local_b70.ray + 0x3a0) =
                           (uint)(bVar83 & 1) * iVar70 |
                           (uint)!(bool)(bVar83 & 1) * *(int *)(local_b70.ray + 0x3a0);
                      *(uint *)(local_b70.ray + 0x3a4) =
                           (uint)bVar13 * iVar71 | (uint)!bVar13 * *(int *)(local_b70.ray + 0x3a4);
                      *(uint *)(local_b70.ray + 0x3a8) =
                           (uint)bVar14 * iVar72 | (uint)!bVar14 * *(int *)(local_b70.ray + 0x3a8);
                      *(uint *)(local_b70.ray + 0x3ac) =
                           (uint)bVar15 * iVar73 | (uint)!bVar15 * *(int *)(local_b70.ray + 0x3ac);
                      *(uint *)(local_b70.ray + 0x3b0) =
                           (uint)bVar16 * iVar74 | (uint)!bVar16 * *(int *)(local_b70.ray + 0x3b0);
                      *(uint *)(local_b70.ray + 0x3b4) =
                           (uint)bVar17 * iVar75 | (uint)!bVar17 * *(int *)(local_b70.ray + 0x3b4);
                      *(uint *)(local_b70.ray + 0x3b8) =
                           (uint)bVar18 * iVar76 | (uint)!bVar18 * *(int *)(local_b70.ray + 0x3b8);
                      *(uint *)(local_b70.ray + 0x3bc) =
                           (uint)bVar19 * iVar77 | (uint)!bVar19 * *(int *)(local_b70.ray + 0x3bc);
                      iVar63 = *(int *)(local_b70.hit + 0xc4);
                      iVar64 = *(int *)(local_b70.hit + 200);
                      iVar65 = *(int *)(local_b70.hit + 0xcc);
                      iVar66 = *(int *)(local_b70.hit + 0xd0);
                      iVar67 = *(int *)(local_b70.hit + 0xd4);
                      iVar68 = *(int *)(local_b70.hit + 0xd8);
                      iVar69 = *(int *)(local_b70.hit + 0xdc);
                      iVar70 = *(int *)(local_b70.hit + 0xe0);
                      iVar71 = *(int *)(local_b70.hit + 0xe4);
                      iVar72 = *(int *)(local_b70.hit + 0xe8);
                      iVar73 = *(int *)(local_b70.hit + 0xec);
                      iVar74 = *(int *)(local_b70.hit + 0xf0);
                      iVar75 = *(int *)(local_b70.hit + 0xf4);
                      iVar76 = *(int *)(local_b70.hit + 0xf8);
                      iVar77 = *(int *)(local_b70.hit + 0xfc);
                      bVar6 = (bool)((byte)(uVar94 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar94 >> 2) & 1);
                      bVar8 = (bool)((byte)(uVar94 >> 3) & 1);
                      bVar9 = (bool)((byte)(uVar94 >> 4) & 1);
                      bVar10 = (bool)((byte)(uVar94 >> 5) & 1);
                      bVar11 = (bool)((byte)(uVar94 >> 6) & 1);
                      bVar12 = (bool)((byte)(uVar94 >> 7) & 1);
                      bVar13 = (bool)((byte)(uVar94 >> 9) & 1);
                      bVar14 = (bool)((byte)(uVar94 >> 10) & 1);
                      bVar15 = (bool)((byte)(uVar94 >> 0xb) & 1);
                      bVar16 = (bool)((byte)(uVar94 >> 0xc) & 1);
                      bVar17 = (bool)((byte)(uVar94 >> 0xd) & 1);
                      bVar18 = (bool)((byte)(uVar94 >> 0xe) & 1);
                      bVar19 = SUB81(uVar94 >> 0xf,0);
                      *(uint *)(local_b70.ray + 0x3c0) =
                           (uint)(bVar84 & 1) * *(int *)(local_b70.hit + 0xc0) |
                           (uint)!(bool)(bVar84 & 1) * *(int *)(local_b70.ray + 0x3c0);
                      *(uint *)(local_b70.ray + 0x3c4) =
                           (uint)bVar6 * iVar63 | (uint)!bVar6 * *(int *)(local_b70.ray + 0x3c4);
                      *(uint *)(local_b70.ray + 0x3c8) =
                           (uint)bVar7 * iVar64 | (uint)!bVar7 * *(int *)(local_b70.ray + 0x3c8);
                      *(uint *)(local_b70.ray + 0x3cc) =
                           (uint)bVar8 * iVar65 | (uint)!bVar8 * *(int *)(local_b70.ray + 0x3cc);
                      *(uint *)(local_b70.ray + 0x3d0) =
                           (uint)bVar9 * iVar66 | (uint)!bVar9 * *(int *)(local_b70.ray + 0x3d0);
                      *(uint *)(local_b70.ray + 0x3d4) =
                           (uint)bVar10 * iVar67 | (uint)!bVar10 * *(int *)(local_b70.ray + 0x3d4);
                      *(uint *)(local_b70.ray + 0x3d8) =
                           (uint)bVar11 * iVar68 | (uint)!bVar11 * *(int *)(local_b70.ray + 0x3d8);
                      *(uint *)(local_b70.ray + 0x3dc) =
                           (uint)bVar12 * iVar69 | (uint)!bVar12 * *(int *)(local_b70.ray + 0x3dc);
                      *(uint *)(local_b70.ray + 0x3e0) =
                           (uint)(bVar83 & 1) * iVar70 |
                           (uint)!(bool)(bVar83 & 1) * *(int *)(local_b70.ray + 0x3e0);
                      *(uint *)(local_b70.ray + 0x3e4) =
                           (uint)bVar13 * iVar71 | (uint)!bVar13 * *(int *)(local_b70.ray + 0x3e4);
                      *(uint *)(local_b70.ray + 1000) =
                           (uint)bVar14 * iVar72 | (uint)!bVar14 * *(int *)(local_b70.ray + 1000);
                      *(uint *)(local_b70.ray + 0x3ec) =
                           (uint)bVar15 * iVar73 | (uint)!bVar15 * *(int *)(local_b70.ray + 0x3ec);
                      *(uint *)(local_b70.ray + 0x3f0) =
                           (uint)bVar16 * iVar74 | (uint)!bVar16 * *(int *)(local_b70.ray + 0x3f0);
                      *(uint *)(local_b70.ray + 0x3f4) =
                           (uint)bVar17 * iVar75 | (uint)!bVar17 * *(int *)(local_b70.ray + 0x3f4);
                      *(uint *)(local_b70.ray + 0x3f8) =
                           (uint)bVar18 * iVar76 | (uint)!bVar18 * *(int *)(local_b70.ray + 0x3f8);
                      *(uint *)(local_b70.ray + 0x3fc) =
                           (uint)bVar19 * iVar77 | (uint)!bVar19 * *(int *)(local_b70.ray + 0x3fc);
                      iVar63 = *(int *)(local_b70.hit + 0x104);
                      iVar64 = *(int *)(local_b70.hit + 0x108);
                      iVar65 = *(int *)(local_b70.hit + 0x10c);
                      iVar66 = *(int *)(local_b70.hit + 0x110);
                      iVar67 = *(int *)(local_b70.hit + 0x114);
                      iVar68 = *(int *)(local_b70.hit + 0x118);
                      iVar69 = *(int *)(local_b70.hit + 0x11c);
                      iVar70 = *(int *)(local_b70.hit + 0x120);
                      iVar71 = *(int *)(local_b70.hit + 0x124);
                      iVar72 = *(int *)(local_b70.hit + 0x128);
                      iVar73 = *(int *)(local_b70.hit + 300);
                      iVar74 = *(int *)(local_b70.hit + 0x130);
                      iVar75 = *(int *)(local_b70.hit + 0x134);
                      iVar76 = *(int *)(local_b70.hit + 0x138);
                      iVar77 = *(int *)(local_b70.hit + 0x13c);
                      bVar6 = (bool)((byte)(uVar94 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar94 >> 2) & 1);
                      bVar8 = (bool)((byte)(uVar94 >> 3) & 1);
                      bVar9 = (bool)((byte)(uVar94 >> 4) & 1);
                      bVar10 = (bool)((byte)(uVar94 >> 5) & 1);
                      bVar11 = (bool)((byte)(uVar94 >> 6) & 1);
                      bVar12 = (bool)((byte)(uVar94 >> 7) & 1);
                      bVar13 = (bool)((byte)(uVar94 >> 9) & 1);
                      bVar14 = (bool)((byte)(uVar94 >> 10) & 1);
                      bVar15 = (bool)((byte)(uVar94 >> 0xb) & 1);
                      bVar16 = (bool)((byte)(uVar94 >> 0xc) & 1);
                      bVar17 = (bool)((byte)(uVar94 >> 0xd) & 1);
                      bVar18 = (bool)((byte)(uVar94 >> 0xe) & 1);
                      bVar19 = SUB81(uVar94 >> 0xf,0);
                      *(uint *)(local_b70.ray + 0x400) =
                           (uint)(bVar84 & 1) * *(int *)(local_b70.hit + 0x100) |
                           (uint)!(bool)(bVar84 & 1) * *(int *)(local_b70.ray + 0x400);
                      *(uint *)(local_b70.ray + 0x404) =
                           (uint)bVar6 * iVar63 | (uint)!bVar6 * *(int *)(local_b70.ray + 0x404);
                      *(uint *)(local_b70.ray + 0x408) =
                           (uint)bVar7 * iVar64 | (uint)!bVar7 * *(int *)(local_b70.ray + 0x408);
                      *(uint *)(local_b70.ray + 0x40c) =
                           (uint)bVar8 * iVar65 | (uint)!bVar8 * *(int *)(local_b70.ray + 0x40c);
                      *(uint *)(local_b70.ray + 0x410) =
                           (uint)bVar9 * iVar66 | (uint)!bVar9 * *(int *)(local_b70.ray + 0x410);
                      *(uint *)(local_b70.ray + 0x414) =
                           (uint)bVar10 * iVar67 | (uint)!bVar10 * *(int *)(local_b70.ray + 0x414);
                      *(uint *)(local_b70.ray + 0x418) =
                           (uint)bVar11 * iVar68 | (uint)!bVar11 * *(int *)(local_b70.ray + 0x418);
                      *(uint *)(local_b70.ray + 0x41c) =
                           (uint)bVar12 * iVar69 | (uint)!bVar12 * *(int *)(local_b70.ray + 0x41c);
                      *(uint *)(local_b70.ray + 0x420) =
                           (uint)(bVar83 & 1) * iVar70 |
                           (uint)!(bool)(bVar83 & 1) * *(int *)(local_b70.ray + 0x420);
                      *(uint *)(local_b70.ray + 0x424) =
                           (uint)bVar13 * iVar71 | (uint)!bVar13 * *(int *)(local_b70.ray + 0x424);
                      *(uint *)(local_b70.ray + 0x428) =
                           (uint)bVar14 * iVar72 | (uint)!bVar14 * *(int *)(local_b70.ray + 0x428);
                      *(uint *)(local_b70.ray + 0x42c) =
                           (uint)bVar15 * iVar73 | (uint)!bVar15 * *(int *)(local_b70.ray + 0x42c);
                      *(uint *)(local_b70.ray + 0x430) =
                           (uint)bVar16 * iVar74 | (uint)!bVar16 * *(int *)(local_b70.ray + 0x430);
                      *(uint *)(local_b70.ray + 0x434) =
                           (uint)bVar17 * iVar75 | (uint)!bVar17 * *(int *)(local_b70.ray + 0x434);
                      *(uint *)(local_b70.ray + 0x438) =
                           (uint)bVar18 * iVar76 | (uint)!bVar18 * *(int *)(local_b70.ray + 0x438);
                      *(uint *)(local_b70.ray + 0x43c) =
                           (uint)bVar19 * iVar77 | (uint)!bVar19 * *(int *)(local_b70.ray + 0x43c);
                      auVar184 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b70.hit + 0x140));
                      auVar184 = vmovdqu32_avx512f(auVar184);
                      *(undefined1 (*) [64])(local_b70.ray + 0x440) = auVar184;
                      auVar184 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b70.hit + 0x180));
                      auVar184 = vmovdqu32_avx512f(auVar184);
                      *(undefined1 (*) [64])(local_b70.ray + 0x480) = auVar184;
                      auVar184 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b70.hit + 0x1c0));
                      auVar184 = vmovdqa32_avx512f(auVar184);
                      *(undefined1 (*) [64])(local_b70.ray + 0x4c0) = auVar184;
                      auVar184 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b70.hit + 0x200));
                      auVar184 = vmovdqa32_avx512f(auVar184);
                      *(undefined1 (*) [64])(local_b70.ray + 0x500) = auVar184;
                      break;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x200) = fVar269;
                  break;
                }
              }
              lVar93 = lVar93 + -1;
            } while (lVar93 != 0);
            uVar191 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar182._4_4_ = uVar191;
            auVar182._0_4_ = uVar191;
            auVar182._8_4_ = uVar191;
            auVar182._12_4_ = uVar191;
            auVar182._16_4_ = uVar191;
            auVar182._20_4_ = uVar191;
            auVar182._24_4_ = uVar191;
            auVar182._28_4_ = uVar191;
            auVar78._4_4_ = fStack_71c;
            auVar78._0_4_ = local_720;
            auVar78._8_4_ = fStack_718;
            auVar78._12_4_ = fStack_714;
            auVar78._16_4_ = fStack_710;
            auVar78._20_4_ = fStack_70c;
            auVar78._24_4_ = fStack_708;
            auVar78._28_4_ = fStack_704;
            uVar22 = vcmpps_avx512vl(auVar182,auVar78,0xd);
            bVar92 = ~('\x01' << ((byte)iVar25 & 0x1f)) & bVar92 & (byte)uVar22;
          } while (bVar92 != 0);
          auVar257 = ZEXT3264(local_680);
        }
        bVar87 = local_740[0] | ~bVar87;
        auVar209._0_4_ = (float)local_9e0._0_4_ + auVar257._0_4_;
        auVar209._4_4_ = (float)local_9e0._4_4_ + auVar257._4_4_;
        auVar209._8_4_ = fStack_9d8 + auVar257._8_4_;
        auVar209._12_4_ = fStack_9d4 + auVar257._12_4_;
        auVar209._16_4_ = fStack_9d0 + auVar257._16_4_;
        auVar209._20_4_ = fStack_9cc + auVar257._20_4_;
        auVar209._24_4_ = fStack_9c8 + auVar257._24_4_;
        auVar209._28_4_ = fStack_9c4 + auVar257._28_4_;
        uVar22 = vcmpps_avx512vl(auVar209,auVar182,2);
        bVar82 = (byte)uVar23 & bVar82 & (byte)uVar22;
        auVar210._8_4_ = 2;
        auVar210._0_8_ = 0x200000002;
        auVar210._12_4_ = 2;
        auVar210._16_4_ = 2;
        auVar210._20_4_ = 2;
        auVar210._24_4_ = 2;
        auVar210._28_4_ = 2;
        auVar36._8_4_ = 3;
        auVar36._0_8_ = 0x300000003;
        auVar36._12_4_ = 3;
        auVar36._16_4_ = 3;
        auVar36._20_4_ = 3;
        auVar36._24_4_ = 3;
        auVar36._28_4_ = 3;
        auVar121 = vpblendmd_avx512vl(auVar210,auVar36);
        auVar158._0_4_ = (uint)(bVar87 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar87 & 1) * 2;
        bVar6 = (bool)(bVar87 >> 1 & 1);
        auVar158._4_4_ = (uint)bVar6 * auVar121._4_4_ | (uint)!bVar6 * 2;
        bVar6 = (bool)(bVar87 >> 2 & 1);
        auVar158._8_4_ = (uint)bVar6 * auVar121._8_4_ | (uint)!bVar6 * 2;
        bVar6 = (bool)(bVar87 >> 3 & 1);
        auVar158._12_4_ = (uint)bVar6 * auVar121._12_4_ | (uint)!bVar6 * 2;
        bVar6 = (bool)(bVar87 >> 4 & 1);
        auVar158._16_4_ = (uint)bVar6 * auVar121._16_4_ | (uint)!bVar6 * 2;
        bVar6 = (bool)(bVar87 >> 5 & 1);
        auVar158._20_4_ = (uint)bVar6 * auVar121._20_4_ | (uint)!bVar6 * 2;
        bVar6 = (bool)(bVar87 >> 6 & 1);
        auVar158._24_4_ = (uint)bVar6 * auVar121._24_4_ | (uint)!bVar6 * 2;
        auVar158._28_4_ = (uint)(bVar87 >> 7) * auVar121._28_4_ | (uint)!(bool)(bVar87 >> 7) * 2;
        uVar22 = vpcmpd_avx512vl(local_6e0,auVar158,5);
        bVar87 = (byte)uVar22 & bVar82;
        fVar264 = (float)local_9e0._0_4_;
        fVar269 = (float)local_9e0._4_4_;
        fVar270 = fStack_9d8;
        fVar271 = fStack_9d4;
        fVar244 = fStack_9d0;
        fVar245 = fStack_9cc;
        fVar246 = fStack_9c8;
        fVar230 = fStack_9c4;
        if (bVar87 != 0) {
          auVar104 = vminps_avx(local_960._0_16_,local_9a0._0_16_);
          auVar99 = vmaxps_avx(local_960._0_16_,local_9a0._0_16_);
          auVar97 = vminps_avx(local_980._0_16_,local_9c0._0_16_);
          auVar109 = vminps_avx(auVar104,auVar97);
          auVar104 = vmaxps_avx(local_980._0_16_,local_9c0._0_16_);
          auVar97 = vmaxps_avx(auVar99,auVar104);
          auVar218._8_4_ = 0x7fffffff;
          auVar218._0_8_ = 0x7fffffff7fffffff;
          auVar218._12_4_ = 0x7fffffff;
          auVar99 = vandps_avx(auVar109,auVar218);
          auVar104 = vandps_avx(auVar97,auVar218);
          auVar99 = vmaxps_avx(auVar99,auVar104);
          auVar104 = vmovshdup_avx(auVar99);
          auVar104 = vmaxss_avx(auVar104,auVar99);
          auVar99 = vshufpd_avx(auVar99,auVar99,1);
          auVar99 = vmaxss_avx(auVar99,auVar104);
          fVar264 = auVar99._0_4_ * 1.9073486e-06;
          local_930 = vshufps_avx(auVar97,auVar97,0xff);
          local_720 = (float)local_9e0._0_4_ + local_6c0._0_4_;
          fStack_71c = (float)local_9e0._4_4_ + local_6c0._4_4_;
          fStack_718 = fStack_9d8 + local_6c0._8_4_;
          fStack_714 = fStack_9d4 + local_6c0._12_4_;
          fStack_710 = fStack_9d0 + local_6c0._16_4_;
          fStack_70c = fStack_9cc + local_6c0._20_4_;
          fStack_708 = fStack_9c8 + local_6c0._24_4_;
          fStack_704 = fStack_9c4 + local_6c0._28_4_;
          _local_8c0 = local_6c0;
          local_740 = auVar158;
          do {
            auVar183._8_4_ = 0x7f800000;
            auVar183._0_8_ = 0x7f8000007f800000;
            auVar183._12_4_ = 0x7f800000;
            auVar183._16_4_ = 0x7f800000;
            auVar183._20_4_ = 0x7f800000;
            auVar183._24_4_ = 0x7f800000;
            auVar183._28_4_ = 0x7f800000;
            auVar121 = vblendmps_avx512vl(auVar183,_local_8c0);
            auVar159._0_4_ =
                 (uint)(bVar87 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar87 & 1) * 0x7f800000;
            bVar6 = (bool)(bVar87 >> 1 & 1);
            auVar159._4_4_ = (uint)bVar6 * auVar121._4_4_ | (uint)!bVar6 * 0x7f800000;
            bVar6 = (bool)(bVar87 >> 2 & 1);
            auVar159._8_4_ = (uint)bVar6 * auVar121._8_4_ | (uint)!bVar6 * 0x7f800000;
            bVar6 = (bool)(bVar87 >> 3 & 1);
            auVar159._12_4_ = (uint)bVar6 * auVar121._12_4_ | (uint)!bVar6 * 0x7f800000;
            bVar6 = (bool)(bVar87 >> 4 & 1);
            auVar159._16_4_ = (uint)bVar6 * auVar121._16_4_ | (uint)!bVar6 * 0x7f800000;
            bVar6 = (bool)(bVar87 >> 5 & 1);
            auVar159._20_4_ = (uint)bVar6 * auVar121._20_4_ | (uint)!bVar6 * 0x7f800000;
            auVar159._24_4_ =
                 (uint)(bVar87 >> 6) * auVar121._24_4_ | (uint)!(bool)(bVar87 >> 6) * 0x7f800000;
            auVar159._28_4_ = 0x7f800000;
            auVar121 = vshufps_avx(auVar159,auVar159,0xb1);
            auVar121 = vminps_avx(auVar159,auVar121);
            auVar122 = vshufpd_avx(auVar121,auVar121,5);
            auVar121 = vminps_avx(auVar121,auVar122);
            auVar122 = vpermpd_avx2(auVar121,0x4e);
            auVar121 = vminps_avx(auVar121,auVar122);
            uVar22 = vcmpps_avx512vl(auVar159,auVar121,0);
            bVar84 = (byte)uVar22 & bVar87;
            bVar92 = bVar87;
            if (bVar84 != 0) {
              bVar92 = bVar84;
            }
            iVar25 = 0;
            for (uVar96 = (uint)bVar92; (uVar96 & 1) == 0; uVar96 = uVar96 >> 1 | 0x80000000) {
              iVar25 = iVar25 + 1;
            }
            uVar96 = *(uint *)(local_6a0 + (uint)(iVar25 << 2));
            fVar269 = auVar20._0_4_;
            auVar99 = ZEXT416(*(uint *)(local_500 + (uint)(iVar25 << 2)));
            if ((float)local_a00._0_4_ < 0.0) {
              local_a80._0_16_ = ZEXT416(*(uint *)(local_500 + (uint)(iVar25 << 2)));
              fVar269 = sqrtf((float)local_a00._0_4_);
              auVar99 = local_a80._0_16_;
            }
            local_a50._0_4_ = fVar269 * 1.9073486e-06;
            auVar99 = vinsertps_avx(ZEXT416(uVar96),auVar99,0x10);
            auVar273 = ZEXT1664(auVar99);
            lVar93 = 5;
            do {
              uVar191 = auVar273._0_4_;
              auVar173._4_4_ = uVar191;
              auVar173._0_4_ = uVar191;
              auVar173._8_4_ = uVar191;
              auVar173._12_4_ = uVar191;
              auVar99 = vfmadd132ps_fma(auVar173,ZEXT816(0) << 0x40,local_9f0);
              auVar104 = vmovshdup_avx(auVar273._0_16_);
              fVar245 = auVar104._0_4_;
              fVar244 = 1.0 - fVar245;
              fVar271 = fVar244 * fVar244 * fVar244;
              fVar269 = fVar245 * fVar245;
              fVar246 = fVar269 * fVar245;
              auVar97 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar271),
                                        ZEXT416((uint)fVar246));
              fVar270 = fVar245 * fVar244;
              local_a80._0_16_ = ZEXT416((uint)fVar244);
              auVar105 = vfmadd231ss_fma(ZEXT416((uint)(fVar270 * fVar245 * 6.0)),
                                         ZEXT416((uint)(fVar270 * fVar244)),
                                         SUB6416(ZEXT464(0x41400000),0));
              auVar109 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar246),
                                         ZEXT416((uint)fVar271));
              auVar98 = vfmadd231ss_fma(ZEXT416((uint)(fVar270 * fVar244 * 6.0)),
                                        SUB6416(ZEXT464(0x41400000),0),
                                        ZEXT416((uint)(fVar270 * fVar245)));
              fVar271 = fVar271 * 0.16666667;
              fVar244 = (auVar97._0_4_ + auVar105._0_4_) * 0.16666667;
              fVar245 = (auVar109._0_4_ + auVar98._0_4_) * 0.16666667;
              fVar246 = fVar246 * 0.16666667;
              auVar219._0_4_ = fVar246 * (float)local_9c0._0_4_;
              auVar219._4_4_ = fVar246 * (float)local_9c0._4_4_;
              auVar219._8_4_ = fVar246 * fStack_9b8;
              auVar219._12_4_ = fVar246 * fStack_9b4;
              auVar249._4_4_ = fVar245;
              auVar249._0_4_ = fVar245;
              auVar249._8_4_ = fVar245;
              auVar249._12_4_ = fVar245;
              auVar97 = vfmadd132ps_fma(auVar249,auVar219,local_980._0_16_);
              auVar220._4_4_ = fVar244;
              auVar220._0_4_ = fVar244;
              auVar220._8_4_ = fVar244;
              auVar220._12_4_ = fVar244;
              auVar97 = vfmadd132ps_fma(auVar220,auVar97,local_9a0._0_16_);
              auVar200._4_4_ = fVar271;
              auVar200._0_4_ = fVar271;
              auVar200._8_4_ = fVar271;
              auVar200._12_4_ = fVar271;
              auVar97 = vfmadd132ps_fma(auVar200,auVar97,local_960._0_16_);
              local_840._0_16_ = auVar97;
              auVar97 = vsubps_avx(auVar99,auVar97);
              auVar99 = vdpps_avx(auVar97,auVar97,0x7f);
              local_a20._0_16_ = auVar99;
              local_7c0 = auVar273;
              if (auVar99._0_4_ < 0.0) {
                local_aa0._0_4_ = fVar269;
                local_ac0._0_4_ = fVar270;
                auVar263._0_4_ = sqrtf(auVar99._0_4_);
                auVar263._4_60_ = extraout_var_00;
                auVar99 = auVar263._0_16_;
                fVar270 = (float)local_ac0._0_4_;
              }
              else {
                auVar99 = vsqrtss_avx(auVar99,auVar99);
                local_aa0._0_4_ = fVar269;
              }
              local_860._4_4_ = local_a80._0_4_;
              local_860._0_4_ = local_860._4_4_;
              fStack_858 = (float)local_860._4_4_;
              fStack_854 = (float)local_860._4_4_;
              auVar105 = vfnmsub213ss_fma(auVar104,auVar104,ZEXT416((uint)(fVar270 * 4.0)));
              auVar109 = vfmadd231ss_fma(ZEXT416((uint)(fVar270 * 4.0)),local_a80._0_16_,
                                         local_a80._0_16_);
              fVar269 = (float)local_860._4_4_ * -(float)local_860._4_4_ * 0.5;
              fVar270 = auVar105._0_4_ * 0.5;
              fVar271 = auVar109._0_4_ * 0.5;
              local_aa0._0_4_ = (float)local_aa0._0_4_ * 0.5;
              auVar237._0_4_ = (float)local_aa0._0_4_ * (float)local_9c0._0_4_;
              auVar237._4_4_ = (float)local_aa0._0_4_ * (float)local_9c0._4_4_;
              auVar237._8_4_ = (float)local_aa0._0_4_ * fStack_9b8;
              auVar237._12_4_ = (float)local_aa0._0_4_ * fStack_9b4;
              auVar201._4_4_ = fVar271;
              auVar201._0_4_ = fVar271;
              auVar201._8_4_ = fVar271;
              auVar201._12_4_ = fVar271;
              auVar109 = vfmadd132ps_fma(auVar201,auVar237,local_980._0_16_);
              auVar221._4_4_ = fVar270;
              auVar221._0_4_ = fVar270;
              auVar221._8_4_ = fVar270;
              auVar221._12_4_ = fVar270;
              auVar109 = vfmadd132ps_fma(auVar221,auVar109,local_9a0._0_16_);
              auVar278._4_4_ = fVar269;
              auVar278._0_4_ = fVar269;
              auVar278._8_4_ = fVar269;
              auVar278._12_4_ = fVar269;
              _local_aa0 = vfmadd132ps_fma(auVar278,auVar109,local_960._0_16_);
              local_880._0_16_ = vdpps_avx(_local_aa0,_local_aa0,0x7f);
              auVar62._12_4_ = 0;
              auVar62._0_12_ = ZEXT812(0);
              fVar269 = local_880._0_4_;
              auVar105 = vrsqrt14ss_avx512f(auVar62 << 0x20,ZEXT416((uint)fVar269));
              local_8a0._0_16_ = vrcp14ss_avx512f(auVar62 << 0x20,ZEXT416((uint)fVar269));
              auVar109 = vfnmadd213ss_fma(local_8a0._0_16_,local_880._0_16_,ZEXT416(0x40000000));
              local_a40._0_4_ = auVar109._0_4_;
              local_ac0._0_4_ = auVar99._0_4_;
              if (fVar269 < -fVar269) {
                local_a60 = auVar105;
                fVar270 = sqrtf(fVar269);
                auVar99 = ZEXT416((uint)local_ac0._0_4_);
                auVar109 = local_a60;
                auVar98 = _local_aa0;
              }
              else {
                auVar109 = vsqrtss_avx(local_880._0_16_,local_880._0_16_);
                fVar270 = auVar109._0_4_;
                auVar109 = auVar105;
                auVar98 = _local_aa0;
              }
              fVar271 = auVar109._0_4_;
              auVar102 = vbroadcastss_avx512vl
                                   (ZEXT416((uint)(auVar105._0_4_ * 1.5 +
                                                  fVar269 * -0.5 * fVar271 * fVar271 * fVar271)));
              auVar101 = vmulps_avx512vl(auVar98,auVar102);
              auVar109 = vdpps_avx(auVar97,auVar101,0x7f);
              fVar269 = auVar99._0_4_ + 1.0;
              fVar271 = auVar109._0_4_;
              auVar174._0_4_ = fVar271 * fVar271;
              auVar174._4_4_ = auVar109._4_4_ * auVar109._4_4_;
              auVar174._8_4_ = auVar109._8_4_ * auVar109._8_4_;
              auVar174._12_4_ = auVar109._12_4_ * auVar109._12_4_;
              auVar105 = vsubps_avx(local_a20._0_16_,auVar174);
              fVar244 = auVar105._0_4_;
              auVar202._4_12_ = ZEXT812(0) << 0x20;
              auVar202._0_4_ = fVar244;
              auVar100 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar202);
              auVar106 = vmulss_avx512f(auVar100,ZEXT416(0x3fc00000));
              auVar107 = vmulss_avx512f(auVar105,ZEXT416(0xbf000000));
              if (fVar244 < 0.0) {
                local_a60._0_4_ = fVar269;
                local_900._0_4_ = auVar106._0_4_;
                _local_920 = auVar102;
                local_910 = auVar101;
                local_8f0 = auVar100;
                fVar244 = sqrtf(fVar244);
                auVar107 = ZEXT416(auVar107._0_4_);
                auVar106 = ZEXT416((uint)local_900._0_4_);
                auVar99 = ZEXT416((uint)local_ac0._0_4_);
                auVar100 = local_8f0;
                auVar98 = _local_aa0;
                fVar269 = (float)local_a60._0_4_;
                auVar101 = local_910;
                auVar102 = _local_920;
              }
              else {
                auVar105 = vsqrtss_avx(auVar105,auVar105);
                fVar244 = auVar105._0_4_;
              }
              auVar280 = ZEXT1664(auVar98);
              auVar276 = ZEXT1664(local_a20._0_16_);
              auVar274 = ZEXT1664(auVar97);
              auVar281 = ZEXT3264(local_ae0);
              auVar282 = ZEXT3264(local_b00);
              auVar283 = ZEXT3264(local_b20);
              auVar284 = ZEXT3264(local_b40);
              auVar105 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_a80._0_16_,auVar104);
              auVar103 = vfmadd213ss_fma(auVar104,SUB6416(ZEXT464(0xc0000000),0),local_a80._0_16_);
              auVar272 = local_7c0._0_16_;
              auVar104 = vshufps_avx(auVar272,auVar272,0x55);
              auVar222._0_4_ = auVar104._0_4_ * (float)local_9c0._0_4_;
              auVar222._4_4_ = auVar104._4_4_ * (float)local_9c0._4_4_;
              auVar222._8_4_ = auVar104._8_4_ * fStack_9b8;
              auVar222._12_4_ = auVar104._12_4_ * fStack_9b4;
              auVar238._0_4_ = auVar103._0_4_;
              auVar238._4_4_ = auVar238._0_4_;
              auVar238._8_4_ = auVar238._0_4_;
              auVar238._12_4_ = auVar238._0_4_;
              auVar104 = vfmadd132ps_fma(auVar238,auVar222,local_980._0_16_);
              auVar203._0_4_ = auVar105._0_4_;
              auVar203._4_4_ = auVar203._0_4_;
              auVar203._8_4_ = auVar203._0_4_;
              auVar203._12_4_ = auVar203._0_4_;
              auVar104 = vfmadd132ps_fma(auVar203,auVar104,local_9a0._0_16_);
              auVar104 = vfmadd132ps_fma(_local_860,auVar104,local_960._0_16_);
              auVar204._0_4_ = auVar104._0_4_ * (float)local_880._0_4_;
              auVar204._4_4_ = auVar104._4_4_ * (float)local_880._0_4_;
              auVar204._8_4_ = auVar104._8_4_ * (float)local_880._0_4_;
              auVar204._12_4_ = auVar104._12_4_ * (float)local_880._0_4_;
              auVar104 = vdpps_avx(auVar98,auVar104,0x7f);
              fVar245 = auVar104._0_4_;
              auVar223._0_4_ = auVar98._0_4_ * fVar245;
              auVar223._4_4_ = auVar98._4_4_ * fVar245;
              auVar223._8_4_ = auVar98._8_4_ * fVar245;
              auVar223._12_4_ = auVar98._12_4_ * fVar245;
              auVar104 = vsubps_avx(auVar204,auVar223);
              fVar245 = (float)local_a40._0_4_ * (float)local_8a0._0_4_;
              auVar103 = vmaxss_avx(ZEXT416((uint)fVar264),
                                    ZEXT416((uint)(local_7c0._0_4_ * (float)local_a50._0_4_)));
              auVar205._0_4_ = auVar104._0_4_ * fVar245;
              auVar205._4_4_ = auVar104._4_4_ * fVar245;
              auVar205._8_4_ = auVar104._8_4_ * fVar245;
              auVar205._12_4_ = auVar104._12_4_ * fVar245;
              auVar29._8_4_ = 0x80000000;
              auVar29._0_8_ = 0x8000000080000000;
              auVar29._12_4_ = 0x80000000;
              auVar108 = vxorps_avx512vl(auVar98,auVar29);
              auVar102 = vmulps_avx512vl(auVar102,auVar205);
              auVar104 = vdpps_avx(auVar108,auVar101,0x7f);
              auVar105 = vfmadd213ss_fma(auVar99,ZEXT416((uint)fVar264),auVar103);
              auVar99 = vdpps_avx(auVar97,auVar102,0x7f);
              auVar102 = vfmadd213ss_fma(ZEXT416((uint)fVar269),ZEXT416((uint)(fVar264 / fVar270)),
                                         auVar105);
              fVar269 = auVar104._0_4_ + auVar99._0_4_;
              auVar99 = vdpps_avx(local_9f0,auVar101,0x7f);
              auVar104 = vdpps_avx(auVar97,auVar108,0x7f);
              auVar105 = vmulss_avx512f(auVar107,auVar100);
              auVar106 = vaddss_avx512f(auVar106,ZEXT416((uint)(auVar105._0_4_ *
                                                               auVar100._0_4_ * auVar100._0_4_)));
              auVar105 = vdpps_avx(auVar97,local_9f0,0x7f);
              auVar101 = vfnmadd231ss_fma(auVar104,auVar109,ZEXT416((uint)fVar269));
              auVar105 = vfnmadd231ss_fma(auVar105,auVar109,auVar99);
              auVar104 = vpermilps_avx(local_840._0_16_,0xff);
              fVar244 = fVar244 - auVar104._0_4_;
              auVar100 = vshufps_avx(auVar98,auVar98,0xff);
              auVar104 = vfmsub213ss_fma(auVar101,auVar106,auVar100);
              auVar266._8_4_ = 0x80000000;
              auVar266._0_8_ = 0x8000000080000000;
              auVar266._12_4_ = 0x80000000;
              auVar268 = ZEXT1664(auVar266);
              auVar261._0_8_ = auVar104._0_8_ ^ 0x8000000080000000;
              auVar261._8_4_ = auVar104._8_4_ ^ 0x80000000;
              auVar261._12_4_ = auVar104._12_4_ ^ 0x80000000;
              auVar263 = ZEXT1664(auVar261);
              auVar105 = ZEXT416((uint)(auVar105._0_4_ * auVar106._0_4_));
              auVar101 = vfmsub231ss_fma(ZEXT416((uint)(auVar99._0_4_ * auVar104._0_4_)),
                                         ZEXT416((uint)fVar269),auVar105);
              auVar104 = vinsertps_avx(auVar261,auVar105,0x1c);
              auVar256._0_8_ = auVar99._0_8_ ^ 0x8000000080000000;
              auVar256._8_4_ = auVar99._8_4_ ^ 0x80000000;
              auVar256._12_4_ = auVar99._12_4_ ^ 0x80000000;
              auVar105 = vinsertps_avx(ZEXT416((uint)fVar269),auVar256,0x10);
              auVar239._0_4_ = auVar101._0_4_;
              auVar239._4_4_ = auVar239._0_4_;
              auVar239._8_4_ = auVar239._0_4_;
              auVar239._12_4_ = auVar239._0_4_;
              auVar99 = vdivps_avx(auVar104,auVar239);
              auVar104 = vdivps_avx(auVar105,auVar239);
              auVar257 = ZEXT1664(CONCAT412(fVar244,CONCAT48(fVar244,CONCAT44(fVar244,fVar244))));
              auVar240._0_4_ = fVar271 * auVar99._0_4_ + fVar244 * auVar104._0_4_;
              auVar240._4_4_ = fVar271 * auVar99._4_4_ + fVar244 * auVar104._4_4_;
              auVar240._8_4_ = fVar271 * auVar99._8_4_ + fVar244 * auVar104._8_4_;
              auVar240._12_4_ = fVar271 * auVar99._12_4_ + fVar244 * auVar104._12_4_;
              auVar99 = vsubps_avx(auVar272,auVar240);
              auVar273 = ZEXT1664(auVar99);
              auVar30._8_4_ = 0x7fffffff;
              auVar30._0_8_ = 0x7fffffff7fffffff;
              auVar30._12_4_ = 0x7fffffff;
              auVar104 = vandps_avx512vl(auVar109,auVar30);
              if (auVar104._0_4_ < auVar102._0_4_) {
                auVar104 = vfmadd231ss_fma(ZEXT416((uint)(auVar102._0_4_ + auVar103._0_4_)),
                                           local_930,ZEXT416(0x36000000));
                auVar31._8_4_ = 0x7fffffff;
                auVar31._0_8_ = 0x7fffffff7fffffff;
                auVar31._12_4_ = 0x7fffffff;
                auVar109 = vandps_avx512vl(ZEXT416((uint)fVar244),auVar31);
                if (auVar109._0_4_ < auVar104._0_4_) {
                  fVar269 = auVar99._0_4_ + (float)local_940._0_4_;
                  if ((fVar269 < fVar169) ||
                     (fVar270 = *(float *)(ray + k * 4 + 0x200), fVar270 < fVar269)) break;
                  auVar104 = vmovshdup_avx(auVar99);
                  fVar271 = auVar104._0_4_;
                  if ((fVar271 < 0.0) || (1.0 < fVar271)) break;
                  auVar104 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_a20._0_4_));
                  fVar245 = auVar104._0_4_;
                  fVar244 = local_a20._0_4_ * -0.5;
                  auVar257 = ZEXT464((uint)fVar244);
                  pGVar3 = (context->scene->geometries).items[uVar90].ptr;
                  if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) break;
                  fVar244 = fVar245 * 1.5 + fVar244 * fVar245 * fVar245 * fVar245;
                  auVar241._0_4_ = auVar97._0_4_ * fVar244;
                  auVar241._4_4_ = auVar97._4_4_ * fVar244;
                  auVar241._8_4_ = auVar97._8_4_ * fVar244;
                  auVar241._12_4_ = auVar97._12_4_ * fVar244;
                  auVar100 = vfmadd213ps_fma(auVar100,auVar241,auVar98);
                  auVar104 = vshufps_avx(auVar241,auVar241,0xc9);
                  auVar109 = vshufps_avx(auVar98,auVar98,0xc9);
                  auVar242._0_4_ = auVar241._0_4_ * auVar109._0_4_;
                  auVar242._4_4_ = auVar241._4_4_ * auVar109._4_4_;
                  auVar242._8_4_ = auVar241._8_4_ * auVar109._8_4_;
                  auVar242._12_4_ = auVar241._12_4_ * auVar109._12_4_;
                  auVar105 = vfmsub231ps_fma(auVar242,auVar98,auVar104);
                  auVar104 = vshufps_avx(auVar105,auVar105,0xc9);
                  auVar109 = vshufps_avx(auVar100,auVar100,0xc9);
                  auVar257 = ZEXT1664(auVar109);
                  auVar105 = vshufps_avx(auVar105,auVar105,0xd2);
                  auVar206._0_4_ = auVar100._0_4_ * auVar105._0_4_;
                  auVar206._4_4_ = auVar100._4_4_ * auVar105._4_4_;
                  auVar206._8_4_ = auVar100._8_4_ * auVar105._8_4_;
                  auVar206._12_4_ = auVar100._12_4_ * auVar105._12_4_;
                  auVar104 = vfmsub231ps_fma(auVar206,auVar104,auVar109);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x200) = fVar269;
                    uVar191 = vextractps_avx(auVar104,1);
                    *(undefined4 *)(ray + k * 4 + 0x300) = uVar191;
                    uVar191 = vextractps_avx(auVar104,2);
                    *(undefined4 *)(ray + k * 4 + 0x340) = uVar191;
                    *(int *)(ray + k * 4 + 0x380) = auVar104._0_4_;
                    *(float *)(ray + k * 4 + 0x3c0) = fVar271;
                    *(undefined4 *)(ray + k * 4 + 0x400) = 0;
                    *(undefined4 *)(ray + k * 4 + 0x440) = uVar1;
                    *(uint *)(ray + k * 4 + 0x480) = uVar90;
                    *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                    break;
                  }
                  pRVar4 = context->user;
                  auVar184 = vbroadcastss_avx512f(ZEXT416(1));
                  local_340 = vpermps_avx512f(auVar184,auVar273);
                  auVar184 = vpermps_avx512f(auVar184,ZEXT1664(auVar104));
                  auVar161 = vbroadcastss_avx512f(ZEXT416(2));
                  local_3c0 = vpermps_avx512f(auVar161,ZEXT1664(auVar104));
                  local_380 = vbroadcastss_avx512f(auVar104);
                  local_400[0] = (RTCHitN)auVar184[0];
                  local_400[1] = (RTCHitN)auVar184[1];
                  local_400[2] = (RTCHitN)auVar184[2];
                  local_400[3] = (RTCHitN)auVar184[3];
                  local_400[4] = (RTCHitN)auVar184[4];
                  local_400[5] = (RTCHitN)auVar184[5];
                  local_400[6] = (RTCHitN)auVar184[6];
                  local_400[7] = (RTCHitN)auVar184[7];
                  local_400[8] = (RTCHitN)auVar184[8];
                  local_400[9] = (RTCHitN)auVar184[9];
                  local_400[10] = (RTCHitN)auVar184[10];
                  local_400[0xb] = (RTCHitN)auVar184[0xb];
                  local_400[0xc] = (RTCHitN)auVar184[0xc];
                  local_400[0xd] = (RTCHitN)auVar184[0xd];
                  local_400[0xe] = (RTCHitN)auVar184[0xe];
                  local_400[0xf] = (RTCHitN)auVar184[0xf];
                  local_400[0x10] = (RTCHitN)auVar184[0x10];
                  local_400[0x11] = (RTCHitN)auVar184[0x11];
                  local_400[0x12] = (RTCHitN)auVar184[0x12];
                  local_400[0x13] = (RTCHitN)auVar184[0x13];
                  local_400[0x14] = (RTCHitN)auVar184[0x14];
                  local_400[0x15] = (RTCHitN)auVar184[0x15];
                  local_400[0x16] = (RTCHitN)auVar184[0x16];
                  local_400[0x17] = (RTCHitN)auVar184[0x17];
                  local_400[0x18] = (RTCHitN)auVar184[0x18];
                  local_400[0x19] = (RTCHitN)auVar184[0x19];
                  local_400[0x1a] = (RTCHitN)auVar184[0x1a];
                  local_400[0x1b] = (RTCHitN)auVar184[0x1b];
                  local_400[0x1c] = (RTCHitN)auVar184[0x1c];
                  local_400[0x1d] = (RTCHitN)auVar184[0x1d];
                  local_400[0x1e] = (RTCHitN)auVar184[0x1e];
                  local_400[0x1f] = (RTCHitN)auVar184[0x1f];
                  local_400[0x20] = (RTCHitN)auVar184[0x20];
                  local_400[0x21] = (RTCHitN)auVar184[0x21];
                  local_400[0x22] = (RTCHitN)auVar184[0x22];
                  local_400[0x23] = (RTCHitN)auVar184[0x23];
                  local_400[0x24] = (RTCHitN)auVar184[0x24];
                  local_400[0x25] = (RTCHitN)auVar184[0x25];
                  local_400[0x26] = (RTCHitN)auVar184[0x26];
                  local_400[0x27] = (RTCHitN)auVar184[0x27];
                  local_400[0x28] = (RTCHitN)auVar184[0x28];
                  local_400[0x29] = (RTCHitN)auVar184[0x29];
                  local_400[0x2a] = (RTCHitN)auVar184[0x2a];
                  local_400[0x2b] = (RTCHitN)auVar184[0x2b];
                  local_400[0x2c] = (RTCHitN)auVar184[0x2c];
                  local_400[0x2d] = (RTCHitN)auVar184[0x2d];
                  local_400[0x2e] = (RTCHitN)auVar184[0x2e];
                  local_400[0x2f] = (RTCHitN)auVar184[0x2f];
                  local_400[0x30] = (RTCHitN)auVar184[0x30];
                  local_400[0x31] = (RTCHitN)auVar184[0x31];
                  local_400[0x32] = (RTCHitN)auVar184[0x32];
                  local_400[0x33] = (RTCHitN)auVar184[0x33];
                  local_400[0x34] = (RTCHitN)auVar184[0x34];
                  local_400[0x35] = (RTCHitN)auVar184[0x35];
                  local_400[0x36] = (RTCHitN)auVar184[0x36];
                  local_400[0x37] = (RTCHitN)auVar184[0x37];
                  local_400[0x38] = (RTCHitN)auVar184[0x38];
                  local_400[0x39] = (RTCHitN)auVar184[0x39];
                  local_400[0x3a] = (RTCHitN)auVar184[0x3a];
                  local_400[0x3b] = (RTCHitN)auVar184[0x3b];
                  local_400[0x3c] = (RTCHitN)auVar184[0x3c];
                  local_400[0x3d] = (RTCHitN)auVar184[0x3d];
                  local_400[0x3e] = (RTCHitN)auVar184[0x3e];
                  local_400[0x3f] = (RTCHitN)auVar184[0x3f];
                  local_300 = 0;
                  uStack_2f8 = 0;
                  uStack_2f0 = 0;
                  uStack_2e8 = 0;
                  uStack_2e0 = 0;
                  uStack_2d8 = 0;
                  uStack_2d0 = 0;
                  uStack_2c8 = 0;
                  local_2c0 = local_480._0_8_;
                  uStack_2b8 = local_480._8_8_;
                  uStack_2b0 = local_480._16_8_;
                  uStack_2a8 = local_480._24_8_;
                  uStack_2a0 = local_480._32_8_;
                  uStack_298 = local_480._40_8_;
                  uStack_290 = local_480._48_8_;
                  uStack_288 = local_480._56_8_;
                  auVar184 = vmovdqa64_avx512f(local_440);
                  local_280 = vmovdqa64_avx512f(auVar184);
                  auVar121 = vpcmpeqd_avx2(auVar184._0_32_,auVar184._0_32_);
                  local_a28[3] = auVar121;
                  local_a28[2] = auVar121;
                  local_a28[1] = auVar121;
                  *local_a28 = auVar121;
                  local_240 = vbroadcastss_avx512f(ZEXT416(pRVar4->instID[0]));
                  local_200 = vbroadcastss_avx512f(ZEXT416(pRVar4->instPrimID[0]));
                  *(float *)(ray + k * 4 + 0x200) = fVar269;
                  auVar184 = vmovdqa64_avx512f(local_4c0);
                  local_780 = vmovdqa64_avx512f(auVar184);
                  local_b70.valid = (int *)local_780;
                  local_b70.geometryUserPtr = pGVar3->userPtr;
                  local_b70.context = context->user;
                  local_b70.hit = local_400;
                  local_b70.N = 0x10;
                  local_b70.ray = (RTCRayN *)ray;
                  if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar257 = ZEXT1664(auVar109);
                    auVar263 = ZEXT1664(auVar261);
                    auVar268 = ZEXT1664(auVar266);
                    auVar273 = ZEXT1664(auVar99);
                    auVar274 = ZEXT1664(auVar97);
                    auVar276 = ZEXT1664(local_a20._0_16_);
                    auVar280 = ZEXT1664(auVar98);
                    (*pGVar3->intersectionFilterN)(&local_b70);
                    auVar284 = ZEXT3264(local_b40);
                    auVar283 = ZEXT3264(local_b20);
                    auVar282 = ZEXT3264(local_b00);
                    auVar281 = ZEXT3264(local_ae0);
                    auVar184 = vmovdqa64_avx512f(local_780);
                  }
                  uVar22 = vptestmd_avx512f(auVar184,auVar184);
                  if ((short)uVar22 != 0) {
                    p_Var5 = context->args->filter;
                    if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar257 = ZEXT1664(auVar257._0_16_);
                      auVar263 = ZEXT1664(auVar263._0_16_);
                      auVar268 = ZEXT1664(auVar268._0_16_);
                      auVar273 = ZEXT1664(auVar273._0_16_);
                      auVar274 = ZEXT1664(auVar274._0_16_);
                      auVar276 = ZEXT1664(auVar276._0_16_);
                      auVar280 = ZEXT1664(auVar280._0_16_);
                      (*p_Var5)(&local_b70);
                      auVar284 = ZEXT3264(local_b40);
                      auVar283 = ZEXT3264(local_b20);
                      auVar282 = ZEXT3264(local_b00);
                      auVar281 = ZEXT3264(local_ae0);
                      auVar184 = vmovdqa64_avx512f(local_780);
                    }
                    uVar94 = vptestmd_avx512f(auVar184,auVar184);
                    if ((short)uVar94 != 0) {
                      iVar63 = *(int *)(local_b70.hit + 4);
                      iVar64 = *(int *)(local_b70.hit + 8);
                      iVar65 = *(int *)(local_b70.hit + 0xc);
                      iVar66 = *(int *)(local_b70.hit + 0x10);
                      iVar67 = *(int *)(local_b70.hit + 0x14);
                      iVar68 = *(int *)(local_b70.hit + 0x18);
                      iVar69 = *(int *)(local_b70.hit + 0x1c);
                      iVar70 = *(int *)(local_b70.hit + 0x20);
                      iVar71 = *(int *)(local_b70.hit + 0x24);
                      iVar72 = *(int *)(local_b70.hit + 0x28);
                      iVar73 = *(int *)(local_b70.hit + 0x2c);
                      iVar74 = *(int *)(local_b70.hit + 0x30);
                      iVar75 = *(int *)(local_b70.hit + 0x34);
                      iVar76 = *(int *)(local_b70.hit + 0x38);
                      iVar77 = *(int *)(local_b70.hit + 0x3c);
                      bVar92 = (byte)uVar94;
                      bVar6 = (bool)((byte)(uVar94 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar94 >> 2) & 1);
                      bVar8 = (bool)((byte)(uVar94 >> 3) & 1);
                      bVar9 = (bool)((byte)(uVar94 >> 4) & 1);
                      bVar10 = (bool)((byte)(uVar94 >> 5) & 1);
                      bVar11 = (bool)((byte)(uVar94 >> 6) & 1);
                      bVar12 = (bool)((byte)(uVar94 >> 7) & 1);
                      bVar84 = (byte)(uVar94 >> 8);
                      bVar13 = (bool)((byte)(uVar94 >> 9) & 1);
                      bVar14 = (bool)((byte)(uVar94 >> 10) & 1);
                      bVar15 = (bool)((byte)(uVar94 >> 0xb) & 1);
                      bVar16 = (bool)((byte)(uVar94 >> 0xc) & 1);
                      bVar17 = (bool)((byte)(uVar94 >> 0xd) & 1);
                      bVar18 = (bool)((byte)(uVar94 >> 0xe) & 1);
                      bVar19 = SUB81(uVar94 >> 0xf,0);
                      *(uint *)(local_b70.ray + 0x300) =
                           (uint)(bVar92 & 1) * *(int *)local_b70.hit |
                           (uint)!(bool)(bVar92 & 1) * *(int *)(local_b70.ray + 0x300);
                      *(uint *)(local_b70.ray + 0x304) =
                           (uint)bVar6 * iVar63 | (uint)!bVar6 * *(int *)(local_b70.ray + 0x304);
                      *(uint *)(local_b70.ray + 0x308) =
                           (uint)bVar7 * iVar64 | (uint)!bVar7 * *(int *)(local_b70.ray + 0x308);
                      *(uint *)(local_b70.ray + 0x30c) =
                           (uint)bVar8 * iVar65 | (uint)!bVar8 * *(int *)(local_b70.ray + 0x30c);
                      *(uint *)(local_b70.ray + 0x310) =
                           (uint)bVar9 * iVar66 | (uint)!bVar9 * *(int *)(local_b70.ray + 0x310);
                      *(uint *)(local_b70.ray + 0x314) =
                           (uint)bVar10 * iVar67 | (uint)!bVar10 * *(int *)(local_b70.ray + 0x314);
                      *(uint *)(local_b70.ray + 0x318) =
                           (uint)bVar11 * iVar68 | (uint)!bVar11 * *(int *)(local_b70.ray + 0x318);
                      *(uint *)(local_b70.ray + 0x31c) =
                           (uint)bVar12 * iVar69 | (uint)!bVar12 * *(int *)(local_b70.ray + 0x31c);
                      *(uint *)(local_b70.ray + 800) =
                           (uint)(bVar84 & 1) * iVar70 |
                           (uint)!(bool)(bVar84 & 1) * *(int *)(local_b70.ray + 800);
                      *(uint *)(local_b70.ray + 0x324) =
                           (uint)bVar13 * iVar71 | (uint)!bVar13 * *(int *)(local_b70.ray + 0x324);
                      *(uint *)(local_b70.ray + 0x328) =
                           (uint)bVar14 * iVar72 | (uint)!bVar14 * *(int *)(local_b70.ray + 0x328);
                      *(uint *)(local_b70.ray + 0x32c) =
                           (uint)bVar15 * iVar73 | (uint)!bVar15 * *(int *)(local_b70.ray + 0x32c);
                      *(uint *)(local_b70.ray + 0x330) =
                           (uint)bVar16 * iVar74 | (uint)!bVar16 * *(int *)(local_b70.ray + 0x330);
                      *(uint *)(local_b70.ray + 0x334) =
                           (uint)bVar17 * iVar75 | (uint)!bVar17 * *(int *)(local_b70.ray + 0x334);
                      *(uint *)(local_b70.ray + 0x338) =
                           (uint)bVar18 * iVar76 | (uint)!bVar18 * *(int *)(local_b70.ray + 0x338);
                      *(uint *)(local_b70.ray + 0x33c) =
                           (uint)bVar19 * iVar77 | (uint)!bVar19 * *(int *)(local_b70.ray + 0x33c);
                      iVar63 = *(int *)(local_b70.hit + 0x44);
                      iVar64 = *(int *)(local_b70.hit + 0x48);
                      iVar65 = *(int *)(local_b70.hit + 0x4c);
                      iVar66 = *(int *)(local_b70.hit + 0x50);
                      iVar67 = *(int *)(local_b70.hit + 0x54);
                      iVar68 = *(int *)(local_b70.hit + 0x58);
                      iVar69 = *(int *)(local_b70.hit + 0x5c);
                      iVar70 = *(int *)(local_b70.hit + 0x60);
                      iVar71 = *(int *)(local_b70.hit + 100);
                      iVar72 = *(int *)(local_b70.hit + 0x68);
                      iVar73 = *(int *)(local_b70.hit + 0x6c);
                      iVar74 = *(int *)(local_b70.hit + 0x70);
                      iVar75 = *(int *)(local_b70.hit + 0x74);
                      iVar76 = *(int *)(local_b70.hit + 0x78);
                      iVar77 = *(int *)(local_b70.hit + 0x7c);
                      bVar6 = (bool)((byte)(uVar94 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar94 >> 2) & 1);
                      bVar8 = (bool)((byte)(uVar94 >> 3) & 1);
                      bVar9 = (bool)((byte)(uVar94 >> 4) & 1);
                      bVar10 = (bool)((byte)(uVar94 >> 5) & 1);
                      bVar11 = (bool)((byte)(uVar94 >> 6) & 1);
                      bVar12 = (bool)((byte)(uVar94 >> 7) & 1);
                      bVar13 = (bool)((byte)(uVar94 >> 9) & 1);
                      bVar14 = (bool)((byte)(uVar94 >> 10) & 1);
                      bVar15 = (bool)((byte)(uVar94 >> 0xb) & 1);
                      bVar16 = (bool)((byte)(uVar94 >> 0xc) & 1);
                      bVar17 = (bool)((byte)(uVar94 >> 0xd) & 1);
                      bVar18 = (bool)((byte)(uVar94 >> 0xe) & 1);
                      bVar19 = SUB81(uVar94 >> 0xf,0);
                      *(uint *)(local_b70.ray + 0x340) =
                           (uint)(bVar92 & 1) * *(int *)(local_b70.hit + 0x40) |
                           (uint)!(bool)(bVar92 & 1) * *(int *)(local_b70.ray + 0x340);
                      *(uint *)(local_b70.ray + 0x344) =
                           (uint)bVar6 * iVar63 | (uint)!bVar6 * *(int *)(local_b70.ray + 0x344);
                      *(uint *)(local_b70.ray + 0x348) =
                           (uint)bVar7 * iVar64 | (uint)!bVar7 * *(int *)(local_b70.ray + 0x348);
                      *(uint *)(local_b70.ray + 0x34c) =
                           (uint)bVar8 * iVar65 | (uint)!bVar8 * *(int *)(local_b70.ray + 0x34c);
                      *(uint *)(local_b70.ray + 0x350) =
                           (uint)bVar9 * iVar66 | (uint)!bVar9 * *(int *)(local_b70.ray + 0x350);
                      *(uint *)(local_b70.ray + 0x354) =
                           (uint)bVar10 * iVar67 | (uint)!bVar10 * *(int *)(local_b70.ray + 0x354);
                      *(uint *)(local_b70.ray + 0x358) =
                           (uint)bVar11 * iVar68 | (uint)!bVar11 * *(int *)(local_b70.ray + 0x358);
                      *(uint *)(local_b70.ray + 0x35c) =
                           (uint)bVar12 * iVar69 | (uint)!bVar12 * *(int *)(local_b70.ray + 0x35c);
                      *(uint *)(local_b70.ray + 0x360) =
                           (uint)(bVar84 & 1) * iVar70 |
                           (uint)!(bool)(bVar84 & 1) * *(int *)(local_b70.ray + 0x360);
                      *(uint *)(local_b70.ray + 0x364) =
                           (uint)bVar13 * iVar71 | (uint)!bVar13 * *(int *)(local_b70.ray + 0x364);
                      *(uint *)(local_b70.ray + 0x368) =
                           (uint)bVar14 * iVar72 | (uint)!bVar14 * *(int *)(local_b70.ray + 0x368);
                      *(uint *)(local_b70.ray + 0x36c) =
                           (uint)bVar15 * iVar73 | (uint)!bVar15 * *(int *)(local_b70.ray + 0x36c);
                      *(uint *)(local_b70.ray + 0x370) =
                           (uint)bVar16 * iVar74 | (uint)!bVar16 * *(int *)(local_b70.ray + 0x370);
                      *(uint *)(local_b70.ray + 0x374) =
                           (uint)bVar17 * iVar75 | (uint)!bVar17 * *(int *)(local_b70.ray + 0x374);
                      *(uint *)(local_b70.ray + 0x378) =
                           (uint)bVar18 * iVar76 | (uint)!bVar18 * *(int *)(local_b70.ray + 0x378);
                      *(uint *)(local_b70.ray + 0x37c) =
                           (uint)bVar19 * iVar77 | (uint)!bVar19 * *(int *)(local_b70.ray + 0x37c);
                      iVar63 = *(int *)(local_b70.hit + 0x84);
                      iVar64 = *(int *)(local_b70.hit + 0x88);
                      iVar65 = *(int *)(local_b70.hit + 0x8c);
                      iVar66 = *(int *)(local_b70.hit + 0x90);
                      iVar67 = *(int *)(local_b70.hit + 0x94);
                      iVar68 = *(int *)(local_b70.hit + 0x98);
                      iVar69 = *(int *)(local_b70.hit + 0x9c);
                      iVar70 = *(int *)(local_b70.hit + 0xa0);
                      iVar71 = *(int *)(local_b70.hit + 0xa4);
                      iVar72 = *(int *)(local_b70.hit + 0xa8);
                      iVar73 = *(int *)(local_b70.hit + 0xac);
                      iVar74 = *(int *)(local_b70.hit + 0xb0);
                      iVar75 = *(int *)(local_b70.hit + 0xb4);
                      iVar76 = *(int *)(local_b70.hit + 0xb8);
                      iVar77 = *(int *)(local_b70.hit + 0xbc);
                      bVar6 = (bool)((byte)(uVar94 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar94 >> 2) & 1);
                      bVar8 = (bool)((byte)(uVar94 >> 3) & 1);
                      bVar9 = (bool)((byte)(uVar94 >> 4) & 1);
                      bVar10 = (bool)((byte)(uVar94 >> 5) & 1);
                      bVar11 = (bool)((byte)(uVar94 >> 6) & 1);
                      bVar12 = (bool)((byte)(uVar94 >> 7) & 1);
                      bVar13 = (bool)((byte)(uVar94 >> 9) & 1);
                      bVar14 = (bool)((byte)(uVar94 >> 10) & 1);
                      bVar15 = (bool)((byte)(uVar94 >> 0xb) & 1);
                      bVar16 = (bool)((byte)(uVar94 >> 0xc) & 1);
                      bVar17 = (bool)((byte)(uVar94 >> 0xd) & 1);
                      bVar18 = (bool)((byte)(uVar94 >> 0xe) & 1);
                      bVar19 = SUB81(uVar94 >> 0xf,0);
                      *(uint *)(local_b70.ray + 0x380) =
                           (uint)(bVar92 & 1) * *(int *)(local_b70.hit + 0x80) |
                           (uint)!(bool)(bVar92 & 1) * *(int *)(local_b70.ray + 0x380);
                      *(uint *)(local_b70.ray + 900) =
                           (uint)bVar6 * iVar63 | (uint)!bVar6 * *(int *)(local_b70.ray + 900);
                      *(uint *)(local_b70.ray + 0x388) =
                           (uint)bVar7 * iVar64 | (uint)!bVar7 * *(int *)(local_b70.ray + 0x388);
                      *(uint *)(local_b70.ray + 0x38c) =
                           (uint)bVar8 * iVar65 | (uint)!bVar8 * *(int *)(local_b70.ray + 0x38c);
                      *(uint *)(local_b70.ray + 0x390) =
                           (uint)bVar9 * iVar66 | (uint)!bVar9 * *(int *)(local_b70.ray + 0x390);
                      *(uint *)(local_b70.ray + 0x394) =
                           (uint)bVar10 * iVar67 | (uint)!bVar10 * *(int *)(local_b70.ray + 0x394);
                      *(uint *)(local_b70.ray + 0x398) =
                           (uint)bVar11 * iVar68 | (uint)!bVar11 * *(int *)(local_b70.ray + 0x398);
                      *(uint *)(local_b70.ray + 0x39c) =
                           (uint)bVar12 * iVar69 | (uint)!bVar12 * *(int *)(local_b70.ray + 0x39c);
                      *(uint *)(local_b70.ray + 0x3a0) =
                           (uint)(bVar84 & 1) * iVar70 |
                           (uint)!(bool)(bVar84 & 1) * *(int *)(local_b70.ray + 0x3a0);
                      *(uint *)(local_b70.ray + 0x3a4) =
                           (uint)bVar13 * iVar71 | (uint)!bVar13 * *(int *)(local_b70.ray + 0x3a4);
                      *(uint *)(local_b70.ray + 0x3a8) =
                           (uint)bVar14 * iVar72 | (uint)!bVar14 * *(int *)(local_b70.ray + 0x3a8);
                      *(uint *)(local_b70.ray + 0x3ac) =
                           (uint)bVar15 * iVar73 | (uint)!bVar15 * *(int *)(local_b70.ray + 0x3ac);
                      *(uint *)(local_b70.ray + 0x3b0) =
                           (uint)bVar16 * iVar74 | (uint)!bVar16 * *(int *)(local_b70.ray + 0x3b0);
                      *(uint *)(local_b70.ray + 0x3b4) =
                           (uint)bVar17 * iVar75 | (uint)!bVar17 * *(int *)(local_b70.ray + 0x3b4);
                      *(uint *)(local_b70.ray + 0x3b8) =
                           (uint)bVar18 * iVar76 | (uint)!bVar18 * *(int *)(local_b70.ray + 0x3b8);
                      *(uint *)(local_b70.ray + 0x3bc) =
                           (uint)bVar19 * iVar77 | (uint)!bVar19 * *(int *)(local_b70.ray + 0x3bc);
                      iVar63 = *(int *)(local_b70.hit + 0xc4);
                      iVar64 = *(int *)(local_b70.hit + 200);
                      iVar65 = *(int *)(local_b70.hit + 0xcc);
                      iVar66 = *(int *)(local_b70.hit + 0xd0);
                      iVar67 = *(int *)(local_b70.hit + 0xd4);
                      iVar68 = *(int *)(local_b70.hit + 0xd8);
                      iVar69 = *(int *)(local_b70.hit + 0xdc);
                      iVar70 = *(int *)(local_b70.hit + 0xe0);
                      iVar71 = *(int *)(local_b70.hit + 0xe4);
                      iVar72 = *(int *)(local_b70.hit + 0xe8);
                      iVar73 = *(int *)(local_b70.hit + 0xec);
                      iVar74 = *(int *)(local_b70.hit + 0xf0);
                      iVar75 = *(int *)(local_b70.hit + 0xf4);
                      iVar76 = *(int *)(local_b70.hit + 0xf8);
                      iVar77 = *(int *)(local_b70.hit + 0xfc);
                      bVar6 = (bool)((byte)(uVar94 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar94 >> 2) & 1);
                      bVar8 = (bool)((byte)(uVar94 >> 3) & 1);
                      bVar9 = (bool)((byte)(uVar94 >> 4) & 1);
                      bVar10 = (bool)((byte)(uVar94 >> 5) & 1);
                      bVar11 = (bool)((byte)(uVar94 >> 6) & 1);
                      bVar12 = (bool)((byte)(uVar94 >> 7) & 1);
                      bVar13 = (bool)((byte)(uVar94 >> 9) & 1);
                      bVar14 = (bool)((byte)(uVar94 >> 10) & 1);
                      bVar15 = (bool)((byte)(uVar94 >> 0xb) & 1);
                      bVar16 = (bool)((byte)(uVar94 >> 0xc) & 1);
                      bVar17 = (bool)((byte)(uVar94 >> 0xd) & 1);
                      bVar18 = (bool)((byte)(uVar94 >> 0xe) & 1);
                      bVar19 = SUB81(uVar94 >> 0xf,0);
                      *(uint *)(local_b70.ray + 0x3c0) =
                           (uint)(bVar92 & 1) * *(int *)(local_b70.hit + 0xc0) |
                           (uint)!(bool)(bVar92 & 1) * *(int *)(local_b70.ray + 0x3c0);
                      *(uint *)(local_b70.ray + 0x3c4) =
                           (uint)bVar6 * iVar63 | (uint)!bVar6 * *(int *)(local_b70.ray + 0x3c4);
                      *(uint *)(local_b70.ray + 0x3c8) =
                           (uint)bVar7 * iVar64 | (uint)!bVar7 * *(int *)(local_b70.ray + 0x3c8);
                      *(uint *)(local_b70.ray + 0x3cc) =
                           (uint)bVar8 * iVar65 | (uint)!bVar8 * *(int *)(local_b70.ray + 0x3cc);
                      *(uint *)(local_b70.ray + 0x3d0) =
                           (uint)bVar9 * iVar66 | (uint)!bVar9 * *(int *)(local_b70.ray + 0x3d0);
                      *(uint *)(local_b70.ray + 0x3d4) =
                           (uint)bVar10 * iVar67 | (uint)!bVar10 * *(int *)(local_b70.ray + 0x3d4);
                      *(uint *)(local_b70.ray + 0x3d8) =
                           (uint)bVar11 * iVar68 | (uint)!bVar11 * *(int *)(local_b70.ray + 0x3d8);
                      *(uint *)(local_b70.ray + 0x3dc) =
                           (uint)bVar12 * iVar69 | (uint)!bVar12 * *(int *)(local_b70.ray + 0x3dc);
                      *(uint *)(local_b70.ray + 0x3e0) =
                           (uint)(bVar84 & 1) * iVar70 |
                           (uint)!(bool)(bVar84 & 1) * *(int *)(local_b70.ray + 0x3e0);
                      *(uint *)(local_b70.ray + 0x3e4) =
                           (uint)bVar13 * iVar71 | (uint)!bVar13 * *(int *)(local_b70.ray + 0x3e4);
                      *(uint *)(local_b70.ray + 1000) =
                           (uint)bVar14 * iVar72 | (uint)!bVar14 * *(int *)(local_b70.ray + 1000);
                      *(uint *)(local_b70.ray + 0x3ec) =
                           (uint)bVar15 * iVar73 | (uint)!bVar15 * *(int *)(local_b70.ray + 0x3ec);
                      *(uint *)(local_b70.ray + 0x3f0) =
                           (uint)bVar16 * iVar74 | (uint)!bVar16 * *(int *)(local_b70.ray + 0x3f0);
                      *(uint *)(local_b70.ray + 0x3f4) =
                           (uint)bVar17 * iVar75 | (uint)!bVar17 * *(int *)(local_b70.ray + 0x3f4);
                      *(uint *)(local_b70.ray + 0x3f8) =
                           (uint)bVar18 * iVar76 | (uint)!bVar18 * *(int *)(local_b70.ray + 0x3f8);
                      *(uint *)(local_b70.ray + 0x3fc) =
                           (uint)bVar19 * iVar77 | (uint)!bVar19 * *(int *)(local_b70.ray + 0x3fc);
                      iVar63 = *(int *)(local_b70.hit + 0x104);
                      iVar64 = *(int *)(local_b70.hit + 0x108);
                      iVar65 = *(int *)(local_b70.hit + 0x10c);
                      iVar66 = *(int *)(local_b70.hit + 0x110);
                      iVar67 = *(int *)(local_b70.hit + 0x114);
                      iVar68 = *(int *)(local_b70.hit + 0x118);
                      iVar69 = *(int *)(local_b70.hit + 0x11c);
                      iVar70 = *(int *)(local_b70.hit + 0x120);
                      iVar71 = *(int *)(local_b70.hit + 0x124);
                      iVar72 = *(int *)(local_b70.hit + 0x128);
                      iVar73 = *(int *)(local_b70.hit + 300);
                      iVar74 = *(int *)(local_b70.hit + 0x130);
                      iVar75 = *(int *)(local_b70.hit + 0x134);
                      iVar76 = *(int *)(local_b70.hit + 0x138);
                      iVar77 = *(int *)(local_b70.hit + 0x13c);
                      bVar6 = (bool)((byte)(uVar94 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar94 >> 2) & 1);
                      bVar8 = (bool)((byte)(uVar94 >> 3) & 1);
                      bVar9 = (bool)((byte)(uVar94 >> 4) & 1);
                      bVar10 = (bool)((byte)(uVar94 >> 5) & 1);
                      bVar11 = (bool)((byte)(uVar94 >> 6) & 1);
                      bVar12 = (bool)((byte)(uVar94 >> 7) & 1);
                      bVar13 = (bool)((byte)(uVar94 >> 9) & 1);
                      bVar14 = (bool)((byte)(uVar94 >> 10) & 1);
                      bVar15 = (bool)((byte)(uVar94 >> 0xb) & 1);
                      bVar16 = (bool)((byte)(uVar94 >> 0xc) & 1);
                      bVar17 = (bool)((byte)(uVar94 >> 0xd) & 1);
                      bVar18 = (bool)((byte)(uVar94 >> 0xe) & 1);
                      bVar19 = SUB81(uVar94 >> 0xf,0);
                      *(uint *)(local_b70.ray + 0x400) =
                           (uint)(bVar92 & 1) * *(int *)(local_b70.hit + 0x100) |
                           (uint)!(bool)(bVar92 & 1) * *(int *)(local_b70.ray + 0x400);
                      *(uint *)(local_b70.ray + 0x404) =
                           (uint)bVar6 * iVar63 | (uint)!bVar6 * *(int *)(local_b70.ray + 0x404);
                      *(uint *)(local_b70.ray + 0x408) =
                           (uint)bVar7 * iVar64 | (uint)!bVar7 * *(int *)(local_b70.ray + 0x408);
                      *(uint *)(local_b70.ray + 0x40c) =
                           (uint)bVar8 * iVar65 | (uint)!bVar8 * *(int *)(local_b70.ray + 0x40c);
                      *(uint *)(local_b70.ray + 0x410) =
                           (uint)bVar9 * iVar66 | (uint)!bVar9 * *(int *)(local_b70.ray + 0x410);
                      *(uint *)(local_b70.ray + 0x414) =
                           (uint)bVar10 * iVar67 | (uint)!bVar10 * *(int *)(local_b70.ray + 0x414);
                      *(uint *)(local_b70.ray + 0x418) =
                           (uint)bVar11 * iVar68 | (uint)!bVar11 * *(int *)(local_b70.ray + 0x418);
                      *(uint *)(local_b70.ray + 0x41c) =
                           (uint)bVar12 * iVar69 | (uint)!bVar12 * *(int *)(local_b70.ray + 0x41c);
                      *(uint *)(local_b70.ray + 0x420) =
                           (uint)(bVar84 & 1) * iVar70 |
                           (uint)!(bool)(bVar84 & 1) * *(int *)(local_b70.ray + 0x420);
                      *(uint *)(local_b70.ray + 0x424) =
                           (uint)bVar13 * iVar71 | (uint)!bVar13 * *(int *)(local_b70.ray + 0x424);
                      *(uint *)(local_b70.ray + 0x428) =
                           (uint)bVar14 * iVar72 | (uint)!bVar14 * *(int *)(local_b70.ray + 0x428);
                      *(uint *)(local_b70.ray + 0x42c) =
                           (uint)bVar15 * iVar73 | (uint)!bVar15 * *(int *)(local_b70.ray + 0x42c);
                      *(uint *)(local_b70.ray + 0x430) =
                           (uint)bVar16 * iVar74 | (uint)!bVar16 * *(int *)(local_b70.ray + 0x430);
                      *(uint *)(local_b70.ray + 0x434) =
                           (uint)bVar17 * iVar75 | (uint)!bVar17 * *(int *)(local_b70.ray + 0x434);
                      *(uint *)(local_b70.ray + 0x438) =
                           (uint)bVar18 * iVar76 | (uint)!bVar18 * *(int *)(local_b70.ray + 0x438);
                      *(uint *)(local_b70.ray + 0x43c) =
                           (uint)bVar19 * iVar77 | (uint)!bVar19 * *(int *)(local_b70.ray + 0x43c);
                      auVar184 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b70.hit + 0x140));
                      auVar184 = vmovdqu32_avx512f(auVar184);
                      *(undefined1 (*) [64])(local_b70.ray + 0x440) = auVar184;
                      auVar184 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b70.hit + 0x180));
                      auVar184 = vmovdqu32_avx512f(auVar184);
                      *(undefined1 (*) [64])(local_b70.ray + 0x480) = auVar184;
                      auVar184 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b70.hit + 0x1c0));
                      auVar184 = vmovdqa32_avx512f(auVar184);
                      *(undefined1 (*) [64])(local_b70.ray + 0x4c0) = auVar184;
                      auVar184 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b70.hit + 0x200));
                      auVar184 = vmovdqa32_avx512f(auVar184);
                      *(undefined1 (*) [64])(local_b70.ray + 0x500) = auVar184;
                      break;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x200) = fVar270;
                  break;
                }
              }
              lVar93 = lVar93 + -1;
            } while (lVar93 != 0);
            uVar191 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar182._4_4_ = uVar191;
            auVar182._0_4_ = uVar191;
            auVar182._8_4_ = uVar191;
            auVar182._12_4_ = uVar191;
            auVar182._16_4_ = uVar191;
            auVar182._20_4_ = uVar191;
            auVar182._24_4_ = uVar191;
            auVar182._28_4_ = uVar191;
            auVar79._4_4_ = fStack_71c;
            auVar79._0_4_ = local_720;
            auVar79._8_4_ = fStack_718;
            auVar79._12_4_ = fStack_714;
            auVar79._16_4_ = fStack_710;
            auVar79._20_4_ = fStack_70c;
            auVar79._24_4_ = fStack_708;
            auVar79._28_4_ = fStack_704;
            uVar22 = vcmpps_avx512vl(auVar182,auVar79,0xd);
            bVar87 = ~('\x01' << ((byte)iVar25 & 0x1f)) & bVar87 & (byte)uVar22;
          } while (bVar87 != 0);
          auVar158 = local_740;
          fVar264 = (float)local_9e0._0_4_;
          fVar269 = (float)local_9e0._4_4_;
          fVar270 = fStack_9d8;
          fVar271 = fStack_9d4;
          fVar244 = fStack_9d0;
          fVar245 = fStack_9cc;
          fVar246 = fStack_9c8;
          fVar230 = fStack_9c4;
        }
        uVar23 = vpcmpgtd_avx512vl(auVar158,local_6e0);
        uVar24 = vpcmpd_avx512vl(local_6e0,local_660,1);
        auVar225._0_4_ = fVar264 + (float)local_540._0_4_;
        auVar225._4_4_ = fVar269 + (float)local_540._4_4_;
        auVar225._8_4_ = fVar270 + fStack_538;
        auVar225._12_4_ = fVar271 + fStack_534;
        auVar225._16_4_ = fVar244 + fStack_530;
        auVar225._20_4_ = fVar245 + fStack_52c;
        auVar225._24_4_ = fVar246 + fStack_528;
        auVar225._28_4_ = fVar230 + fStack_524;
        uVar22 = vcmpps_avx512vl(auVar225,auVar182,2);
        bVar88 = bVar88 & (byte)uVar24 & (byte)uVar22;
        auVar226._0_4_ = fVar264 + local_6c0._0_4_;
        auVar226._4_4_ = fVar269 + local_6c0._4_4_;
        auVar226._8_4_ = fVar270 + local_6c0._8_4_;
        auVar226._12_4_ = fVar271 + local_6c0._12_4_;
        auVar226._16_4_ = fVar244 + local_6c0._16_4_;
        auVar226._20_4_ = fVar245 + local_6c0._20_4_;
        auVar226._24_4_ = fVar246 + local_6c0._24_4_;
        auVar226._28_4_ = fVar230 + local_6c0._28_4_;
        uVar22 = vcmpps_avx512vl(auVar226,auVar182,2);
        bVar82 = bVar82 & (byte)uVar23 & (byte)uVar22 | bVar88;
        auVar121 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar184 = ZEXT3264(auVar121);
        pPVar89 = local_8d8;
        prim = local_8d0;
        if (bVar82 != 0) {
          abStack_1a0[uVar85 * 0x60] = bVar82;
          auVar160._0_4_ =
               (uint)(bVar88 & 1) * local_540._0_4_ |
               (uint)!(bool)(bVar88 & 1) * (int)local_6c0._0_4_;
          bVar6 = (bool)(bVar88 >> 1 & 1);
          auVar160._4_4_ = (uint)bVar6 * local_540._4_4_ | (uint)!bVar6 * (int)local_6c0._4_4_;
          bVar6 = (bool)(bVar88 >> 2 & 1);
          auVar160._8_4_ = (uint)bVar6 * (int)fStack_538 | (uint)!bVar6 * (int)local_6c0._8_4_;
          bVar6 = (bool)(bVar88 >> 3 & 1);
          auVar160._12_4_ = (uint)bVar6 * (int)fStack_534 | (uint)!bVar6 * (int)local_6c0._12_4_;
          bVar6 = (bool)(bVar88 >> 4 & 1);
          auVar160._16_4_ = (uint)bVar6 * (int)fStack_530 | (uint)!bVar6 * (int)local_6c0._16_4_;
          bVar6 = (bool)(bVar88 >> 5 & 1);
          auVar160._20_4_ = (uint)bVar6 * (int)fStack_52c | (uint)!bVar6 * (int)local_6c0._20_4_;
          auVar160._24_4_ =
               (uint)(bVar88 >> 6) * (int)fStack_528 |
               (uint)!(bool)(bVar88 >> 6) * (int)local_6c0._24_4_;
          auVar160._28_4_ = local_6c0._28_4_;
          *(undefined1 (*) [32])(auStack_180 + uVar85 * 0x60) = auVar160;
          uVar94 = vmovlps_avx(local_6f0);
          (&uStack_160)[uVar85 * 0xc] = uVar94;
          aiStack_158[uVar85 * 0x18] = iVar91 + 1;
          uVar85 = (ulong)((int)uVar85 + 1);
        }
      }
    }
    do {
      uVar96 = (uint)uVar85;
      uVar85 = (ulong)(uVar96 - 1);
      if (uVar96 == 0) {
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar38._4_4_ = uVar1;
        auVar38._0_4_ = uVar1;
        auVar38._8_4_ = uVar1;
        auVar38._12_4_ = uVar1;
        auVar38._16_4_ = uVar1;
        auVar38._20_4_ = uVar1;
        auVar38._24_4_ = uVar1;
        auVar38._28_4_ = uVar1;
        uVar22 = vcmpps_avx512vl(local_640,auVar38,2);
        uVar90 = (uint)local_8c8 & (uint)uVar22;
        local_8c8 = (ulong)uVar90;
        if (uVar90 == 0) {
          return;
        }
        goto LAB_01caf48d;
      }
      lVar93 = uVar85 * 0x60;
      auVar121 = *(undefined1 (*) [32])(auStack_180 + lVar93);
      auVar207._0_4_ = fVar264 + auVar121._0_4_;
      auVar207._4_4_ = fVar269 + auVar121._4_4_;
      auVar207._8_4_ = fVar270 + auVar121._8_4_;
      auVar207._12_4_ = fVar271 + auVar121._12_4_;
      auVar207._16_4_ = fVar244 + auVar121._16_4_;
      auVar207._20_4_ = fVar245 + auVar121._20_4_;
      auVar207._24_4_ = fVar246 + auVar121._24_4_;
      auVar207._28_4_ = fVar230 + auVar121._28_4_;
      uVar191 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar37._4_4_ = uVar191;
      auVar37._0_4_ = uVar191;
      auVar37._8_4_ = uVar191;
      auVar37._12_4_ = uVar191;
      auVar37._16_4_ = uVar191;
      auVar37._20_4_ = uVar191;
      auVar37._24_4_ = uVar191;
      auVar37._28_4_ = uVar191;
      uVar22 = vcmpps_avx512vl(auVar207,auVar37,2);
      uVar95 = (uint)uVar22 & (uint)abStack_1a0[lVar93];
    } while (uVar95 == 0);
    uVar94 = (&uStack_160)[uVar85 * 0xc];
    auVar192._8_8_ = 0;
    auVar192._0_8_ = uVar94;
    auVar224._8_4_ = 0x7f800000;
    auVar224._0_8_ = 0x7f8000007f800000;
    auVar224._12_4_ = 0x7f800000;
    auVar224._16_4_ = 0x7f800000;
    auVar224._20_4_ = 0x7f800000;
    auVar224._24_4_ = 0x7f800000;
    auVar224._28_4_ = 0x7f800000;
    auVar122 = vblendmps_avx512vl(auVar224,auVar121);
    bVar82 = (byte)uVar95;
    auVar156._0_4_ =
         (uint)(bVar82 & 1) * auVar122._0_4_ | (uint)!(bool)(bVar82 & 1) * (int)auVar121._0_4_;
    bVar6 = (bool)((byte)(uVar95 >> 1) & 1);
    auVar156._4_4_ = (uint)bVar6 * auVar122._4_4_ | (uint)!bVar6 * (int)auVar121._4_4_;
    bVar6 = (bool)((byte)(uVar95 >> 2) & 1);
    auVar156._8_4_ = (uint)bVar6 * auVar122._8_4_ | (uint)!bVar6 * (int)auVar121._8_4_;
    bVar6 = (bool)((byte)(uVar95 >> 3) & 1);
    auVar156._12_4_ = (uint)bVar6 * auVar122._12_4_ | (uint)!bVar6 * (int)auVar121._12_4_;
    bVar6 = (bool)((byte)(uVar95 >> 4) & 1);
    auVar156._16_4_ = (uint)bVar6 * auVar122._16_4_ | (uint)!bVar6 * (int)auVar121._16_4_;
    bVar6 = (bool)((byte)(uVar95 >> 5) & 1);
    auVar156._20_4_ = (uint)bVar6 * auVar122._20_4_ | (uint)!bVar6 * (int)auVar121._20_4_;
    bVar6 = (bool)((byte)(uVar95 >> 6) & 1);
    auVar156._24_4_ = (uint)bVar6 * auVar122._24_4_ | (uint)!bVar6 * (int)auVar121._24_4_;
    auVar156._28_4_ =
         (uVar95 >> 7) * auVar122._28_4_ | (uint)!SUB41(uVar95 >> 7,0) * (int)auVar121._28_4_;
    auVar121 = vshufps_avx(auVar156,auVar156,0xb1);
    auVar121 = vminps_avx(auVar156,auVar121);
    auVar122 = vshufpd_avx(auVar121,auVar121,5);
    auVar121 = vminps_avx(auVar121,auVar122);
    auVar122 = vpermpd_avx2(auVar121,0x4e);
    auVar121 = vminps_avx(auVar121,auVar122);
    uVar22 = vcmpps_avx512vl(auVar156,auVar121,0);
    bVar87 = (byte)uVar22 & bVar82;
    if (bVar87 != 0) {
      uVar95 = (uint)bVar87;
    }
    uVar162 = 0;
    for (; (uVar95 & 1) == 0; uVar95 = uVar95 >> 1 | 0x80000000) {
      uVar162 = uVar162 + 1;
    }
    iVar91 = aiStack_158[uVar85 * 0x18];
    bVar82 = ~('\x01' << ((byte)uVar162 & 0x1f)) & bVar82;
    abStack_1a0[lVar93] = bVar82;
    if (bVar82 == 0) {
      uVar96 = uVar96 - 1;
    }
    uVar191 = (undefined4)uVar94;
    auVar178._4_4_ = uVar191;
    auVar178._0_4_ = uVar191;
    auVar178._8_4_ = uVar191;
    auVar178._12_4_ = uVar191;
    auVar178._16_4_ = uVar191;
    auVar178._20_4_ = uVar191;
    auVar178._24_4_ = uVar191;
    auVar178._28_4_ = uVar191;
    auVar99 = vmovshdup_avx(auVar192);
    auVar99 = vsubps_avx(auVar99,auVar192);
    auVar208._0_4_ = auVar99._0_4_;
    auVar208._4_4_ = auVar208._0_4_;
    auVar208._8_4_ = auVar208._0_4_;
    auVar208._12_4_ = auVar208._0_4_;
    auVar208._16_4_ = auVar208._0_4_;
    auVar208._20_4_ = auVar208._0_4_;
    auVar208._24_4_ = auVar208._0_4_;
    auVar208._28_4_ = auVar208._0_4_;
    auVar99 = vfmadd132ps_fma(auVar208,auVar178,_DAT_01faff20);
    auVar121 = ZEXT1632(auVar99);
    local_400[0] = (RTCHitN)auVar121[0];
    local_400[1] = (RTCHitN)auVar121[1];
    local_400[2] = (RTCHitN)auVar121[2];
    local_400[3] = (RTCHitN)auVar121[3];
    local_400[4] = (RTCHitN)auVar121[4];
    local_400[5] = (RTCHitN)auVar121[5];
    local_400[6] = (RTCHitN)auVar121[6];
    local_400[7] = (RTCHitN)auVar121[7];
    local_400[8] = (RTCHitN)auVar121[8];
    local_400[9] = (RTCHitN)auVar121[9];
    local_400[10] = (RTCHitN)auVar121[10];
    local_400[0xb] = (RTCHitN)auVar121[0xb];
    local_400[0xc] = (RTCHitN)auVar121[0xc];
    local_400[0xd] = (RTCHitN)auVar121[0xd];
    local_400[0xe] = (RTCHitN)auVar121[0xe];
    local_400[0xf] = (RTCHitN)auVar121[0xf];
    local_400[0x10] = (RTCHitN)auVar121[0x10];
    local_400[0x11] = (RTCHitN)auVar121[0x11];
    local_400[0x12] = (RTCHitN)auVar121[0x12];
    local_400[0x13] = (RTCHitN)auVar121[0x13];
    local_400[0x14] = (RTCHitN)auVar121[0x14];
    local_400[0x15] = (RTCHitN)auVar121[0x15];
    local_400[0x16] = (RTCHitN)auVar121[0x16];
    local_400[0x17] = (RTCHitN)auVar121[0x17];
    local_400[0x18] = (RTCHitN)auVar121[0x18];
    local_400[0x19] = (RTCHitN)auVar121[0x19];
    local_400[0x1a] = (RTCHitN)auVar121[0x1a];
    local_400[0x1b] = (RTCHitN)auVar121[0x1b];
    local_400[0x1c] = (RTCHitN)auVar121[0x1c];
    local_400[0x1d] = (RTCHitN)auVar121[0x1d];
    local_400[0x1e] = (RTCHitN)auVar121[0x1e];
    local_400[0x1f] = (RTCHitN)auVar121[0x1f];
    local_6f0._8_8_ = 0;
    local_6f0._0_8_ = *(ulong *)(local_400 + (ulong)uVar162 * 4);
    uVar85 = (ulong)uVar96;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }